

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  int *piVar18;
  size_t sVar19;
  size_t sVar20;
  _func_int **pp_Var21;
  float fVar22;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  Mat *pMVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  _func_int *p_Var56;
  long lVar57;
  ulong uVar58;
  long lVar59;
  _func_int **pp_Var60;
  uint uVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  _func_int *p_Var65;
  ulong uVar66;
  _func_int ***ppp_Var67;
  uint uVar68;
  void *pvVar69;
  void *pvVar70;
  int iVar71;
  int iVar72;
  ulong uVar73;
  int i;
  uint uVar74;
  int iVar75;
  long lVar76;
  ulong uVar77;
  int iVar78;
  ulong uVar79;
  int y_4;
  int y_8;
  int iVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  ulong uVar84;
  ulong uVar85;
  void *pvVar86;
  int y;
  ulong uVar87;
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar111 [28];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar112 [28];
  float fVar93;
  float fVar126;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar124;
  float fVar125;
  undefined1 auVar94 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar127;
  undefined1 auVar113 [32];
  undefined1 auVar95 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar164 [28];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar222;
  float fVar226;
  float fVar227;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar220;
  float fVar221;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 in_ZMM3 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar238;
  float fVar260;
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  float fVar258;
  float fVar259;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  __m128 pos;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar299 [64];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [64];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  float fVar307;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar317 [64];
  float fVar324;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar335 [64];
  float fVar341;
  float fVar350;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar366 [32];
  float fVar375;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [64];
  _func_int ***local_1a0;
  _func_int ***local_140;
  _func_int ***local_128;
  Mat local_d8;
  _func_int **local_90;
  undefined1 local_88 [32];
  Mat *local_60;
  Allocator *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  Option *local_38;
  float fVar23;
  undefined1 auVar172 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar179 [32];
  undefined1 auVar251 [32];
  undefined1 auVar257 [32];
  undefined1 auVar298 [32];
  
  iVar72 = bottom_blob->w;
  iVar13 = bottom_blob->h;
  uVar73 = bottom_blob->elemsize;
  iVar75 = bottom_blob->elempack;
  p_Var56 = this->_vptr_Deconvolution_x86_avx[-3];
  if (opt->use_packing_layout == true) {
    uVar61 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var56) & 7) != 0) {
      uVar61 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var56) & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar61 = 1;
  }
  iVar62 = (*(int *)(&this->field_0xd4 + (long)p_Var56) + -1) *
           *(int *)(&this->field_0xdc + (long)p_Var56);
  iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
  iVar63 = (*(int *)(&this->field_0xd8 + (long)p_Var56) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var56);
  iVar78 = *(int *)(&this->field_0xe8 + (long)p_Var56);
  iVar80 = *(int *)(&this->field_0xfc + (long)p_Var56);
  iVar55 = *(int *)(&this->field_0x100 + (long)p_Var56);
  local_d8.cstep = 0;
  local_d8.data = (Allocator *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_d8.elempack = 0;
  local_d8.h = 0;
  p_Var65 = this->_vptr_Deconvolution_x86_avx[-3];
  p_Var56 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx + (long)p_Var65);
  lVar59 = 0x10;
  local_d8.allocator = (Allocator *)local_d8.data;
  local_d8.dims = (int)local_d8.refcount;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.d = (int)local_d8.refcount;
  local_d8.c = local_d8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var65) < 1) && (*(int *)(p_Var56 + 0xf0) < 1)) &&
       (*(int *)(p_Var56 + 0xf4) < 1)) && (*(int *)(p_Var56 + 0xf8) < 1)) &&
     ((*(int *)(p_Var56 + 0x104) < 1 || (*(int *)(p_Var56 + 0x108) < 1)))) {
    if (&local_d8 != top_blob) {
      piVar18 = top_blob->refcount;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      local_d8.data = top_blob->data;
      local_d8.refcount._0_4_ = (int)top_blob->refcount;
      local_d8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_d8.elemsize = top_blob->elemsize;
      local_d8.elempack = top_blob->elempack;
      local_d8.allocator = top_blob->allocator;
      uVar9 = top_blob->dims;
      uVar10 = top_blob->w;
      uVar11 = top_blob->h;
      uVar12 = top_blob->d;
      local_d8.c = top_blob->c;
      local_d8.cstep = top_blob->cstep;
      p_Var65 = this->_vptr_Deconvolution_x86_avx[-3];
      local_d8.dims = uVar9;
      local_d8.w = uVar10;
      local_d8.h = uVar11;
      local_d8.d = uVar12;
    }
    p_Var56 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx + (long)p_Var65);
    lVar59 = 8;
  }
  local_60 = top_blob;
  local_38 = opt;
  Mat::create(&local_d8,iVar80 + (iVar72 + -1) * iVar71 + iVar62 + 1,
              (iVar13 + -1) * iVar78 + iVar63 + iVar55 + 1,*(int *)(p_Var56 + 0xd0) / (int)uVar61,
              (uVar73 / (ulong)(long)iVar75) * (ulong)uVar61,uVar61,
              *(Allocator **)(&opt->lightmode + lVar59));
  iVar72 = -100;
  if (((Allocator *)local_d8.data != (Allocator *)0x0) && (local_d8.cstep * (long)local_d8.c != 0))
  {
    local_90 = this->_vptr_Deconvolution_x86_avx;
    p_Var56 = local_90[-3];
    uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
    local_40 = (long)(int)uVar14;
    uVar15 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
    if ((iVar75 == 8) && (uVar61 == 8)) {
      iVar72 = *(int *)(&this->field_0xdc + (long)p_Var56);
      iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var56);
      iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
      iVar78 = *(int *)(&this->field_0xe8 + (long)p_Var56);
      iVar80 = *(int *)(&this->field_0x114 + (long)p_Var56);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
      uVar73 = 0;
      if (0 < (int)uVar14) {
        uVar73 = (ulong)uVar14;
      }
      uVar85 = 0;
      if (0 < (int)uVar15) {
        uVar85 = (ulong)uVar15;
      }
      uVar84 = (ulong)(uint)local_d8.c;
      if (local_d8.c < 1) {
        uVar84 = 0;
      }
      auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar325 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar245._8_4_ = 0x3f800000;
      auVar245._0_8_ = 0x3f8000003f800000;
      auVar245._12_4_ = 0x3f800000;
      auVar245._16_4_ = 0x3f800000;
      auVar245._20_4_ = 0x3f800000;
      auVar245._24_4_ = 0x3f800000;
      auVar245._28_4_ = 0x3f800000;
      for (uVar66 = 0; uVar66 != uVar84; uVar66 = uVar66 + 1) {
        local_128 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar66 * local_d8.elemsize);
        iVar55 = bottom_blob->w;
        iVar54 = bottom_blob->h;
        uVar68 = 0;
        uVar16 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar16 = uVar68;
        }
        uVar49 = local_d8.w;
        if (local_d8.w < 1) {
          uVar49 = uVar68;
        }
        uVar74 = local_d8.h;
        if (local_d8.h < 1) {
          uVar74 = uVar68;
        }
        for (; uVar68 != uVar74; uVar68 = uVar68 + 1) {
          iVar64 = (1 - uVar14) * iVar72;
          for (uVar52 = 0; uVar52 != uVar49; uVar52 = uVar52 + 1) {
            if (lVar59 == 0) {
              auVar346 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar346 = ZEXT3264(*(undefined1 (*) [32])(lVar59 + uVar66 * 0x20));
            }
            lVar82 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar66 * (this->weight_data_tm).elemsize + 0xe0;
            for (uVar58 = 0; uVar58 != uVar16; uVar58 = uVar58 + 1) {
              pvVar69 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar58 +
                                (long)bottom_blob->data);
              local_88._0_8_ = pvVar69;
              lVar83 = lVar82;
              for (uVar87 = 0; uVar87 != uVar85; uVar87 = uVar87 + 1) {
                iVar50 = (((int)uVar87 - uVar15) + 1) * iVar13 + uVar68;
                if (((-1 < iVar50) && (iVar51 = iVar50 / iVar78, iVar50 % iVar78 == 0)) &&
                   (iVar51 < iVar54)) {
                  lVar81 = (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize;
                  iVar50 = iVar64;
                  for (lVar76 = 0; uVar73 * 0x100 != lVar76; lVar76 = lVar76 + 0x100) {
                    if (((-1 < iVar50) && (iVar51 = iVar50 / iVar71, iVar50 % iVar71 == 0)) &&
                       (iVar51 < iVar55)) {
                      lVar57 = (long)(iVar51 << 3);
                      fVar88 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81);
                      fVar125 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 4);
                      fVar126 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 8);
                      fVar93 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0xc);
                      fVar124 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0x10);
                      fVar127 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0x14);
                      fVar225 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0x18);
                      fVar227 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0x1c);
                      pfVar6 = (float *)(lVar83 + -0xe0 + lVar76);
                      pfVar7 = (float *)(lVar83 + -0xc0 + lVar76);
                      pfVar8 = (float *)(lVar83 + -0xa0 + lVar76);
                      pfVar2 = (float *)(lVar83 + -0x80 + lVar76);
                      pfVar3 = (float *)(lVar83 + -0x60 + lVar76);
                      pfVar4 = (float *)(lVar83 + -0x40 + lVar76);
                      fVar226 = fVar126 + fVar93 + fVar126;
                      pfVar5 = (float *)(lVar83 + -0x20 + lVar76);
                      pfVar1 = (float *)(lVar83 + lVar76);
                      fVar180 = fVar225 * *pfVar5 + fVar227 * *pfVar1;
                      fVar220 = fVar225 * pfVar5[1] + fVar227 * pfVar1[1];
                      fVar221 = fVar225 * pfVar5[2] + fVar227 * pfVar1[2];
                      fVar222 = fVar225 * pfVar5[3] + fVar227 * pfVar1[3];
                      fVar223 = fVar225 * pfVar5[4] + fVar227 * pfVar1[4];
                      fVar224 = fVar225 * pfVar5[5] + fVar227 * pfVar1[5];
                      fVar225 = fVar225 * pfVar5[6] + fVar227 * pfVar1[6];
                      fVar227 = fVar226 + fVar126;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar227,CONCAT424(fVar225,CONCAT420(fVar224,
                                                  CONCAT416(fVar223,CONCAT412(fVar222,CONCAT48(
                                                  fVar221,CONCAT44(fVar220,fVar180))))))));
                      auVar346 = ZEXT3264(CONCAT428(auVar346._28_4_ + fVar88 + fVar125 + fVar126 +
                                                    fVar226 + fVar227,
                                                    CONCAT424(auVar346._24_4_ + fVar88 * pfVar6[6] +
                                                              fVar125 * pfVar7[6] +
                                                              fVar126 * pfVar8[6] +
                                                              fVar93 * pfVar2[6] +
                                                              fVar124 * pfVar3[6] +
                                                              fVar127 * pfVar4[6] + fVar225,
                                                              CONCAT420(auVar346._20_4_ +
                                                                        fVar88 * pfVar6[5] +
                                                                        fVar125 * pfVar7[5] +
                                                                        fVar126 * pfVar8[5] +
                                                                        fVar93 * pfVar2[5] +
                                                                        fVar124 * pfVar3[5] +
                                                                        fVar127 * pfVar4[5] +
                                                                        fVar224,CONCAT416(auVar346.
                                                  _16_4_ + fVar88 * pfVar6[4] +
                                                  fVar125 * pfVar7[4] + fVar126 * pfVar8[4] +
                                                  fVar93 * pfVar2[4] + fVar124 * pfVar3[4] +
                                                  fVar127 * pfVar4[4] + fVar223,
                                                  CONCAT412(auVar346._12_4_ + fVar88 * pfVar6[3] +
                                                            fVar125 * pfVar7[3] +
                                                            fVar126 * pfVar8[3] +
                                                            fVar93 * pfVar2[3] + fVar124 * pfVar3[3]
                                                            + fVar127 * pfVar4[3] + fVar222,
                                                            CONCAT48(auVar346._8_4_ +
                                                                     fVar88 * pfVar6[2] +
                                                                     fVar125 * pfVar7[2] +
                                                                     fVar126 * pfVar8[2] +
                                                                     fVar93 * pfVar2[2] +
                                                                     fVar124 * pfVar3[2] +
                                                                     fVar127 * pfVar4[2] + fVar221,
                                                                     CONCAT44(auVar346._4_4_ +
                                                                              fVar88 * pfVar6[1] +
                                                                              fVar125 * pfVar7[1] +
                                                                              fVar126 * pfVar8[1] +
                                                                              fVar93 * pfVar2[1] +
                                                                              fVar124 * pfVar3[1] +
                                                                              fVar127 * pfVar4[1] +
                                                                              fVar220,auVar346._0_4_
                                                                                      + fVar88 * *
                                                  pfVar6 + fVar125 * *pfVar7 + fVar126 * *pfVar8 +
                                                  fVar93 * *pfVar2 + fVar124 * *pfVar3 +
                                                  fVar127 * *pfVar4 + fVar180))))))));
                    }
                    iVar50 = iVar50 + iVar72;
                  }
                }
                lVar83 = lVar83 + local_40 * 0x100;
              }
              lVar82 = lVar82 + (long)(int)(uVar14 * uVar15 * 0x40) * 4;
            }
            auVar171 = auVar346._0_32_;
            auVar217 = auVar171;
            if (5 < iVar80 - 1U) goto switchD_00288a15_caseD_1;
            auVar91 = auVar92._0_32_;
            auVar217 = vmaxps_avx(auVar171,auVar91);
            fVar180 = auVar346._8_4_;
            fVar220 = auVar346._12_4_;
            fVar221 = auVar346._16_4_;
            fVar222 = auVar346._20_4_;
            fVar223 = auVar346._24_4_;
            fVar88 = auVar325._0_4_;
            fVar125 = auVar325._4_4_;
            fVar126 = auVar325._8_4_;
            fVar93 = auVar325._12_4_;
            fVar124 = auVar325._16_4_;
            fVar127 = auVar325._20_4_;
            fVar225 = auVar325._24_4_;
            fVar227 = auVar325._28_4_;
            switch(iVar80) {
            case 2:
              auVar171 = vminps_avx(auVar171,auVar91);
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              auVar293._0_4_ = fVar88 * auVar171._0_4_ + auVar217._0_4_;
              auVar293._4_4_ = fVar88 * auVar171._4_4_ + auVar217._4_4_;
              auVar293._8_4_ = fVar88 * auVar171._8_4_ + auVar217._8_4_;
              auVar293._12_4_ = fVar88 * auVar171._12_4_ + auVar217._12_4_;
              auVar293._16_4_ = fVar88 * auVar171._16_4_ + auVar217._16_4_;
              auVar293._20_4_ = fVar88 * auVar171._20_4_ + auVar217._20_4_;
              auVar293._24_4_ = fVar88 * auVar171._24_4_ + auVar217._24_4_;
              auVar293._28_4_ = auVar171._28_4_ + auVar217._28_4_;
              auVar217 = auVar293;
              break;
            case 3:
              uVar17 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
              auVar296._4_4_ = uVar17;
              auVar296._0_4_ = uVar17;
              auVar296._8_4_ = uVar17;
              auVar296._12_4_ = uVar17;
              auVar296._16_4_ = uVar17;
              auVar296._20_4_ = uVar17;
              auVar296._24_4_ = uVar17;
              auVar296._28_4_ = uVar17;
              uVar17 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar366._4_4_ = uVar17;
              auVar366._0_4_ = uVar17;
              auVar366._8_4_ = uVar17;
              auVar366._12_4_ = uVar17;
              auVar366._16_4_ = uVar17;
              auVar366._20_4_ = uVar17;
              auVar366._24_4_ = uVar17;
              auVar366._28_4_ = uVar17;
              auVar217 = vmaxps_avx(auVar171,auVar296);
              auVar217 = vminps_avx(auVar366,auVar217);
              break;
            case 4:
              auVar297._0_8_ = auVar346._0_8_ ^ 0x8000000080000000;
              auVar297._8_4_ = -fVar180;
              auVar297._12_4_ = -fVar220;
              auVar297._16_4_ = -fVar221;
              auVar297._20_4_ = -fVar222;
              auVar297._24_4_ = -fVar223;
              auVar297._28_4_ = -auVar346._28_4_;
              auVar168._8_4_ = 0x42b0c0a5;
              auVar168._0_8_ = 0x42b0c0a542b0c0a5;
              auVar168._12_4_ = 0x42b0c0a5;
              auVar168._16_4_ = 0x42b0c0a5;
              auVar168._20_4_ = 0x42b0c0a5;
              auVar168._24_4_ = 0x42b0c0a5;
              auVar168._28_4_ = 0x42b0c0a5;
              auVar217 = vminps_avx(auVar297,auVar168);
              auVar169._8_4_ = 0xc2b0c0a5;
              auVar169._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar169._12_4_ = 0xc2b0c0a5;
              auVar169._16_4_ = 0xc2b0c0a5;
              auVar169._20_4_ = 0xc2b0c0a5;
              auVar169._24_4_ = 0xc2b0c0a5;
              auVar169._28_4_ = 0xc2b0c0a5;
              auVar171 = vmaxps_avx(auVar217,auVar169);
              auVar345._0_4_ = auVar171._0_4_ * 1.442695 + fVar88;
              auVar345._4_4_ = auVar171._4_4_ * 1.442695 + fVar125;
              auVar345._8_4_ = auVar171._8_4_ * 1.442695 + fVar126;
              auVar345._12_4_ = auVar171._12_4_ * 1.442695 + fVar93;
              auVar345._16_4_ = auVar171._16_4_ * 1.442695 + fVar124;
              auVar345._20_4_ = auVar171._20_4_ * 1.442695 + fVar127;
              auVar345._24_4_ = auVar171._24_4_ * 1.442695 + fVar225;
              auVar345._28_4_ = auVar346._28_4_ + fVar227;
              auVar91 = vroundps_avx(auVar345,1);
              auVar217 = vcmpps_avx(auVar345,auVar91,1);
              auVar217 = vandps_avx(auVar217,auVar245);
              auVar217 = vsubps_avx(auVar91,auVar217);
              fVar180 = auVar217._0_4_ * -0.6931472 + auVar171._0_4_;
              fVar220 = auVar217._4_4_ * -0.6931472 + auVar171._4_4_;
              fVar221 = auVar217._8_4_ * -0.6931472 + auVar171._8_4_;
              fVar222 = auVar217._12_4_ * -0.6931472 + auVar171._12_4_;
              fVar223 = auVar217._16_4_ * -0.6931472 + auVar171._16_4_;
              fVar224 = auVar217._20_4_ * -0.6931472 + auVar171._20_4_;
              fVar226 = auVar217._24_4_ * -0.6931472 + auVar171._24_4_;
              in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                           CONCAT424(0x3ab743ce,
                                                     CONCAT420(0x3ab743ce,
                                                               CONCAT416(0x3ab743ce,
                                                                         CONCAT412(0x3ab743ce,
                                                                                   CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
              auVar265._0_4_ = (int)auVar217._0_4_;
              auVar265._4_4_ = (int)auVar217._4_4_;
              auVar265._8_4_ = (int)auVar217._8_4_;
              auVar265._12_4_ = (int)auVar217._12_4_;
              auVar298._16_4_ = (int)auVar217._16_4_;
              auVar298._0_16_ = auVar265;
              auVar298._20_4_ = (int)auVar217._20_4_;
              auVar298._24_4_ = (int)auVar217._24_4_;
              auVar298._28_4_ = (int)auVar217._28_4_;
              auVar264 = vpslld_avx(auVar265,0x17);
              auVar181 = vpslld_avx(auVar298._16_16_,0x17);
              auVar95._8_4_ = 0x3f800000;
              auVar95._0_8_ = 0x3f8000003f800000;
              auVar95._12_4_ = 0x3f800000;
              auVar181 = vpaddd_avx(auVar181,auVar95);
              auVar264 = vpaddd_avx(auVar264,auVar95);
              auVar170._0_4_ =
                   (fVar180 + 1.0 +
                   fVar180 * fVar180 *
                   (fVar88 + ((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) *
                               fVar180 + 0.041665796) * fVar180 + 0.16666666) * fVar180)) *
                   auVar264._0_4_ + 1.0;
              auVar170._4_4_ =
                   (fVar220 + 1.0 +
                   fVar220 * fVar220 *
                   (fVar125 +
                   ((((fVar220 * 0.00019875691 + 0.0013981999) * fVar220 + 0.008333452) * fVar220 +
                    0.041665796) * fVar220 + 0.16666666) * fVar220)) * auVar264._4_4_ + 1.0;
              auVar170._8_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (fVar126 +
                   ((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                    0.041665796) * fVar221 + 0.16666666) * fVar221)) * auVar264._8_4_ + 1.0;
              auVar170._12_4_ =
                   (fVar222 + 1.0 +
                   fVar222 * fVar222 *
                   (fVar93 + ((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                               fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222)) *
                   auVar264._12_4_ + 1.0;
              auVar170._16_4_ =
                   (fVar223 + 1.0 +
                   fVar223 * fVar223 *
                   (fVar124 +
                   ((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) * fVar223 +
                    0.041665796) * fVar223 + 0.16666666) * fVar223)) * auVar181._0_4_ + 1.0;
              auVar170._20_4_ =
                   (fVar224 + 1.0 +
                   fVar224 * fVar224 *
                   (fVar127 +
                   ((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224 +
                    0.041665796) * fVar224 + 0.16666666) * fVar224)) * auVar181._4_4_ + 1.0;
              auVar170._24_4_ =
                   (fVar226 + 1.0 +
                   fVar226 * fVar226 *
                   (fVar225 +
                   ((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226 +
                    0.041665796) * fVar226 + 0.16666666) * fVar226)) * auVar181._8_4_ + 1.0;
              auVar170._28_4_ = auVar91._28_4_ + auVar171._28_4_ + 1.0 + fVar227 + 0.21826287 + 1.0;
              auVar171 = vrcpps_avx(auVar170);
              fVar88 = auVar171._0_4_;
              fVar125 = auVar171._4_4_;
              auVar34._4_4_ = auVar170._4_4_ * fVar125;
              auVar34._0_4_ = auVar170._0_4_ * fVar88;
              fVar126 = auVar171._8_4_;
              auVar34._8_4_ = auVar170._8_4_ * fVar126;
              fVar93 = auVar171._12_4_;
              auVar34._12_4_ = auVar170._12_4_ * fVar93;
              fVar124 = auVar171._16_4_;
              auVar34._16_4_ = auVar170._16_4_ * fVar124;
              fVar127 = auVar171._20_4_;
              auVar34._20_4_ = auVar170._20_4_ * fVar127;
              fVar225 = auVar171._24_4_;
              auVar34._24_4_ = auVar170._24_4_ * fVar225;
              auVar34._28_4_ = auVar170._28_4_;
              auVar91 = vsubps_avx(auVar245,auVar34);
              auVar217._0_4_ = fVar88 + fVar88 * auVar91._0_4_;
              auVar217._4_4_ = fVar125 + fVar125 * auVar91._4_4_;
              auVar217._8_4_ = fVar126 + fVar126 * auVar91._8_4_;
              auVar217._12_4_ = fVar93 + fVar93 * auVar91._12_4_;
              auVar217._16_4_ = fVar124 + fVar124 * auVar91._16_4_;
              auVar217._20_4_ = fVar127 + fVar127 * auVar91._20_4_;
              auVar217._24_4_ = fVar225 + fVar225 * auVar91._24_4_;
              auVar217._28_4_ = auVar171._28_4_ + auVar91._28_4_;
              break;
            case 5:
              auVar305._8_4_ = 0x42b0c0a5;
              auVar305._0_8_ = 0x42b0c0a542b0c0a5;
              auVar305._12_4_ = 0x42b0c0a5;
              auVar305._16_4_ = 0x42b0c0a5;
              auVar305._20_4_ = 0x42b0c0a5;
              auVar305._24_4_ = 0x42b0c0a5;
              auVar305._28_4_ = 0x42b0c0a5;
              auVar171 = vminps_avx(auVar171,auVar305);
              auVar308._8_4_ = 0xc2b0c0a5;
              auVar308._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar308._12_4_ = 0xc2b0c0a5;
              auVar308._16_4_ = 0xc2b0c0a5;
              auVar308._20_4_ = 0xc2b0c0a5;
              auVar308._24_4_ = 0xc2b0c0a5;
              auVar308._28_4_ = 0xc2b0c0a5;
              auVar171 = vmaxps_avx(auVar308,auVar171);
              auVar294._0_4_ = fVar88 + auVar171._0_4_ * 1.442695;
              auVar294._4_4_ = fVar125 + auVar171._4_4_ * 1.442695;
              auVar294._8_4_ = fVar126 + auVar171._8_4_ * 1.442695;
              auVar294._12_4_ = fVar93 + auVar171._12_4_ * 1.442695;
              auVar294._16_4_ = fVar124 + auVar171._16_4_ * 1.442695;
              auVar294._20_4_ = fVar127 + auVar171._20_4_ * 1.442695;
              auVar294._24_4_ = fVar225 + auVar171._24_4_ * 1.442695;
              auVar294._28_4_ = fVar227 + auVar217._28_4_;
              auVar91 = vroundps_avx(auVar294,1);
              auVar217 = vcmpps_avx(auVar294,auVar91,1);
              auVar217 = vandps_avx(auVar217,auVar245);
              auVar217 = vsubps_avx(auVar91,auVar217);
              auVar31._4_4_ = auVar217._4_4_ * 0.6931472;
              auVar31._0_4_ = auVar217._0_4_ * 0.6931472;
              auVar31._8_4_ = auVar217._8_4_ * 0.6931472;
              auVar31._12_4_ = auVar217._12_4_ * 0.6931472;
              auVar31._16_4_ = auVar217._16_4_ * 0.6931472;
              auVar31._20_4_ = auVar217._20_4_ * 0.6931472;
              auVar31._24_4_ = auVar217._24_4_ * 0.6931472;
              auVar31._28_4_ = auVar91._28_4_;
              auVar171 = vsubps_avx(auVar171,auVar31);
              fVar224 = auVar171._0_4_;
              fVar226 = auVar171._4_4_;
              fVar370 = auVar171._8_4_;
              fVar371 = auVar171._12_4_;
              fVar372 = auVar171._16_4_;
              fVar373 = auVar171._20_4_;
              fVar374 = auVar171._24_4_;
              auVar181._0_4_ = (int)auVar217._0_4_;
              auVar181._4_4_ = (int)auVar217._4_4_;
              auVar181._8_4_ = (int)auVar217._8_4_;
              auVar181._12_4_ = (int)auVar217._12_4_;
              auVar208._16_4_ = (int)auVar217._16_4_;
              auVar208._0_16_ = auVar181;
              auVar208._20_4_ = (int)auVar217._20_4_;
              auVar208._24_4_ = (int)auVar217._24_4_;
              auVar208._28_4_ = (int)auVar217._28_4_;
              auVar264 = vpslld_avx(auVar181,0x17);
              auVar181 = vpslld_avx(auVar208._16_16_,0x17);
              auVar94._8_4_ = 0x3f800000;
              auVar94._0_8_ = 0x3f8000003f800000;
              auVar94._12_4_ = 0x3f800000;
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar264 = vpaddd_avx(auVar264,auVar94);
              auVar295._0_4_ =
                   (fVar224 + 1.0 +
                   fVar224 * fVar224 *
                   (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224 +
                     0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar88)) * auVar264._0_4_ +
                   1.0;
              auVar295._4_4_ =
                   (fVar226 + 1.0 +
                   fVar226 * fVar226 *
                   (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226 +
                     0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar125)) * auVar264._4_4_ +
                   1.0;
              auVar295._8_4_ =
                   (fVar370 + 1.0 +
                   fVar370 * fVar370 *
                   (((((fVar370 * 0.00019875691 + 0.0013981999) * fVar370 + 0.008333452) * fVar370 +
                     0.041665796) * fVar370 + 0.16666666) * fVar370 + fVar126)) * auVar264._8_4_ +
                   1.0;
              auVar295._12_4_ =
                   (fVar371 + 1.0 +
                   fVar371 * fVar371 *
                   (((((fVar371 * 0.00019875691 + 0.0013981999) * fVar371 + 0.008333452) * fVar371 +
                     0.041665796) * fVar371 + 0.16666666) * fVar371 + fVar93)) * auVar264._12_4_ +
                   1.0;
              auVar295._16_4_ =
                   (fVar372 + 1.0 +
                   fVar372 * fVar372 *
                   (((((fVar372 * 0.00019875691 + 0.0013981999) * fVar372 + 0.008333452) * fVar372 +
                     0.041665796) * fVar372 + 0.16666666) * fVar372 + fVar124)) * auVar181._0_4_ +
                   1.0;
              auVar295._20_4_ =
                   (fVar373 + 1.0 +
                   fVar373 * fVar373 *
                   (((((fVar373 * 0.00019875691 + 0.0013981999) * fVar373 + 0.008333452) * fVar373 +
                     0.041665796) * fVar373 + 0.16666666) * fVar373 + fVar127)) * auVar181._4_4_ +
                   1.0;
              auVar295._24_4_ =
                   (fVar374 + 1.0 +
                   fVar374 * fVar374 *
                   (((((fVar374 * 0.00019875691 + 0.0013981999) * fVar374 + 0.008333452) * fVar374 +
                     0.041665796) * fVar374 + 0.16666666) * fVar374 + fVar225)) * auVar181._8_4_ +
                   1.0;
              auVar295._28_4_ =
                   auVar171._28_4_ + 1.0 +
                   in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + fVar227
                   + 1.0;
              auVar165._8_4_ = 0x800000;
              auVar165._0_8_ = 0x80000000800000;
              auVar165._12_4_ = 0x800000;
              auVar165._16_4_ = 0x800000;
              auVar165._20_4_ = 0x800000;
              auVar165._24_4_ = 0x800000;
              auVar165._28_4_ = 0x800000;
              auVar91 = vmaxps_avx(auVar295,auVar165);
              auVar181 = vpsrld_avx(auVar91._16_16_,0x17);
              auVar234._8_4_ = 0x807fffff;
              auVar234._0_8_ = 0x807fffff807fffff;
              auVar234._12_4_ = 0x807fffff;
              auVar234._16_4_ = 0x807fffff;
              auVar234._20_4_ = 0x807fffff;
              auVar234._24_4_ = 0x807fffff;
              auVar234._28_4_ = 0x807fffff;
              auVar217 = vandps_avx(auVar91,auVar234);
              auVar214 = vorps_avx(auVar217,auVar325._0_32_);
              auVar235._8_4_ = 0x3f3504f3;
              auVar235._0_8_ = 0x3f3504f33f3504f3;
              auVar235._12_4_ = 0x3f3504f3;
              auVar235._16_4_ = 0x3f3504f3;
              auVar235._20_4_ = 0x3f3504f3;
              auVar235._24_4_ = 0x3f3504f3;
              auVar235._28_4_ = 0x3f3504f3;
              auVar171 = vcmpps_avx(auVar235,auVar214,2);
              auVar217 = vandnps_avx(auVar171,auVar214);
              fVar224 = auVar214._0_4_ + -1.0 + auVar217._0_4_;
              fVar226 = auVar214._4_4_ + -1.0 + auVar217._4_4_;
              fVar370 = auVar214._8_4_ + -1.0 + auVar217._8_4_;
              fVar371 = auVar214._12_4_ + -1.0 + auVar217._12_4_;
              fVar372 = auVar214._16_4_ + -1.0 + auVar217._16_4_;
              fVar373 = auVar214._20_4_ + -1.0 + auVar217._20_4_;
              fVar374 = auVar214._24_4_ + -1.0 + auVar217._24_4_;
              auVar181 = vpsubd_avx(auVar181,auVar171._16_16_);
              auVar264 = vpsrld_avx(auVar91._0_16_,0x17);
              auVar300._8_4_ = 0xffffff81;
              auVar300._0_8_ = 0xffffff81ffffff81;
              auVar300._12_4_ = 0xffffff81;
              auVar181 = vpaddd_avx(auVar300,auVar181);
              auVar264 = vpsubd_avx(auVar264,auVar171._0_16_);
              auVar264 = vpaddd_avx(auVar300,auVar264);
              auVar166._16_16_ = auVar181;
              auVar166._0_16_ = auVar264;
              auVar171 = vcmpps_avx(auVar295,_DAT_004c75a0,2);
              auVar91 = vcvtdq2ps_avx(auVar166);
              auVar32._4_4_ =
                   (fVar226 + auVar91._4_4_ * 0.6931472 +
                   fVar226 * fVar226 *
                   (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (
                                                  fVar226 * (fVar226 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar32._0_4_ =
                   (fVar224 + auVar91._0_4_ * 0.6931472 +
                   fVar224 * fVar224 *
                   (fVar224 * (fVar224 * (fVar224 * (fVar224 * (fVar224 * (fVar224 * (fVar224 * (
                                                  fVar224 * (fVar224 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar32._8_4_ =
                   (fVar370 + auVar91._8_4_ * 0.6931472 +
                   fVar370 * fVar370 *
                   (fVar370 * (fVar370 * (fVar370 * (fVar370 * (fVar370 * (fVar370 * (fVar370 * (
                                                  fVar370 * (fVar370 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar32._12_4_ =
                   (fVar371 + auVar91._12_4_ * 0.6931472 +
                   fVar371 * fVar371 *
                   (fVar371 * (fVar371 * (fVar371 * (fVar371 * (fVar371 * (fVar371 * (fVar371 * (
                                                  fVar371 * (fVar371 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar32._16_4_ =
                   (fVar372 + auVar91._16_4_ * 0.6931472 +
                   fVar372 * fVar372 *
                   (fVar372 * (fVar372 * (fVar372 * (fVar372 * (fVar372 * (fVar372 * (fVar372 * (
                                                  fVar372 * (fVar372 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar32._20_4_ =
                   (fVar373 + auVar91._20_4_ * 0.6931472 +
                   fVar373 * fVar373 *
                   (fVar373 * (fVar373 * (fVar373 * (fVar373 * (fVar373 * (fVar373 * (fVar373 * (
                                                  fVar373 * (fVar373 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar32._24_4_ =
                   (fVar374 + auVar91._24_4_ * 0.6931472 +
                   fVar374 * fVar374 *
                   (fVar374 * (fVar374 * (fVar374 * (fVar374 * (fVar374 * (fVar374 * (fVar374 * (
                                                  fVar374 * (fVar374 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar32._28_4_ = auVar214._28_4_ + -1.0 + auVar217._28_4_ + auVar91._28_4_ + 0.0;
              auVar209._8_4_ = 0x7fffffff;
              auVar209._0_8_ = 0x7fffffff7fffffff;
              auVar209._12_4_ = 0x7fffffff;
              auVar209._16_4_ = 0x7fffffff;
              auVar209._20_4_ = 0x7fffffff;
              auVar209._24_4_ = 0x7fffffff;
              auVar209._28_4_ = 0x7fffffff;
              auVar217 = vblendvps_avx(auVar32,auVar209,auVar171);
              auVar210._8_4_ = 0x42b0c0a5;
              auVar210._0_8_ = 0x42b0c0a542b0c0a5;
              auVar210._12_4_ = 0x42b0c0a5;
              auVar210._16_4_ = 0x42b0c0a5;
              auVar210._20_4_ = 0x42b0c0a5;
              auVar210._24_4_ = 0x42b0c0a5;
              auVar210._28_4_ = 0x42b0c0a5;
              auVar217 = vminps_avx(auVar217,auVar210);
              auVar211._8_4_ = 0xc2b0c0a5;
              auVar211._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar211._12_4_ = 0xc2b0c0a5;
              auVar211._16_4_ = 0xc2b0c0a5;
              auVar211._20_4_ = 0xc2b0c0a5;
              auVar211._24_4_ = 0xc2b0c0a5;
              auVar211._28_4_ = 0xc2b0c0a5;
              auVar171 = vmaxps_avx(auVar217,auVar211);
              auVar212._0_4_ = auVar171._0_4_ * 1.442695 + fVar88;
              auVar212._4_4_ = auVar171._4_4_ * 1.442695 + fVar125;
              auVar212._8_4_ = auVar171._8_4_ * 1.442695 + fVar126;
              auVar212._12_4_ = auVar171._12_4_ * 1.442695 + fVar93;
              auVar212._16_4_ = auVar171._16_4_ * 1.442695 + fVar124;
              auVar212._20_4_ = auVar171._20_4_ * 1.442695 + fVar127;
              auVar212._24_4_ = auVar171._24_4_ * 1.442695 + fVar225;
              auVar212._28_4_ = fVar227 + -88.37626;
              auVar91 = vroundps_avx(auVar212,1);
              auVar217 = vcmpps_avx(auVar212,auVar91,1);
              auVar217 = vandps_avx(auVar217,auVar245);
              auVar214 = vsubps_avx(auVar91,auVar217);
              auVar33._4_4_ = auVar214._4_4_ * 0.6931472;
              auVar33._0_4_ = auVar214._0_4_ * 0.6931472;
              auVar33._8_4_ = auVar214._8_4_ * 0.6931472;
              auVar33._12_4_ = auVar214._12_4_ * 0.6931472;
              auVar33._16_4_ = auVar214._16_4_ * 0.6931472;
              auVar33._20_4_ = auVar214._20_4_ * 0.6931472;
              auVar33._24_4_ = auVar214._24_4_ * 0.6931472;
              auVar33._28_4_ = auVar91._28_4_;
              auVar171 = vsubps_avx(auVar171,auVar33);
              fVar224 = auVar171._0_4_;
              fVar226 = auVar171._4_4_;
              fVar370 = auVar171._8_4_;
              fVar371 = auVar171._12_4_;
              fVar372 = auVar171._16_4_;
              fVar373 = auVar171._20_4_;
              fVar374 = auVar171._24_4_;
              auVar92 = ZEXT864(0) << 0x20;
              auVar325 = ZEXT3264(auVar325._0_32_);
              auVar217._0_4_ =
                   fVar88 + ((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) *
                              fVar224 + 0.041665796) * fVar224 + 0.16666666) * fVar224;
              auVar217._4_4_ =
                   fVar125 + ((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) *
                               fVar226 + 0.041665796) * fVar226 + 0.16666666) * fVar226;
              auVar217._8_4_ =
                   fVar126 + ((((fVar370 * 0.00019875691 + 0.0013981999) * fVar370 + 0.008333452) *
                               fVar370 + 0.041665796) * fVar370 + 0.16666666) * fVar370;
              auVar217._12_4_ =
                   fVar93 + ((((fVar371 * 0.00019875691 + 0.0013981999) * fVar371 + 0.008333452) *
                              fVar371 + 0.041665796) * fVar371 + 0.16666666) * fVar371;
              auVar217._16_4_ =
                   fVar124 + ((((fVar372 * 0.00019875691 + 0.0013981999) * fVar372 + 0.008333452) *
                               fVar372 + 0.041665796) * fVar372 + 0.16666666) * fVar372;
              auVar217._20_4_ =
                   fVar127 + ((((fVar373 * 0.00019875691 + 0.0013981999) * fVar373 + 0.008333452) *
                               fVar373 + 0.041665796) * fVar373 + 0.16666666) * fVar373;
              auVar217._24_4_ =
                   fVar225 + ((((fVar374 * 0.00019875691 + 0.0013981999) * fVar374 + 0.008333452) *
                               fVar374 + 0.041665796) * fVar374 + 0.16666666) * fVar374;
              auVar217._28_4_ =
                   fVar227 + auVar295._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666
              ;
              auVar264._0_4_ = (int)auVar214._0_4_;
              auVar264._4_4_ = (int)auVar214._4_4_;
              auVar264._8_4_ = (int)auVar214._8_4_;
              auVar264._12_4_ = (int)auVar214._12_4_;
              auVar213._16_4_ = (int)auVar214._16_4_;
              auVar213._0_16_ = auVar264;
              auVar213._20_4_ = (int)auVar214._20_4_;
              auVar213._24_4_ = (int)auVar214._24_4_;
              auVar213._28_4_ = (int)auVar214._28_4_;
              auVar264 = vpslld_avx(auVar264,0x17);
              auVar181 = vpslld_avx(auVar213._16_16_,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar264 = vpaddd_avx(auVar264,auVar94);
              auVar167._0_4_ =
                   (fVar224 + 1.0 + fVar224 * fVar224 * auVar217._0_4_) * auVar264._0_4_ + 1.0;
              auVar167._4_4_ =
                   (fVar226 + 1.0 + fVar226 * fVar226 * auVar217._4_4_) * auVar264._4_4_ + 1.0;
              auVar167._8_4_ =
                   (fVar370 + 1.0 + fVar370 * fVar370 * auVar217._8_4_) * auVar264._8_4_ + 1.0;
              auVar167._12_4_ =
                   (fVar371 + 1.0 + fVar371 * fVar371 * auVar217._12_4_) * auVar264._12_4_ + 1.0;
              auVar167._16_4_ =
                   (fVar372 + 1.0 + fVar372 * fVar372 * auVar217._16_4_) * auVar181._0_4_ + 1.0;
              auVar167._20_4_ =
                   (fVar373 + 1.0 + fVar373 * fVar373 * auVar217._20_4_) * auVar181._4_4_ + 1.0;
              auVar167._24_4_ =
                   (fVar374 + 1.0 + fVar374 * fVar374 * auVar217._24_4_) * auVar181._8_4_ + 1.0;
              auVar167._28_4_ = auVar171._28_4_ + 1.0 + auVar91._28_4_ + 1.0;
              auVar171 = vrcpps_avx(auVar167);
              fVar88 = auVar171._0_4_;
              fVar125 = auVar171._4_4_;
              fVar126 = auVar171._8_4_;
              fVar93 = auVar171._12_4_;
              fVar124 = auVar171._16_4_;
              fVar127 = auVar171._20_4_;
              fVar225 = auVar171._24_4_;
              auVar91._4_4_ = auVar167._4_4_ * (fVar125 + fVar125);
              auVar91._0_4_ = auVar167._0_4_ * (fVar88 + fVar88);
              auVar91._8_4_ = auVar167._8_4_ * (fVar126 + fVar126);
              auVar91._12_4_ = auVar167._12_4_ * (fVar93 + fVar93);
              auVar91._16_4_ = auVar167._16_4_ * (fVar124 + fVar124);
              auVar91._20_4_ = auVar167._20_4_ * (fVar127 + fVar127);
              auVar91._24_4_ = auVar167._24_4_ * (fVar225 + fVar225);
              auVar91._28_4_ = auVar167._28_4_;
              auVar113._8_4_ = 0x40000000;
              auVar113._0_8_ = 0x4000000040000000;
              auVar113._12_4_ = 0x40000000;
              auVar113._16_4_ = 0x40000000;
              auVar113._20_4_ = 0x40000000;
              auVar113._24_4_ = 0x40000000;
              auVar113._28_4_ = 0x40000000;
              auVar91 = vsubps_avx(auVar113,auVar91);
              auVar214._0_4_ = fVar88 + fVar88 + -1.0;
              auVar214._4_4_ = fVar125 + fVar125 + -1.0;
              auVar214._8_4_ = fVar126 + fVar126 + -1.0;
              auVar214._12_4_ = fVar93 + fVar93 + -1.0;
              auVar214._16_4_ = fVar124 + fVar124 + -1.0;
              auVar214._20_4_ = fVar127 + fVar127 + -1.0;
              auVar214._24_4_ = fVar225 + fVar225 + -1.0;
              auVar214._28_4_ = auVar171._28_4_ + auVar171._28_4_ + -1.0;
              auVar164._0_4_ = auVar214._0_4_ + fVar88 * auVar91._0_4_;
              auVar164._4_4_ = auVar214._4_4_ + fVar125 * auVar91._4_4_;
              auVar164._8_4_ = auVar214._8_4_ + fVar126 * auVar91._8_4_;
              auVar164._12_4_ = auVar214._12_4_ + fVar93 * auVar91._12_4_;
              auVar164._16_4_ = auVar214._16_4_ + fVar124 * auVar91._16_4_;
              auVar164._20_4_ = auVar214._20_4_ + fVar127 * auVar91._20_4_;
              auVar164._24_4_ = auVar214._24_4_ + fVar225 * auVar91._24_4_;
              goto LAB_00288eb4;
            case 6:
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              fVar125 = (*(float **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar214._4_4_ = fVar125;
              auVar214._0_4_ = fVar125;
              auVar214._8_4_ = fVar125;
              auVar214._12_4_ = fVar125;
              auVar214._16_4_ = fVar125;
              auVar214._20_4_ = fVar125;
              auVar214._24_4_ = fVar125;
              auVar214._28_4_ = fVar125;
              auVar171._0_4_ = auVar346._0_4_ * fVar88 + fVar125;
              auVar171._4_4_ = auVar346._4_4_ * fVar88 + fVar125;
              auVar171._8_4_ = fVar180 * fVar88 + fVar125;
              auVar171._12_4_ = fVar220 * fVar88 + fVar125;
              auVar171._16_4_ = fVar221 * fVar88 + fVar125;
              auVar171._20_4_ = fVar222 * fVar88 + fVar125;
              auVar171._24_4_ = fVar223 * fVar88 + fVar125;
              auVar171._28_4_ = fVar88 + fVar125;
              auVar171 = vmaxps_avx(auVar171,auVar91);
              auVar171 = vminps_avx(auVar171,auVar245);
              auVar164 = auVar171._0_28_;
LAB_00288eb4:
              in_ZMM3 = ZEXT3264(auVar214);
              auVar45._4_4_ = auVar346._4_4_ * auVar164._4_4_;
              auVar45._0_4_ = auVar346._0_4_ * auVar164._0_4_;
              auVar45._8_4_ = fVar180 * auVar164._8_4_;
              auVar45._12_4_ = fVar220 * auVar164._12_4_;
              auVar45._16_4_ = fVar221 * auVar164._16_4_;
              auVar45._20_4_ = fVar222 * auVar164._20_4_;
              auVar45._24_4_ = fVar223 * auVar164._24_4_;
              auVar45._28_4_ = auVar217._28_4_;
              auVar217 = auVar45;
            }
switchD_00288a15_caseD_1:
            *(undefined1 (*) [32])local_128 = auVar217;
            local_128 = local_128 + 4;
            iVar64 = iVar64 + 1;
          }
        }
      }
    }
    if ((iVar75 == 4) && (uVar61 == 8)) {
      p_Var56 = local_90[-3];
      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
      iVar72 = *(int *)(&this->field_0xdc + (long)p_Var56);
      iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var56);
      iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
      iVar78 = *(int *)(&this->field_0xe8 + (long)p_Var56);
      iVar80 = *(int *)(&this->field_0x114 + (long)p_Var56);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
      uVar85 = 0;
      uVar73 = 0;
      if (0 < (int)uVar14) {
        uVar73 = (ulong)uVar14;
      }
      uVar84 = 0;
      if (0 < (int)uVar16) {
        uVar84 = (ulong)uVar16;
      }
      uVar66 = (ulong)(uint)local_d8.c;
      if (local_d8.c < 1) {
        uVar66 = uVar85;
      }
      auVar299 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                    CONCAT424(0x42b0c0a5,
                                              CONCAT420(0x42b0c0a5,
                                                        CONCAT416(0x42b0c0a5,
                                                                  CONCAT412(0x42b0c0a5,
                                                                            CONCAT48(0x42b0c0a5,
                                                                                                                                                                          
                                                  0x42b0c0a542b0c0a5)))))));
      auVar304 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar306 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar325 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar346 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar309 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      auVar317 = ZEXT3264(CONCAT428(0x3ab743ce,
                                    CONCAT424(0x3ab743ce,
                                              CONCAT420(0x3ab743ce,
                                                        CONCAT416(0x3ab743ce,
                                                                  CONCAT412(0x3ab743ce,
                                                                            CONCAT48(0x3ab743ce,
                                                                                                                                                                          
                                                  0x3ab743ce3ab743ce)))))));
      auVar326 = ZEXT3264(CONCAT428(0x3c088908,
                                    CONCAT424(0x3c088908,
                                              CONCAT420(0x3c088908,
                                                        CONCAT416(0x3c088908,
                                                                  CONCAT412(0x3c088908,
                                                                            CONCAT48(0x3c088908,
                                                                                                                                                                          
                                                  0x3c0889083c088908)))))));
      auVar92 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                   CONCAT424(0x3d2aa9c1,
                                             CONCAT420(0x3d2aa9c1,
                                                       CONCAT416(0x3d2aa9c1,
                                                                 CONCAT412(0x3d2aa9c1,
                                                                           CONCAT48(0x3d2aa9c1,
                                                                                                                                                                        
                                                  0x3d2aa9c13d2aa9c1)))))));
      auVar347 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                    CONCAT424(0x3e2aaaaa,
                                              CONCAT420(0x3e2aaaaa,
                                                        CONCAT416(0x3e2aaaaa,
                                                                  CONCAT412(0x3e2aaaaa,
                                                                            CONCAT48(0x3e2aaaaa,
                                                                                                                                                                          
                                                  0x3e2aaaaa3e2aaaaa)))))));
      auVar369 = ZEXT1664(ZEXT816(0) << 0x40);
      for (; uVar85 != uVar66; uVar85 = uVar85 + 1) {
        local_1a0 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar85 * local_d8.elemsize);
        iVar55 = bottom_blob->w;
        iVar54 = bottom_blob->h;
        uVar87 = 0;
        uVar58 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar58 = uVar87;
        }
        uVar68 = local_d8.w;
        if (local_d8.w < 1) {
          uVar68 = 0;
        }
        uVar49 = local_d8.h;
        if (local_d8.h < 1) {
          uVar49 = 0;
        }
        while (uVar74 = (uint)uVar87, uVar74 != uVar49) {
          iVar64 = (1 - uVar14) * iVar72;
          for (uVar52 = 0; uVar52 != uVar68; uVar52 = uVar52 + 1) {
            if (lVar59 == 0) {
              auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar335 = ZEXT3264(*(undefined1 (*) [32])(lVar59 + uVar85 * 0x20));
            }
            lVar82 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar85 * (this->weight_data_tm).elemsize + 0x60;
            for (uVar87 = 0; uVar87 != uVar58; uVar87 = uVar87 + 1) {
              pvVar69 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar87 +
                                (long)bottom_blob->data);
              local_88._0_8_ = pvVar69;
              lVar83 = lVar82;
              for (uVar79 = 0; uVar79 != uVar84; uVar79 = uVar79 + 1) {
                iVar50 = (((int)uVar79 - uVar16) + 1) * iVar13 + uVar74;
                if (((-1 < iVar50) && (iVar51 = iVar50 / iVar78, iVar50 % iVar78 == 0)) &&
                   (iVar51 < iVar54)) {
                  lVar81 = (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize;
                  iVar50 = iVar64;
                  for (lVar76 = 0; uVar73 * 0x80 != lVar76; lVar76 = lVar76 + 0x80) {
                    if (((-1 < iVar50) && (iVar51 = iVar50 / iVar71, iVar50 % iVar71 == 0)) &&
                       (iVar51 < iVar55)) {
                      lVar57 = (long)(iVar51 << 2);
                      fVar88 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81);
                      fVar125 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 4);
                      fVar126 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 8);
                      fVar93 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0xc);
                      pfVar1 = (float *)(lVar83 + -0x60 + lVar76);
                      pfVar2 = (float *)(lVar83 + -0x40 + lVar76);
                      pfVar3 = (float *)(lVar83 + -0x20 + lVar76);
                      pfVar4 = (float *)(lVar83 + lVar76);
                      auVar335 = ZEXT3264(CONCAT428(auVar335._28_4_ + fVar88 + fVar125 + fVar126 +
                                                    fVar125 + fVar126,
                                                    CONCAT424(auVar335._24_4_ + fVar88 * pfVar1[6] +
                                                              fVar125 * pfVar2[6] +
                                                              fVar126 * pfVar3[6] +
                                                              fVar93 * pfVar4[6],
                                                              CONCAT420(auVar335._20_4_ +
                                                                        fVar88 * pfVar1[5] +
                                                                        fVar125 * pfVar2[5] +
                                                                        fVar126 * pfVar3[5] +
                                                                        fVar93 * pfVar4[5],
                                                                        CONCAT416(auVar335._16_4_ +
                                                                                  fVar88 * pfVar1[4]
                                                                                  + fVar125 * pfVar2
                                                  [4] + fVar126 * pfVar3[4] + fVar93 * pfVar4[4],
                                                  CONCAT412(auVar335._12_4_ + fVar88 * pfVar1[3] +
                                                            fVar125 * pfVar2[3] +
                                                            fVar126 * pfVar3[3] + fVar93 * pfVar4[3]
                                                            ,CONCAT48(auVar335._8_4_ +
                                                                      fVar88 * pfVar1[2] +
                                                                      fVar125 * pfVar2[2] +
                                                                      fVar126 * pfVar3[2] +
                                                                      fVar93 * pfVar4[2],
                                                                      CONCAT44(auVar335._4_4_ +
                                                                               fVar88 * pfVar1[1] +
                                                                               fVar125 * pfVar2[1] +
                                                                               fVar126 * pfVar3[1] +
                                                                               fVar93 * pfVar4[1],
                                                                               auVar335._0_4_ +
                                                                               fVar88 * *pfVar1 +
                                                                               fVar125 * *pfVar2 +
                                                                               fVar126 * *pfVar3 +
                                                                               fVar93 * *pfVar4)))))
                                                  )));
                    }
                    iVar50 = iVar50 + iVar72;
                  }
                }
                lVar83 = lVar83 + (long)(int)uVar14 * 0x80;
              }
              lVar82 = lVar82 + (long)(int)(uVar14 * uVar16 * 0x20) * 4;
            }
            auVar245 = auVar335._0_32_;
            auVar248 = auVar245;
            if (5 < iVar80 - 1U) goto switchD_002892b6_caseD_1;
            auVar214 = auVar369._0_32_;
            auVar248 = vmaxps_avx(auVar245,auVar214);
            fVar336 = auVar335._8_4_;
            fVar337 = auVar335._12_4_;
            fVar338 = auVar335._16_4_;
            fVar339 = auVar335._20_4_;
            fVar340 = auVar335._24_4_;
            fVar238 = auVar306._0_4_;
            fVar258 = auVar306._4_4_;
            fVar259 = auVar306._8_4_;
            fVar260 = auVar306._12_4_;
            fVar261 = auVar306._16_4_;
            fVar262 = auVar306._20_4_;
            fVar263 = auVar306._24_4_;
            auVar217 = auVar346._0_32_;
            fVar307 = auVar309._0_4_;
            fVar310 = auVar309._4_4_;
            fVar311 = auVar309._8_4_;
            fVar312 = auVar309._12_4_;
            fVar313 = auVar309._16_4_;
            fVar314 = auVar309._20_4_;
            fVar315 = auVar309._24_4_;
            fVar316 = auVar317._0_4_;
            fVar318 = auVar317._4_4_;
            fVar319 = auVar317._8_4_;
            fVar320 = auVar317._12_4_;
            fVar321 = auVar317._16_4_;
            fVar322 = auVar317._20_4_;
            fVar323 = auVar317._24_4_;
            fVar324 = auVar326._0_4_;
            fVar327 = auVar326._4_4_;
            fVar328 = auVar326._8_4_;
            fVar329 = auVar326._12_4_;
            fVar330 = auVar326._16_4_;
            fVar331 = auVar326._20_4_;
            fVar332 = auVar326._24_4_;
            fVar341 = auVar347._0_4_;
            fVar348 = auVar347._4_4_;
            fVar349 = auVar347._8_4_;
            fVar350 = auVar347._12_4_;
            fVar351 = auVar347._16_4_;
            fVar352 = auVar347._20_4_;
            fVar353 = auVar347._24_4_;
            auVar171 = auVar299._0_32_;
            auVar91 = auVar304._0_32_;
            fVar127 = auVar325._4_4_;
            fVar225 = auVar325._8_4_;
            fVar220 = auVar325._12_4_;
            fVar223 = auVar325._16_4_;
            fVar370 = auVar325._20_4_;
            fVar374 = auVar325._24_4_;
            fVar22 = auVar325._28_4_;
            fVar88 = auVar92._0_4_;
            fVar124 = auVar92._4_4_;
            fVar180 = auVar92._8_4_;
            fVar221 = auVar92._12_4_;
            fVar224 = auVar92._16_4_;
            fVar372 = auVar92._20_4_;
            fVar373 = auVar92._24_4_;
            fVar93 = auVar346._4_4_;
            fVar227 = auVar346._8_4_;
            fVar222 = auVar346._12_4_;
            fVar226 = auVar346._16_4_;
            fVar371 = auVar346._20_4_;
            fVar375 = auVar346._24_4_;
            fVar23 = auVar346._28_4_;
            fVar125 = auVar346._0_4_;
            fVar126 = auVar325._0_4_;
            switch(iVar80) {
            case 2:
              auVar245 = vminps_avx(auVar245,auVar214);
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              auVar369 = ZEXT464(0) << 0x20;
              auVar246._0_4_ = fVar88 * auVar245._0_4_ + auVar248._0_4_;
              auVar246._4_4_ = fVar88 * auVar245._4_4_ + auVar248._4_4_;
              auVar246._8_4_ = fVar88 * auVar245._8_4_ + auVar248._8_4_;
              auVar246._12_4_ = fVar88 * auVar245._12_4_ + auVar248._12_4_;
              auVar246._16_4_ = fVar88 * auVar245._16_4_ + auVar248._16_4_;
              auVar246._20_4_ = fVar88 * auVar245._20_4_ + auVar248._20_4_;
              auVar246._24_4_ = fVar88 * auVar245._24_4_ + auVar248._24_4_;
              auVar246._28_4_ = auVar245._28_4_ + auVar248._28_4_;
              auVar248 = auVar246;
              break;
            case 3:
              uVar17 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
              auVar249._4_4_ = uVar17;
              auVar249._0_4_ = uVar17;
              auVar249._8_4_ = uVar17;
              auVar249._12_4_ = uVar17;
              auVar249._16_4_ = uVar17;
              auVar249._20_4_ = uVar17;
              auVar249._24_4_ = uVar17;
              auVar249._28_4_ = uVar17;
              uVar17 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar367._4_4_ = uVar17;
              auVar367._0_4_ = uVar17;
              auVar367._8_4_ = uVar17;
              auVar367._12_4_ = uVar17;
              auVar367._16_4_ = uVar17;
              auVar367._20_4_ = uVar17;
              auVar367._24_4_ = uVar17;
              auVar367._28_4_ = uVar17;
              auVar245 = vmaxps_avx(auVar245,auVar249);
              auVar248 = vminps_avx(auVar367,auVar245);
              auVar369 = ZEXT464(0) << 0x20;
              break;
            case 4:
              auVar250._0_8_ = auVar335._0_8_ ^ 0x8000000080000000;
              auVar250._8_4_ = -fVar336;
              auVar250._12_4_ = -fVar337;
              auVar250._16_4_ = -fVar338;
              auVar250._20_4_ = -fVar339;
              auVar250._24_4_ = -fVar340;
              auVar250._28_4_ = -auVar335._28_4_;
              auVar245 = vminps_avx(auVar250,auVar171);
              auVar171 = vmaxps_avx(auVar91,auVar245);
              auVar333._0_4_ = fVar238 * auVar171._0_4_ + fVar126;
              auVar333._4_4_ = fVar258 * auVar171._4_4_ + fVar127;
              auVar333._8_4_ = fVar259 * auVar171._8_4_ + fVar225;
              auVar333._12_4_ = fVar260 * auVar171._12_4_ + fVar220;
              auVar333._16_4_ = fVar261 * auVar171._16_4_ + fVar223;
              auVar333._20_4_ = fVar262 * auVar171._20_4_ + fVar370;
              auVar333._24_4_ = fVar263 * auVar171._24_4_ + fVar374;
              auVar333._28_4_ = auVar335._28_4_ + fVar22;
              auVar91 = vroundps_avx(auVar333,1);
              auVar245 = vcmpps_avx(auVar333,auVar91,1);
              auVar245 = vandps_avx(auVar245,auVar217);
              auVar245 = vsubps_avx(auVar91,auVar245);
              fVar238 = auVar245._0_4_ * -0.6931472 + auVar171._0_4_;
              fVar258 = auVar245._4_4_ * -0.6931472 + auVar171._4_4_;
              fVar259 = auVar245._8_4_ * -0.6931472 + auVar171._8_4_;
              fVar260 = auVar245._12_4_ * -0.6931472 + auVar171._12_4_;
              fVar261 = auVar245._16_4_ * -0.6931472 + auVar171._16_4_;
              fVar262 = auVar245._20_4_ * -0.6931472 + auVar171._20_4_;
              fVar263 = auVar245._24_4_ * -0.6931472 + auVar171._24_4_;
              auVar369 = ZEXT464(0) << 0x20;
              auVar241._0_4_ = (int)auVar245._0_4_;
              auVar241._4_4_ = (int)auVar245._4_4_;
              auVar241._8_4_ = (int)auVar245._8_4_;
              auVar241._12_4_ = (int)auVar245._12_4_;
              auVar251._16_4_ = (int)auVar245._16_4_;
              auVar251._0_16_ = auVar241;
              auVar251._20_4_ = (int)auVar245._20_4_;
              auVar251._24_4_ = (int)auVar245._24_4_;
              auVar251._28_4_ = (int)auVar245._28_4_;
              auVar264 = vpslld_avx(auVar241,0x17);
              auVar181 = vpslld_avx(auVar251._16_16_,0x17);
              auVar130._8_4_ = 0x3f800000;
              auVar130._0_8_ = 0x3f8000003f800000;
              auVar130._12_4_ = 0x3f800000;
              auVar181 = vpaddd_avx(auVar181,auVar130);
              auVar264 = vpaddd_avx(auVar264,auVar130);
              auVar117._0_4_ =
                   (fVar238 + fVar125 +
                   fVar238 * fVar238 *
                   ((fVar341 +
                    ((fVar324 + (fVar316 + fVar307 * fVar238) * fVar238) * fVar238 + fVar88) *
                    fVar238) * fVar238 + fVar126)) * auVar264._0_4_ + fVar125;
              auVar117._4_4_ =
                   (fVar258 + fVar93 +
                   fVar258 * fVar258 *
                   ((fVar348 +
                    ((fVar327 + (fVar318 + fVar310 * fVar258) * fVar258) * fVar258 + fVar124) *
                    fVar258) * fVar258 + fVar127)) * auVar264._4_4_ + fVar93;
              auVar117._8_4_ =
                   (fVar259 + fVar227 +
                   fVar259 * fVar259 *
                   ((fVar349 +
                    ((fVar328 + (fVar319 + fVar311 * fVar259) * fVar259) * fVar259 + fVar180) *
                    fVar259) * fVar259 + fVar225)) * auVar264._8_4_ + fVar227;
              auVar117._12_4_ =
                   (fVar260 + fVar222 +
                   fVar260 * fVar260 *
                   ((fVar350 +
                    ((fVar329 + (fVar320 + fVar312 * fVar260) * fVar260) * fVar260 + fVar221) *
                    fVar260) * fVar260 + fVar220)) * auVar264._12_4_ + fVar222;
              auVar117._16_4_ =
                   (fVar261 + fVar226 +
                   fVar261 * fVar261 *
                   ((fVar351 +
                    ((fVar330 + (fVar321 + fVar313 * fVar261) * fVar261) * fVar261 + fVar224) *
                    fVar261) * fVar261 + fVar223)) * auVar181._0_4_ + fVar226;
              auVar117._20_4_ =
                   (fVar262 + fVar371 +
                   fVar262 * fVar262 *
                   ((fVar352 +
                    ((fVar331 + (fVar322 + fVar314 * fVar262) * fVar262) * fVar262 + fVar372) *
                    fVar262) * fVar262 + fVar370)) * auVar181._4_4_ + fVar371;
              auVar117._24_4_ =
                   (fVar263 + fVar375 +
                   fVar263 * fVar263 *
                   ((fVar353 +
                    ((fVar332 + (fVar323 + fVar315 * fVar263) * fVar263) * fVar263 + fVar373) *
                    fVar263) * fVar263 + fVar374)) * auVar181._8_4_ + fVar375;
              auVar117._28_4_ =
                   auVar91._28_4_ + auVar171._28_4_ + fVar23 +
                   auVar347._28_4_ + auVar326._28_4_ + auVar317._28_4_ + -0.6931472 + auVar92._28_4_
                   + fVar22 + fVar23;
              auVar245 = vrcpps_avx(auVar117);
              fVar88 = auVar245._0_4_;
              fVar125 = auVar245._4_4_;
              auVar39._4_4_ = auVar117._4_4_ * fVar125;
              auVar39._0_4_ = auVar117._0_4_ * fVar88;
              fVar126 = auVar245._8_4_;
              auVar39._8_4_ = auVar117._8_4_ * fVar126;
              fVar93 = auVar245._12_4_;
              auVar39._12_4_ = auVar117._12_4_ * fVar93;
              fVar124 = auVar245._16_4_;
              auVar39._16_4_ = auVar117._16_4_ * fVar124;
              fVar127 = auVar245._20_4_;
              auVar39._20_4_ = auVar117._20_4_ * fVar127;
              fVar225 = auVar245._24_4_;
              auVar39._24_4_ = auVar117._24_4_ * fVar225;
              auVar39._28_4_ = auVar117._28_4_;
              auVar217 = vsubps_avx(auVar217,auVar39);
              auVar248._0_4_ = fVar88 + fVar88 * auVar217._0_4_;
              auVar248._4_4_ = fVar125 + fVar125 * auVar217._4_4_;
              auVar248._8_4_ = fVar126 + fVar126 * auVar217._8_4_;
              auVar248._12_4_ = fVar93 + fVar93 * auVar217._12_4_;
              auVar248._16_4_ = fVar124 + fVar124 * auVar217._16_4_;
              auVar248._20_4_ = fVar127 + fVar127 * auVar217._20_4_;
              auVar248._24_4_ = fVar225 + fVar225 * auVar217._24_4_;
              auVar248._28_4_ = auVar245._28_4_ + auVar217._28_4_;
              break;
            case 5:
              auVar245 = vminps_avx(auVar245,auVar171);
              auVar214 = vmaxps_avx(auVar91,auVar245);
              auVar247._0_4_ = fVar238 * auVar214._0_4_ + fVar126;
              auVar247._4_4_ = fVar258 * auVar214._4_4_ + fVar127;
              auVar247._8_4_ = fVar259 * auVar214._8_4_ + fVar225;
              auVar247._12_4_ = fVar260 * auVar214._12_4_ + fVar220;
              auVar247._16_4_ = fVar261 * auVar214._16_4_ + fVar223;
              auVar247._20_4_ = fVar262 * auVar214._20_4_ + fVar370;
              auVar247._24_4_ = fVar263 * auVar214._24_4_ + fVar374;
              auVar247._28_4_ = auVar248._28_4_ + fVar22;
              auVar31 = vroundps_avx(auVar247,1);
              auVar245 = vcmpps_avx(auVar247,auVar31,1);
              auVar245 = vandps_avx(auVar245,auVar217);
              auVar245 = vsubps_avx(auVar31,auVar245);
              auVar35._4_4_ = auVar245._4_4_ * 0.6931472;
              auVar35._0_4_ = auVar245._0_4_ * 0.6931472;
              auVar35._8_4_ = auVar245._8_4_ * 0.6931472;
              auVar35._12_4_ = auVar245._12_4_ * 0.6931472;
              auVar35._16_4_ = auVar245._16_4_ * 0.6931472;
              auVar35._20_4_ = auVar245._20_4_ * 0.6931472;
              auVar35._24_4_ = auVar245._24_4_ * 0.6931472;
              auVar35._28_4_ = auVar31._28_4_;
              auVar217 = vsubps_avx(auVar214,auVar35);
              fVar24 = auVar217._0_4_;
              fVar25 = auVar217._4_4_;
              fVar26 = auVar217._8_4_;
              fVar27 = auVar217._12_4_;
              fVar28 = auVar217._16_4_;
              fVar29 = auVar217._20_4_;
              fVar30 = auVar217._24_4_;
              auVar128._0_4_ = (int)auVar245._0_4_;
              auVar128._4_4_ = (int)auVar245._4_4_;
              auVar128._8_4_ = (int)auVar245._8_4_;
              auVar128._12_4_ = (int)auVar245._12_4_;
              auVar172._16_4_ = (int)auVar245._16_4_;
              auVar172._0_16_ = auVar128;
              auVar172._20_4_ = (int)auVar245._20_4_;
              auVar172._24_4_ = (int)auVar245._24_4_;
              auVar172._28_4_ = (int)auVar245._28_4_;
              auVar264 = vpslld_avx(auVar128,0x17);
              auVar181 = vpslld_avx(auVar172._16_16_,0x17);
              auVar182._8_4_ = 0x3f800000;
              auVar182._0_8_ = 0x3f8000003f800000;
              auVar182._12_4_ = 0x3f800000;
              auVar181 = vpaddd_avx(auVar181,auVar182);
              auVar264 = vpaddd_avx(auVar264,auVar182);
              local_88._0_4_ =
                   (fVar24 + fVar125 +
                   fVar24 * fVar24 *
                   ((fVar341 +
                    ((fVar324 + (fVar316 + fVar307 * fVar24) * fVar24) * fVar24 + fVar88) * fVar24)
                    * fVar24 + fVar126)) * auVar264._0_4_ + fVar125;
              local_88._4_4_ =
                   (fVar25 + fVar93 +
                   fVar25 * fVar25 *
                   ((fVar348 +
                    ((fVar327 + (fVar318 + fVar310 * fVar25) * fVar25) * fVar25 + fVar124) * fVar25)
                    * fVar25 + fVar127)) * auVar264._4_4_ + fVar93;
              local_88._8_4_ =
                   (fVar26 + fVar227 +
                   fVar26 * fVar26 *
                   ((fVar349 +
                    ((fVar328 + (fVar319 + fVar311 * fVar26) * fVar26) * fVar26 + fVar180) * fVar26)
                    * fVar26 + fVar225)) * auVar264._8_4_ + fVar227;
              local_88._12_4_ =
                   (fVar27 + fVar222 +
                   fVar27 * fVar27 *
                   ((fVar350 +
                    ((fVar329 + (fVar320 + fVar312 * fVar27) * fVar27) * fVar27 + fVar221) * fVar27)
                    * fVar27 + fVar220)) * auVar264._12_4_ + fVar222;
              local_88._16_4_ =
                   (fVar28 + fVar226 +
                   fVar28 * fVar28 *
                   ((fVar351 +
                    ((fVar330 + (fVar321 + fVar313 * fVar28) * fVar28) * fVar28 + fVar224) * fVar28)
                    * fVar28 + fVar223)) * auVar181._0_4_ + fVar226;
              local_88._20_4_ =
                   (fVar29 + fVar371 +
                   fVar29 * fVar29 *
                   ((fVar352 +
                    ((fVar331 + (fVar322 + fVar314 * fVar29) * fVar29) * fVar29 + fVar372) * fVar29)
                    * fVar29 + fVar370)) * auVar181._4_4_ + fVar371;
              local_88._24_4_ =
                   (fVar30 + fVar375 +
                   fVar30 * fVar30 *
                   ((fVar353 +
                    ((fVar332 + (fVar323 + fVar315 * fVar30) * fVar30) * fVar30 + fVar373) * fVar30)
                    * fVar30 + fVar374)) * auVar181._8_4_ + fVar375;
              local_88._28_4_ =
                   auVar217._28_4_ + fVar23 +
                   auVar347._28_4_ + auVar326._28_4_ + auVar317._28_4_ + 0.6931472 + auVar92._28_4_
                   + fVar22 + fVar23;
              auVar114._8_4_ = 0x800000;
              auVar114._0_8_ = 0x80000000800000;
              auVar114._12_4_ = 0x800000;
              auVar114._16_4_ = 0x800000;
              auVar114._20_4_ = 0x800000;
              auVar114._24_4_ = 0x800000;
              auVar114._28_4_ = 0x800000;
              auVar214 = vmaxps_avx(local_88,auVar114);
              auVar181 = vpsrld_avx(auVar214._16_16_,0x17);
              auVar215._8_4_ = 0x807fffff;
              auVar215._0_8_ = 0x807fffff807fffff;
              auVar215._12_4_ = 0x807fffff;
              auVar215._16_4_ = 0x807fffff;
              auVar215._20_4_ = 0x807fffff;
              auVar215._24_4_ = 0x807fffff;
              auVar215._28_4_ = 0x807fffff;
              auVar245 = vandps_avx(auVar214,auVar215);
              auVar31 = vorps_avx(auVar245,auVar325._0_32_);
              auVar216._8_4_ = 0x3f3504f3;
              auVar216._0_8_ = 0x3f3504f33f3504f3;
              auVar216._12_4_ = 0x3f3504f3;
              auVar216._16_4_ = 0x3f3504f3;
              auVar216._20_4_ = 0x3f3504f3;
              auVar216._24_4_ = 0x3f3504f3;
              auVar216._28_4_ = 0x3f3504f3;
              auVar217 = vcmpps_avx(auVar216,auVar31,2);
              auVar245 = vandnps_avx(auVar217,auVar31);
              fVar125 = auVar31._0_4_ + -1.0 + auVar245._0_4_;
              fVar93 = auVar31._4_4_ + -1.0 + auVar245._4_4_;
              fVar227 = auVar31._8_4_ + -1.0 + auVar245._8_4_;
              fVar222 = auVar31._12_4_ + -1.0 + auVar245._12_4_;
              fVar226 = auVar31._16_4_ + -1.0 + auVar245._16_4_;
              fVar371 = auVar31._20_4_ + -1.0 + auVar245._20_4_;
              fVar375 = auVar31._24_4_ + -1.0 + auVar245._24_4_;
              auVar181 = vpsubd_avx(auVar181,auVar217._16_16_);
              auVar299 = ZEXT3264(auVar171);
              auVar304 = ZEXT3264(auVar91);
              auVar306 = ZEXT3264(auVar306._0_32_);
              auVar309 = ZEXT3264(auVar309._0_32_);
              auVar317 = ZEXT3264(auVar317._0_32_);
              auVar326 = ZEXT3264(auVar326._0_32_);
              auVar92 = ZEXT3264(auVar92._0_32_);
              auVar325 = ZEXT3264(auVar325._0_32_);
              auVar347 = ZEXT3264(auVar347._0_32_);
              auVar236._8_4_ = 0x3f800000;
              auVar236._0_8_ = 0x3f8000003f800000;
              auVar236._12_4_ = 0x3f800000;
              auVar236._16_4_ = 0x3f800000;
              auVar236._20_4_ = 0x3f800000;
              auVar236._24_4_ = 0x3f800000;
              auVar236._28_4_ = 0x3f800000;
              auVar346 = ZEXT3264(auVar236);
              auVar264 = vpsrld_avx(auVar214._0_16_,0x17);
              auVar239._8_4_ = 0xffffff81;
              auVar239._0_8_ = 0xffffff81ffffff81;
              auVar239._12_4_ = 0xffffff81;
              auVar181 = vpaddd_avx(auVar181,auVar239);
              auVar264 = vpsubd_avx(auVar264,auVar217._0_16_);
              auVar264 = vpaddd_avx(auVar264,auVar239);
              auVar115._16_16_ = auVar181;
              auVar115._0_16_ = auVar264;
              auVar217 = vcmpps_avx(local_88,_DAT_004c75a0,2);
              auVar214 = vcvtdq2ps_avx(auVar115);
              auVar369 = ZEXT464(0) << 0x20;
              auVar36._4_4_ =
                   (fVar93 + auVar214._4_4_ * 0.6931472 +
                   fVar93 * fVar93 *
                   (fVar93 * (fVar93 * (fVar93 * (fVar93 * (fVar93 * (fVar93 * (fVar93 * (fVar93 * (
                                                  fVar93 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                                 0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                   -2.0;
              auVar36._0_4_ =
                   (fVar125 + auVar214._0_4_ * 0.6931472 +
                   fVar125 * fVar125 *
                   (fVar125 * (fVar125 * (fVar125 * (fVar125 * (fVar125 * (fVar125 * (fVar125 * (
                                                  fVar125 * (fVar125 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar36._8_4_ =
                   (fVar227 + auVar214._8_4_ * 0.6931472 +
                   fVar227 * fVar227 *
                   (fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * (
                                                  fVar227 * (fVar227 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar36._12_4_ =
                   (fVar222 + auVar214._12_4_ * 0.6931472 +
                   fVar222 * fVar222 *
                   (fVar222 * (fVar222 * (fVar222 * (fVar222 * (fVar222 * (fVar222 * (fVar222 * (
                                                  fVar222 * (fVar222 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar36._16_4_ =
                   (fVar226 + auVar214._16_4_ * 0.6931472 +
                   fVar226 * fVar226 *
                   (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (
                                                  fVar226 * (fVar226 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar36._20_4_ =
                   (fVar371 + auVar214._20_4_ * 0.6931472 +
                   fVar371 * fVar371 *
                   (fVar371 * (fVar371 * (fVar371 * (fVar371 * (fVar371 * (fVar371 * (fVar371 * (
                                                  fVar371 * (fVar371 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar36._24_4_ =
                   (fVar375 + auVar214._24_4_ * 0.6931472 +
                   fVar375 * fVar375 *
                   (fVar375 * (fVar375 * (fVar375 * (fVar375 * (fVar375 * (fVar375 * (fVar375 * (
                                                  fVar375 * (fVar375 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar36._28_4_ = auVar31._28_4_ + -1.0 + auVar245._28_4_ + auVar214._28_4_ + 0.0;
              auVar173._8_4_ = 0x7fffffff;
              auVar173._0_8_ = 0x7fffffff7fffffff;
              auVar173._12_4_ = 0x7fffffff;
              auVar173._16_4_ = 0x7fffffff;
              auVar173._20_4_ = 0x7fffffff;
              auVar173._24_4_ = 0x7fffffff;
              auVar173._28_4_ = 0x7fffffff;
              auVar245 = vblendvps_avx(auVar36,auVar173,auVar217);
              auVar245 = vminps_avx(auVar245,auVar171);
              auVar217 = vmaxps_avx(auVar91,auVar245);
              auVar174._0_4_ = fVar238 * auVar217._0_4_ + fVar126;
              auVar174._4_4_ = fVar258 * auVar217._4_4_ + fVar127;
              auVar174._8_4_ = fVar259 * auVar217._8_4_ + fVar225;
              auVar174._12_4_ = fVar260 * auVar217._12_4_ + fVar220;
              auVar174._16_4_ = fVar261 * auVar217._16_4_ + fVar223;
              auVar174._20_4_ = fVar262 * auVar217._20_4_ + fVar370;
              auVar174._24_4_ = fVar263 * auVar217._24_4_ + fVar374;
              auVar174._28_4_ = fVar22 + NAN;
              auVar171 = vroundps_avx(auVar174,1);
              auVar245 = vcmpps_avx(auVar174,auVar171,1);
              auVar245 = vandps_avx(auVar245,auVar236);
              auVar245 = vsubps_avx(auVar171,auVar245);
              auVar37._4_4_ = auVar245._4_4_ * 0.6931472;
              auVar37._0_4_ = auVar245._0_4_ * 0.6931472;
              auVar37._8_4_ = auVar245._8_4_ * 0.6931472;
              auVar37._12_4_ = auVar245._12_4_ * 0.6931472;
              auVar37._16_4_ = auVar245._16_4_ * 0.6931472;
              auVar37._20_4_ = auVar245._20_4_ * 0.6931472;
              auVar37._24_4_ = auVar245._24_4_ * 0.6931472;
              auVar37._28_4_ = auVar171._28_4_;
              auVar217 = vsubps_avx(auVar217,auVar37);
              fVar125 = auVar217._0_4_;
              fVar93 = auVar217._4_4_;
              fVar227 = auVar217._8_4_;
              fVar222 = auVar217._12_4_;
              fVar226 = auVar217._16_4_;
              fVar371 = auVar217._20_4_;
              fVar375 = auVar217._24_4_;
              auVar129._0_4_ = (int)auVar245._0_4_;
              auVar129._4_4_ = (int)auVar245._4_4_;
              auVar129._8_4_ = (int)auVar245._8_4_;
              auVar129._12_4_ = (int)auVar245._12_4_;
              auVar175._16_4_ = (int)auVar245._16_4_;
              auVar175._0_16_ = auVar129;
              auVar175._20_4_ = (int)auVar245._20_4_;
              auVar175._24_4_ = (int)auVar245._24_4_;
              auVar175._28_4_ = (int)auVar245._28_4_;
              auVar264 = vpslld_avx(auVar129,0x17);
              auVar181 = vpslld_avx(auVar175._16_16_,0x17);
              auVar240._8_4_ = 0x3f800000;
              auVar240._0_8_ = 0x3f8000003f800000;
              auVar240._12_4_ = 0x3f800000;
              auVar181 = vpaddd_avx(auVar181,auVar240);
              auVar264 = vpaddd_avx(auVar264,auVar240);
              auVar116._0_4_ =
                   (fVar125 + 1.0 +
                   fVar125 * fVar125 *
                   ((fVar341 +
                    ((fVar324 + (fVar316 + fVar307 * fVar125) * fVar125) * fVar125 + fVar88) *
                    fVar125) * fVar125 + fVar126)) * auVar264._0_4_ + 1.0;
              auVar116._4_4_ =
                   (fVar93 + 1.0 +
                   fVar93 * fVar93 *
                   ((fVar348 +
                    ((fVar327 + (fVar318 + fVar310 * fVar93) * fVar93) * fVar93 + fVar124) * fVar93)
                    * fVar93 + fVar127)) * auVar264._4_4_ + 1.0;
              auVar116._8_4_ =
                   (fVar227 + 1.0 +
                   fVar227 * fVar227 *
                   ((fVar349 +
                    ((fVar328 + (fVar319 + fVar311 * fVar227) * fVar227) * fVar227 + fVar180) *
                    fVar227) * fVar227 + fVar225)) * auVar264._8_4_ + 1.0;
              auVar116._12_4_ =
                   (fVar222 + 1.0 +
                   fVar222 * fVar222 *
                   ((fVar350 +
                    ((fVar329 + (fVar320 + fVar312 * fVar222) * fVar222) * fVar222 + fVar221) *
                    fVar222) * fVar222 + fVar220)) * auVar264._12_4_ + 1.0;
              auVar116._16_4_ =
                   (fVar226 + 1.0 +
                   fVar226 * fVar226 *
                   ((fVar351 +
                    ((fVar330 + (fVar321 + fVar313 * fVar226) * fVar226) * fVar226 + fVar224) *
                    fVar226) * fVar226 + fVar223)) * auVar181._0_4_ + 1.0;
              auVar116._20_4_ =
                   (fVar371 + 1.0 +
                   fVar371 * fVar371 *
                   ((fVar352 +
                    ((fVar331 + (fVar322 + fVar314 * fVar371) * fVar371) * fVar371 + fVar372) *
                    fVar371) * fVar371 + fVar370)) * auVar181._4_4_ + 1.0;
              auVar116._24_4_ =
                   (fVar375 + 1.0 +
                   fVar375 * fVar375 *
                   ((fVar353 +
                    ((fVar332 + (fVar323 + fVar315 * fVar375) * fVar375) * fVar375 + fVar373) *
                    fVar375) * fVar375 + fVar374)) * auVar181._8_4_ + 1.0;
              auVar116._28_4_ = auVar217._28_4_ + 1.0 + auVar171._28_4_ + 1.0;
              auVar245 = vrcpps_avx(auVar116);
              fVar88 = auVar245._0_4_;
              fVar125 = auVar245._4_4_;
              fVar126 = auVar245._8_4_;
              fVar93 = auVar245._12_4_;
              fVar124 = auVar245._16_4_;
              fVar127 = auVar245._20_4_;
              fVar225 = auVar245._24_4_;
              auVar38._4_4_ = auVar116._4_4_ * (fVar125 + fVar125);
              auVar38._0_4_ = auVar116._0_4_ * (fVar88 + fVar88);
              auVar38._8_4_ = auVar116._8_4_ * (fVar126 + fVar126);
              auVar38._12_4_ = auVar116._12_4_ * (fVar93 + fVar93);
              auVar38._16_4_ = auVar116._16_4_ * (fVar124 + fVar124);
              auVar38._20_4_ = auVar116._20_4_ * (fVar127 + fVar127);
              auVar38._24_4_ = auVar116._24_4_ * (fVar225 + fVar225);
              auVar38._28_4_ = auVar116._28_4_;
              auVar248._8_4_ = 2.0;
              auVar248._0_8_ = 0x4000000040000000;
              auVar248._12_4_ = 2.0;
              auVar248._16_4_ = 2.0;
              auVar248._20_4_ = 2.0;
              auVar248._24_4_ = 2.0;
              auVar248._28_4_ = 2.0;
              auVar245 = vsubps_avx(auVar248,auVar38);
              auVar111._0_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar245._0_4_;
              auVar111._4_4_ = fVar125 + fVar125 + -1.0 + fVar125 * auVar245._4_4_;
              auVar111._8_4_ = fVar126 + fVar126 + -1.0 + fVar126 * auVar245._8_4_;
              auVar111._12_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar245._12_4_;
              auVar111._16_4_ = fVar124 + fVar124 + -1.0 + fVar124 * auVar245._16_4_;
              auVar111._20_4_ = fVar127 + fVar127 + -1.0 + fVar127 * auVar245._20_4_;
              auVar111._24_4_ = fVar225 + fVar225 + -1.0 + fVar225 * auVar245._24_4_;
              goto LAB_00289739;
            case 6:
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              fVar125 = (*(float **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar118._0_4_ = auVar335._0_4_ * fVar88 + fVar125;
              auVar118._4_4_ = auVar335._4_4_ * fVar88 + fVar125;
              auVar118._8_4_ = fVar336 * fVar88 + fVar125;
              auVar118._12_4_ = fVar337 * fVar88 + fVar125;
              auVar118._16_4_ = fVar338 * fVar88 + fVar125;
              auVar118._20_4_ = fVar339 * fVar88 + fVar125;
              auVar118._24_4_ = fVar340 * fVar88 + fVar125;
              auVar118._28_4_ = fVar88 + fVar125;
              auVar245 = vmaxps_avx(auVar214,auVar118);
              auVar245 = vminps_avx(auVar245,auVar217);
              auVar111 = auVar245._0_28_;
LAB_00289739:
              auVar46._4_4_ = auVar335._4_4_ * auVar111._4_4_;
              auVar46._0_4_ = auVar335._0_4_ * auVar111._0_4_;
              auVar46._8_4_ = fVar336 * auVar111._8_4_;
              auVar46._12_4_ = fVar337 * auVar111._12_4_;
              auVar46._16_4_ = fVar338 * auVar111._16_4_;
              auVar46._20_4_ = fVar339 * auVar111._20_4_;
              auVar46._24_4_ = fVar340 * auVar111._24_4_;
              auVar46._28_4_ = auVar248._28_4_;
              auVar248 = auVar46;
            }
switchD_002892b6_caseD_1:
            *(undefined1 (*) [32])local_1a0 = auVar248;
            local_1a0 = local_1a0 + 4;
            iVar64 = iVar64 + 1;
          }
          uVar87 = (ulong)(uVar74 + 1);
        }
      }
    }
    if ((iVar75 == 8) && (uVar61 == 4)) {
      p_Var56 = local_90[-3];
      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
      iVar72 = *(int *)(&this->field_0xdc + (long)p_Var56);
      iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var56);
      iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
      iVar78 = *(int *)(&this->field_0xe8 + (long)p_Var56);
      iVar80 = *(int *)(&this->field_0x114 + (long)p_Var56);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
      uVar85 = 0;
      uVar73 = 0;
      if (0 < (int)uVar14) {
        uVar73 = (ulong)uVar14;
      }
      uVar84 = 0;
      if (0 < (int)uVar16) {
        uVar84 = (ulong)uVar16;
      }
      uVar66 = (ulong)(uint)local_d8.c;
      if (local_d8.c < 1) {
        uVar66 = uVar85;
      }
      auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar346 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar325 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      for (; uVar85 != uVar66; uVar85 = uVar85 + 1) {
        local_1a0 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar85 * local_d8.elemsize);
        iVar55 = bottom_blob->w;
        iVar54 = bottom_blob->h;
        uVar87 = 0;
        uVar58 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar58 = uVar87;
        }
        uVar68 = local_d8.w;
        if (local_d8.w < 1) {
          uVar68 = 0;
        }
        uVar49 = local_d8.h;
        if (local_d8.h < 1) {
          uVar49 = 0;
        }
        while (uVar74 = (uint)uVar87, uVar74 != uVar49) {
          iVar64 = (1 - uVar14) * iVar72;
          for (uVar52 = 0; uVar52 != uVar68; uVar52 = uVar52 + 1) {
            if (lVar59 == 0) {
              auVar181 = ZEXT816(0) << 0x40;
            }
            else {
              auVar181 = *(undefined1 (*) [16])(lVar59 + uVar85 * 0x10);
            }
            auVar299 = ZEXT1664(auVar181);
            lVar82 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar85 * (this->weight_data_tm).elemsize + 0x70;
            for (uVar87 = 0; uVar87 != uVar58; uVar87 = uVar87 + 1) {
              pvVar69 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar87 +
                                (long)bottom_blob->data);
              local_88._0_8_ = pvVar69;
              lVar83 = lVar82;
              for (uVar79 = 0; uVar79 != uVar84; uVar79 = uVar79 + 1) {
                iVar50 = (((int)uVar79 - uVar16) + 1) * iVar13 + uVar74;
                if (((-1 < iVar50) && (iVar51 = iVar50 / iVar78, iVar50 % iVar78 == 0)) &&
                   (iVar51 < iVar54)) {
                  lVar81 = (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize;
                  iVar50 = iVar64;
                  for (lVar76 = 0; uVar73 * 0x80 != lVar76; lVar76 = lVar76 + 0x80) {
                    if (((-1 < iVar50) && (iVar51 = iVar50 / iVar71, iVar50 % iVar71 == 0)) &&
                       (iVar51 < iVar55)) {
                      lVar57 = (long)(iVar51 << 3);
                      fVar88 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81);
                      fVar125 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 4);
                      fVar126 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 8);
                      fVar93 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0xc);
                      fVar124 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0x10);
                      fVar127 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0x14);
                      fVar225 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0x18);
                      fVar227 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0x1c);
                      pfVar2 = (float *)(lVar83 + -0x70 + lVar76);
                      pfVar3 = (float *)(lVar83 + -0x60 + lVar76);
                      pfVar4 = (float *)(lVar83 + -0x50 + lVar76);
                      pfVar5 = (float *)(lVar83 + -0x40 + lVar76);
                      pfVar6 = (float *)(lVar83 + -0x30 + lVar76);
                      pfVar7 = (float *)(lVar83 + -0x20 + lVar76);
                      pfVar8 = (float *)(lVar83 + -0x10 + lVar76);
                      pfVar1 = (float *)(lVar83 + lVar76);
                      auVar299 = ZEXT1664(CONCAT412(fVar88 * pfVar2[3] + auVar299._12_4_ +
                                                    fVar125 * pfVar3[3] + fVar126 * pfVar4[3] +
                                                    fVar93 * pfVar5[3] + fVar124 * pfVar6[3] +
                                                    fVar127 * pfVar7[3] +
                                                    fVar225 * pfVar8[3] + fVar227 * pfVar1[3],
                                                    CONCAT48(fVar88 * pfVar2[2] + auVar299._8_4_ +
                                                             fVar125 * pfVar3[2] +
                                                             fVar126 * pfVar4[2] +
                                                             fVar93 * pfVar5[2] +
                                                             fVar124 * pfVar6[2] +
                                                             fVar127 * pfVar7[2] +
                                                             fVar225 * pfVar8[2] +
                                                             fVar227 * pfVar1[2],
                                                             CONCAT44(fVar88 * pfVar2[1] +
                                                                      auVar299._4_4_ +
                                                                      fVar125 * pfVar3[1] +
                                                                      fVar126 * pfVar4[1] +
                                                                      fVar93 * pfVar5[1] +
                                                                      fVar124 * pfVar6[1] +
                                                                      fVar127 * pfVar7[1] +
                                                                      fVar225 * pfVar8[1] +
                                                                      fVar227 * pfVar1[1],
                                                                      fVar88 * *pfVar2 +
                                                                      auVar299._0_4_ +
                                                                      fVar125 * *pfVar3 +
                                                                      fVar126 * *pfVar4 +
                                                                      fVar93 * *pfVar5 +
                                                                      fVar124 * *pfVar6 +
                                                                      fVar127 * *pfVar7 +
                                                                      fVar225 * *pfVar8 +
                                                                      fVar227 * *pfVar1))));
                    }
                    iVar50 = iVar50 + iVar72;
                  }
                }
                lVar83 = lVar83 + (long)(int)uVar14 * 0x80;
              }
              lVar82 = lVar82 + (long)(int)(uVar14 * uVar16 * 0x20) * 4;
            }
            auVar181 = auVar299._0_16_;
            auVar274 = auVar181;
            if (5 < iVar80 - 1U) goto switchD_00289b5d_caseD_1;
            auVar264 = auVar92._0_16_;
            auVar274 = vmaxps_avx(auVar181,auVar264);
            auVar94 = auVar325._0_16_;
            fVar126 = auVar346._4_4_;
            fVar93 = auVar346._8_4_;
            fVar127 = auVar346._12_4_;
            fVar220 = auVar346._0_4_;
            fVar88 = auVar325._0_4_;
            fVar125 = auVar325._4_4_;
            fVar124 = auVar325._8_4_;
            fVar225 = auVar325._12_4_;
            fVar227 = auVar299._8_4_;
            fVar180 = auVar299._12_4_;
            switch(iVar80) {
            case 2:
              auVar181 = vminps_avx(auVar181,auVar264);
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              auVar266._0_4_ = fVar88 * auVar181._0_4_ + auVar274._0_4_;
              auVar266._4_4_ = fVar88 * auVar181._4_4_ + auVar274._4_4_;
              auVar266._8_4_ = fVar88 * auVar181._8_4_ + auVar274._8_4_;
              auVar266._12_4_ = fVar88 * auVar181._12_4_ + auVar274._12_4_;
              auVar274 = auVar266;
              break;
            case 3:
              uVar17 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
              auVar271._4_4_ = uVar17;
              auVar271._0_4_ = uVar17;
              auVar271._8_4_ = uVar17;
              auVar271._12_4_ = uVar17;
              uVar17 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar356._4_4_ = uVar17;
              auVar356._0_4_ = uVar17;
              auVar356._8_4_ = uVar17;
              auVar356._12_4_ = uVar17;
              auVar181 = vmaxps_avx(auVar181,auVar271);
              auVar274 = vminps_avx(auVar356,auVar181);
              break;
            case 4:
              auVar96._0_8_ = auVar299._0_8_ ^ 0x8000000080000000;
              auVar96._8_4_ = -fVar227;
              auVar96._12_4_ = -fVar180;
              auVar136._8_4_ = 0x42b0c0a5;
              auVar136._0_8_ = 0x42b0c0a542b0c0a5;
              auVar136._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar96,auVar136);
              auVar137._8_4_ = 0xc2b0c0a5;
              auVar137._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar137._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar181,auVar137);
              auVar272._0_4_ = fVar220 + auVar300._0_4_ * 1.442695;
              auVar272._4_4_ = fVar126 + auVar300._4_4_ * 1.442695;
              auVar272._8_4_ = fVar93 + auVar300._8_4_ * 1.442695;
              auVar272._12_4_ = fVar127 + auVar300._12_4_ * 1.442695;
              auVar357._0_4_ = (int)auVar272._0_4_;
              auVar357._4_4_ = (int)auVar272._4_4_;
              auVar357._8_4_ = (int)auVar272._8_4_;
              auVar357._12_4_ = (int)auVar272._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar357);
              auVar181 = vcmpps_avx(auVar272,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              fVar227 = auVar181._0_4_ * -0.6931472 + auVar300._0_4_;
              fVar180 = auVar181._4_4_ * -0.6931472 + auVar300._4_4_;
              fVar221 = auVar181._8_4_ * -0.6931472 + auVar300._8_4_;
              fVar222 = auVar181._12_4_ * -0.6931472 + auVar300._12_4_;
              auVar273._0_4_ = (int)auVar181._0_4_;
              auVar273._4_4_ = (int)auVar181._4_4_;
              auVar273._8_4_ = (int)auVar181._8_4_;
              auVar273._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar273,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar97._0_4_ =
                   (fVar227 * fVar227 *
                    (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                      + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar220) + fVar227 + fVar88
                   ) * auVar181._0_4_ + fVar88;
              auVar97._4_4_ =
                   (fVar180 * fVar180 *
                    (((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) * fVar180
                      + 0.041665796) * fVar180 + 0.16666666) * fVar180 + fVar126) +
                   fVar180 + fVar125) * auVar181._4_4_ + fVar125;
              auVar97._8_4_ =
                   (fVar221 * fVar221 *
                    (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221
                      + 0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar93) + fVar221 + fVar124
                   ) * auVar181._8_4_ + fVar124;
              auVar97._12_4_ =
                   (fVar222 * fVar222 *
                    (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222
                      + 0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar127) +
                   fVar222 + fVar225) * auVar181._12_4_ + fVar225;
              auVar181 = vrcpps_avx(auVar97);
              fVar88 = auVar181._0_4_;
              auVar98._0_4_ = auVar97._0_4_ * fVar88;
              fVar125 = auVar181._4_4_;
              auVar98._4_4_ = auVar97._4_4_ * fVar125;
              fVar126 = auVar181._8_4_;
              auVar98._8_4_ = auVar97._8_4_ * fVar126;
              fVar93 = auVar181._12_4_;
              auVar98._12_4_ = auVar97._12_4_ * fVar93;
              auVar181 = vsubps_avx(auVar94,auVar98);
              auVar274._0_4_ = fVar88 + fVar88 * auVar181._0_4_;
              auVar274._4_4_ = fVar125 + fVar125 * auVar181._4_4_;
              auVar274._8_4_ = fVar126 + fVar126 * auVar181._8_4_;
              auVar274._12_4_ = fVar93 + fVar93 * auVar181._12_4_;
              break;
            case 5:
              auVar228._8_4_ = 0x42b0c0a5;
              auVar228._0_8_ = 0x42b0c0a542b0c0a5;
              auVar228._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar181,auVar228);
              auVar301._8_4_ = 0xc2b0c0a5;
              auVar301._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar301._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar301,auVar181);
              auVar342._0_4_ = auVar300._0_4_ * 1.442695 + fVar220;
              auVar342._4_4_ = auVar300._4_4_ * 1.442695 + fVar126;
              auVar342._8_4_ = auVar300._8_4_ * 1.442695 + fVar93;
              auVar342._12_4_ = auVar300._12_4_ * 1.442695 + fVar127;
              auVar354._0_4_ = (int)auVar342._0_4_;
              auVar354._4_4_ = (int)auVar342._4_4_;
              auVar354._8_4_ = (int)auVar342._8_4_;
              auVar354._12_4_ = (int)auVar342._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar354);
              auVar181 = vcmpps_avx(auVar342,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              auVar355._0_4_ = auVar181._0_4_ * 0.6931472;
              auVar355._4_4_ = auVar181._4_4_ * 0.6931472;
              auVar355._8_4_ = auVar181._8_4_ * 0.6931472;
              auVar355._12_4_ = auVar181._12_4_ * 0.6931472;
              auVar264 = vsubps_avx(auVar300,auVar355);
              fVar221 = auVar264._0_4_;
              fVar222 = auVar264._4_4_;
              fVar223 = auVar264._8_4_;
              fVar224 = auVar264._12_4_;
              auVar267._0_4_ = (int)auVar181._0_4_;
              auVar267._4_4_ = (int)auVar181._4_4_;
              auVar267._8_4_ = (int)auVar181._8_4_;
              auVar267._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar267,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar268._0_4_ =
                   (fVar221 + fVar88 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar220)) * auVar181._0_4_ +
                   fVar88;
              auVar268._4_4_ =
                   (fVar222 + fVar125 +
                   fVar222 * fVar222 *
                   (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222 +
                     0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar126)) * auVar181._4_4_ +
                   fVar125;
              auVar268._8_4_ =
                   (fVar223 + fVar124 +
                   fVar223 * fVar223 *
                   (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) * fVar223 +
                     0.041665796) * fVar223 + 0.16666666) * fVar223 + fVar93)) * auVar181._8_4_ +
                   fVar124;
              auVar268._12_4_ =
                   (fVar224 + fVar225 +
                   fVar224 * fVar224 *
                   (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224 +
                     0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar127)) * auVar181._12_4_ +
                   fVar225;
              auVar131._8_4_ = 0x800000;
              auVar131._0_8_ = 0x80000000800000;
              auVar131._12_4_ = 0x800000;
              auVar181 = vmaxps_avx(auVar268,auVar131);
              auVar264 = vpsrld_avx(auVar181,0x17);
              auVar183._8_4_ = 0xffffff82;
              auVar183._0_8_ = 0xffffff82ffffff82;
              auVar183._12_4_ = 0xffffff82;
              auVar264 = vpaddd_avx(auVar264,auVar183);
              auVar184._8_4_ = 0x807fffff;
              auVar184._0_8_ = 0x807fffff807fffff;
              auVar184._12_4_ = 0x807fffff;
              auVar181 = vandps_avx(auVar181,auVar184);
              auVar95 = vorps_avx(auVar181,auVar346._0_16_);
              auVar300 = vcvtdq2ps_avx(auVar264);
              auVar185._8_4_ = 0x3f3504f3;
              auVar185._0_8_ = 0x3f3504f33f3504f3;
              auVar185._12_4_ = 0x3f3504f3;
              auVar264 = vcmpps_avx(auVar95,auVar185,1);
              auVar181 = vandps_avx(auVar264,auVar95);
              fVar221 = auVar95._0_4_ + -1.0 + auVar181._0_4_;
              fVar222 = auVar95._4_4_ + -1.0 + auVar181._4_4_;
              fVar223 = auVar95._8_4_ + -1.0 + auVar181._8_4_;
              fVar224 = auVar95._12_4_ + -1.0 + auVar181._12_4_;
              auVar181 = vandps_avx(auVar264,auVar94);
              auVar264 = vsubps_avx(auVar300,auVar181);
              auVar181 = vcmpps_avx(auVar268,_DAT_004c3010,2);
              auVar132._0_4_ =
                   (fVar221 * fVar221 *
                    (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) * fVar221
                          + -0.12420141) * fVar221 + 0.14249323) * fVar221 + -0.16668057) * fVar221
                       + 0.20000714) * fVar221 + -0.24999994) * fVar221 + 0.3333333) * fVar221 +
                    -0.5) + auVar264._0_4_ * 0.6931472 + fVar221) * -2.0;
              auVar132._4_4_ =
                   (fVar222 * fVar222 *
                    (((((((((fVar222 * 0.070376836 + -0.1151461) * fVar222 + 0.116769984) * fVar222
                          + -0.12420141) * fVar222 + 0.14249323) * fVar222 + -0.16668057) * fVar222
                       + 0.20000714) * fVar222 + -0.24999994) * fVar222 + 0.3333333) * fVar222 +
                    -0.5) + auVar264._4_4_ * 0.6931472 + fVar222) * -2.0;
              auVar132._8_4_ =
                   (fVar223 * fVar223 *
                    (((((((((fVar223 * 0.070376836 + -0.1151461) * fVar223 + 0.116769984) * fVar223
                          + -0.12420141) * fVar223 + 0.14249323) * fVar223 + -0.16668057) * fVar223
                       + 0.20000714) * fVar223 + -0.24999994) * fVar223 + 0.3333333) * fVar223 +
                    -0.5) + auVar264._8_4_ * 0.6931472 + fVar223) * -2.0;
              auVar132._12_4_ =
                   (fVar224 * fVar224 *
                    (((((((((fVar224 * 0.070376836 + -0.1151461) * fVar224 + 0.116769984) * fVar224
                          + -0.12420141) * fVar224 + 0.14249323) * fVar224 + -0.16668057) * fVar224
                       + 0.20000714) * fVar224 + -0.24999994) * fVar224 + 0.3333333) * fVar224 +
                    -0.5) + auVar264._12_4_ * 0.6931472 + fVar224) * -2.0;
              auVar186._8_4_ = 0x7fffffff;
              auVar186._0_8_ = 0x7fffffff7fffffff;
              auVar186._12_4_ = 0x7fffffff;
              auVar181 = vblendvps_avx(auVar132,auVar186,auVar181);
              auVar187._8_4_ = 0x42b0c0a5;
              auVar187._0_8_ = 0x42b0c0a542b0c0a5;
              auVar187._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar181,auVar187);
              auVar188._8_4_ = 0xc2b0c0a5;
              auVar188._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar188._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar181,auVar188);
              auVar189._0_4_ = auVar300._0_4_ * 1.442695 + fVar220;
              auVar189._4_4_ = auVar300._4_4_ * 1.442695 + fVar126;
              auVar189._8_4_ = auVar300._8_4_ * 1.442695 + fVar93;
              auVar189._12_4_ = auVar300._12_4_ * 1.442695 + fVar127;
              auVar269._0_4_ = (int)auVar189._0_4_;
              auVar269._4_4_ = (int)auVar189._4_4_;
              auVar269._8_4_ = (int)auVar189._8_4_;
              auVar269._12_4_ = (int)auVar189._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar269);
              auVar181 = vcmpps_avx(auVar189,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              auVar270._0_4_ = auVar181._0_4_ * 0.6931472;
              auVar270._4_4_ = auVar181._4_4_ * 0.6931472;
              auVar270._8_4_ = auVar181._8_4_ * 0.6931472;
              auVar270._12_4_ = auVar181._12_4_ * 0.6931472;
              auVar325 = ZEXT1664(auVar94);
              auVar264 = vsubps_avx(auVar300,auVar270);
              fVar221 = auVar264._0_4_;
              fVar222 = auVar264._4_4_;
              fVar223 = auVar264._8_4_;
              fVar224 = auVar264._12_4_;
              auVar92 = ZEXT864(0) << 0x20;
              auVar346 = ZEXT1664(auVar346._0_16_);
              auVar190._0_4_ = (int)auVar181._0_4_;
              auVar190._4_4_ = (int)auVar181._4_4_;
              auVar190._8_4_ = (int)auVar181._8_4_;
              auVar190._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar190,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar133._0_4_ =
                   (fVar221 + fVar88 +
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar220) * fVar221 * fVar221)
                   * auVar181._0_4_ + fVar88;
              auVar133._4_4_ =
                   (fVar222 + fVar125 +
                   (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222 +
                     0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar126) * fVar222 * fVar222)
                   * auVar181._4_4_ + fVar125;
              auVar133._8_4_ =
                   (fVar223 + fVar124 +
                   (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) * fVar223 +
                     0.041665796) * fVar223 + 0.16666666) * fVar223 + fVar93) * fVar223 * fVar223) *
                   auVar181._8_4_ + fVar124;
              auVar133._12_4_ =
                   (fVar224 + fVar225 +
                   (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224 +
                     0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar127) * fVar224 * fVar224)
                   * auVar181._12_4_ + fVar225;
              auVar181 = vrcpps_avx(auVar133);
              fVar88 = auVar181._0_4_;
              fVar125 = auVar181._4_4_;
              fVar126 = auVar181._8_4_;
              fVar93 = auVar181._12_4_;
              auVar134._0_4_ = auVar133._0_4_ * (fVar88 + fVar88);
              auVar134._4_4_ = auVar133._4_4_ * (fVar125 + fVar125);
              auVar134._8_4_ = auVar133._8_4_ * (fVar126 + fVar126);
              auVar134._12_4_ = auVar133._12_4_ * (fVar93 + fVar93);
              auVar229._8_4_ = 0x40000000;
              auVar229._0_8_ = 0x4000000040000000;
              auVar229._12_4_ = 0x40000000;
              auVar181 = vsubps_avx(auVar229,auVar134);
              auVar135._0_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar181._0_4_;
              auVar135._4_4_ = fVar125 + fVar125 + -1.0 + fVar125 * auVar181._4_4_;
              auVar135._8_4_ = fVar126 + fVar126 + -1.0 + fVar126 * auVar181._8_4_;
              auVar135._12_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar181._12_4_;
              goto LAB_00289f93;
            case 6:
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              fVar125 = (*(float **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar138._0_4_ = fVar88 * auVar299._0_4_ + fVar125;
              auVar138._4_4_ = fVar88 * auVar299._4_4_ + fVar125;
              auVar138._8_4_ = fVar88 * fVar227 + fVar125;
              auVar138._12_4_ = fVar88 * fVar180 + fVar125;
              auVar181 = vmaxps_avx(auVar138,auVar264);
              auVar135 = vminps_avx(auVar181,auVar94);
LAB_00289f93:
              auVar274._0_4_ = auVar135._0_4_ * auVar299._0_4_;
              auVar274._4_4_ = auVar135._4_4_ * auVar299._4_4_;
              auVar274._8_4_ = auVar135._8_4_ * fVar227;
              auVar274._12_4_ = auVar135._12_4_ * fVar180;
            }
switchD_00289b5d_caseD_1:
            *(undefined1 (*) [16])local_1a0 = auVar274;
            local_1a0 = local_1a0 + 2;
            iVar64 = iVar64 + 1;
          }
          uVar87 = (ulong)(uVar74 + 1);
        }
      }
    }
    if ((iVar75 == 1) && (uVar61 == 8)) {
      p_Var56 = local_90[-3];
      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
      iVar72 = *(int *)(&this->field_0xdc + (long)p_Var56);
      iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var56);
      iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
      iVar78 = *(int *)(&this->field_0xe8 + (long)p_Var56);
      iVar80 = *(int *)(&this->field_0x114 + (long)p_Var56);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
      uVar85 = 0;
      uVar73 = 0;
      if (0 < (int)uVar14) {
        uVar73 = (ulong)uVar14;
      }
      uVar84 = 0;
      if (0 < (int)uVar16) {
        uVar84 = (ulong)uVar16;
      }
      uVar66 = (ulong)(uint)local_d8.c;
      if (local_d8.c < 1) {
        uVar66 = uVar85;
      }
      auVar304 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                    CONCAT424(0x42b0c0a5,
                                              CONCAT420(0x42b0c0a5,
                                                        CONCAT416(0x42b0c0a5,
                                                                  CONCAT412(0x42b0c0a5,
                                                                            CONCAT48(0x42b0c0a5,
                                                                                                                                                                          
                                                  0x42b0c0a542b0c0a5)))))));
      auVar306 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar309 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar346 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar299 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar317 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      auVar326 = ZEXT3264(CONCAT428(0x3ab743ce,
                                    CONCAT424(0x3ab743ce,
                                              CONCAT420(0x3ab743ce,
                                                        CONCAT416(0x3ab743ce,
                                                                  CONCAT412(0x3ab743ce,
                                                                            CONCAT48(0x3ab743ce,
                                                                                                                                                                          
                                                  0x3ab743ce3ab743ce)))))));
      auVar347 = ZEXT3264(CONCAT428(0x3c088908,
                                    CONCAT424(0x3c088908,
                                              CONCAT420(0x3c088908,
                                                        CONCAT416(0x3c088908,
                                                                  CONCAT412(0x3c088908,
                                                                            CONCAT48(0x3c088908,
                                                                                                                                                                          
                                                  0x3c0889083c088908)))))));
      auVar92 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                   CONCAT424(0x3d2aa9c1,
                                             CONCAT420(0x3d2aa9c1,
                                                       CONCAT416(0x3d2aa9c1,
                                                                 CONCAT412(0x3d2aa9c1,
                                                                           CONCAT48(0x3d2aa9c1,
                                                                                                                                                                        
                                                  0x3d2aa9c13d2aa9c1)))))));
      auVar369 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                    CONCAT424(0x3e2aaaaa,
                                              CONCAT420(0x3e2aaaaa,
                                                        CONCAT416(0x3e2aaaaa,
                                                                  CONCAT412(0x3e2aaaaa,
                                                                            CONCAT48(0x3e2aaaaa,
                                                                                                                                                                          
                                                  0x3e2aaaaa3e2aaaaa)))))));
      auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
      for (; uVar85 != uVar66; uVar85 = uVar85 + 1) {
        local_1a0 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar85 * local_d8.elemsize);
        iVar55 = bottom_blob->w;
        iVar54 = bottom_blob->h;
        uVar87 = 0;
        uVar58 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar58 = uVar87;
        }
        uVar68 = local_d8.w;
        if (local_d8.w < 1) {
          uVar68 = 0;
        }
        uVar49 = local_d8.h;
        if (local_d8.h < 1) {
          uVar49 = 0;
        }
        while (uVar74 = (uint)uVar87, uVar74 != uVar49) {
          iVar64 = (1 - uVar14) * iVar72;
          for (uVar52 = 0; uVar52 != uVar68; uVar52 = uVar52 + 1) {
            if (lVar59 == 0) {
              auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar335 = ZEXT3264(*(undefined1 (*) [32])(lVar59 + uVar85 * 0x20));
            }
            pvVar69 = (void *)((this->weight_data_tm).cstep * uVar85 *
                               (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
            for (uVar87 = 0; uVar87 != uVar58; uVar87 = uVar87 + 1) {
              pvVar70 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar87 +
                                (long)bottom_blob->data);
              local_88._0_8_ = pvVar70;
              pvVar86 = pvVar69;
              for (uVar79 = 0; uVar79 != uVar84; uVar79 = uVar79 + 1) {
                iVar50 = (((int)uVar79 - uVar16) + 1) * iVar13 + uVar74;
                if (((-1 < iVar50) && (iVar51 = iVar50 / iVar78, iVar50 % iVar78 == 0)) &&
                   (iVar51 < iVar54)) {
                  iVar50 = iVar64;
                  for (lVar82 = 0; uVar73 * 0x20 != lVar82; lVar82 = lVar82 + 0x20) {
                    if (((-1 < iVar50) && (iVar53 = iVar50 / iVar71, iVar50 % iVar71 == 0)) &&
                       (iVar53 < iVar55)) {
                      fVar88 = *(float *)((long)pvVar70 +
                                         (long)iVar53 * 4 +
                                         (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize
                                         );
                      pfVar1 = (float *)((long)pvVar86 + lVar82);
                      auVar335 = ZEXT3264(CONCAT428(auVar335._28_4_ + fVar88,
                                                    CONCAT424(auVar335._24_4_ + fVar88 * pfVar1[6],
                                                              CONCAT420(auVar335._20_4_ +
                                                                        fVar88 * pfVar1[5],
                                                                        CONCAT416(auVar335._16_4_ +
                                                                                  fVar88 * pfVar1[4]
                                                                                  ,CONCAT412(
                                                  auVar335._12_4_ + fVar88 * pfVar1[3],
                                                  CONCAT48(auVar335._8_4_ + fVar88 * pfVar1[2],
                                                           CONCAT44(auVar335._4_4_ +
                                                                    fVar88 * pfVar1[1],
                                                                    auVar335._0_4_ +
                                                                    fVar88 * *pfVar1))))))));
                    }
                    iVar50 = iVar50 + iVar72;
                  }
                }
                pvVar86 = (void *)((long)pvVar86 + (long)(int)uVar14 * 0x20);
              }
              pvVar69 = (void *)((long)pvVar69 + (long)(int)(uVar14 * uVar16 * 8) * 4);
            }
            auVar245 = auVar335._0_32_;
            auVar254 = auVar245;
            if (5 < iVar80 - 1U) goto switchD_0028a33e_caseD_1;
            auVar217 = auVar325._0_32_;
            auVar254 = vmaxps_avx(auVar245,auVar217);
            fVar336 = auVar335._8_4_;
            fVar337 = auVar335._12_4_;
            fVar338 = auVar335._16_4_;
            fVar339 = auVar335._20_4_;
            fVar340 = auVar335._24_4_;
            fVar238 = auVar309._0_4_;
            fVar258 = auVar309._4_4_;
            fVar259 = auVar309._8_4_;
            fVar260 = auVar309._12_4_;
            fVar261 = auVar309._16_4_;
            fVar262 = auVar309._20_4_;
            fVar263 = auVar309._24_4_;
            auVar171 = auVar299._0_32_;
            fVar307 = auVar317._0_4_;
            fVar310 = auVar317._4_4_;
            fVar311 = auVar317._8_4_;
            fVar312 = auVar317._12_4_;
            fVar313 = auVar317._16_4_;
            fVar314 = auVar317._20_4_;
            fVar315 = auVar317._24_4_;
            fVar316 = auVar326._0_4_;
            fVar318 = auVar326._4_4_;
            fVar319 = auVar326._8_4_;
            fVar320 = auVar326._12_4_;
            fVar321 = auVar326._16_4_;
            fVar322 = auVar326._20_4_;
            fVar323 = auVar326._24_4_;
            fVar324 = auVar347._0_4_;
            fVar327 = auVar347._4_4_;
            fVar328 = auVar347._8_4_;
            fVar329 = auVar347._12_4_;
            fVar330 = auVar347._16_4_;
            fVar331 = auVar347._20_4_;
            fVar332 = auVar347._24_4_;
            fVar341 = auVar369._0_4_;
            fVar348 = auVar369._4_4_;
            fVar349 = auVar369._8_4_;
            fVar350 = auVar369._12_4_;
            fVar351 = auVar369._16_4_;
            fVar352 = auVar369._20_4_;
            fVar353 = auVar369._24_4_;
            auVar91 = auVar304._0_32_;
            auVar214 = auVar306._0_32_;
            fVar127 = auVar346._4_4_;
            fVar180 = auVar346._8_4_;
            fVar221 = auVar346._12_4_;
            fVar223 = auVar346._16_4_;
            fVar371 = auVar346._20_4_;
            fVar375 = auVar346._24_4_;
            fVar22 = auVar346._28_4_;
            fVar88 = auVar92._0_4_;
            fVar124 = auVar92._4_4_;
            fVar227 = auVar92._8_4_;
            fVar220 = auVar92._12_4_;
            fVar226 = auVar92._16_4_;
            fVar370 = auVar92._20_4_;
            fVar374 = auVar92._24_4_;
            fVar93 = auVar299._4_4_;
            fVar225 = auVar299._8_4_;
            fVar222 = auVar299._12_4_;
            fVar224 = auVar299._16_4_;
            fVar372 = auVar299._20_4_;
            fVar373 = auVar299._24_4_;
            fVar23 = auVar299._28_4_;
            fVar125 = auVar299._0_4_;
            fVar126 = auVar346._0_4_;
            switch(iVar80) {
            case 2:
              auVar245 = vminps_avx(auVar245,auVar217);
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              auVar252._0_4_ = fVar88 * auVar245._0_4_ + auVar254._0_4_;
              auVar252._4_4_ = fVar88 * auVar245._4_4_ + auVar254._4_4_;
              auVar252._8_4_ = fVar88 * auVar245._8_4_ + auVar254._8_4_;
              auVar252._12_4_ = fVar88 * auVar245._12_4_ + auVar254._12_4_;
              auVar252._16_4_ = fVar88 * auVar245._16_4_ + auVar254._16_4_;
              auVar252._20_4_ = fVar88 * auVar245._20_4_ + auVar254._20_4_;
              auVar252._24_4_ = fVar88 * auVar245._24_4_ + auVar254._24_4_;
              auVar252._28_4_ = auVar245._28_4_ + auVar254._28_4_;
              auVar254 = auVar252;
              break;
            case 3:
              uVar17 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
              auVar255._4_4_ = uVar17;
              auVar255._0_4_ = uVar17;
              auVar255._8_4_ = uVar17;
              auVar255._12_4_ = uVar17;
              auVar255._16_4_ = uVar17;
              auVar255._20_4_ = uVar17;
              auVar255._24_4_ = uVar17;
              auVar255._28_4_ = uVar17;
              uVar17 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar368._4_4_ = uVar17;
              auVar368._0_4_ = uVar17;
              auVar368._8_4_ = uVar17;
              auVar368._12_4_ = uVar17;
              auVar368._16_4_ = uVar17;
              auVar368._20_4_ = uVar17;
              auVar368._24_4_ = uVar17;
              auVar368._28_4_ = uVar17;
              auVar245 = vmaxps_avx(auVar245,auVar255);
              auVar254 = vminps_avx(auVar368,auVar245);
              break;
            case 4:
              auVar256._0_8_ = auVar335._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = -fVar336;
              auVar256._12_4_ = -fVar337;
              auVar256._16_4_ = -fVar338;
              auVar256._20_4_ = -fVar339;
              auVar256._24_4_ = -fVar340;
              auVar256._28_4_ = -auVar335._28_4_;
              auVar245 = vminps_avx(auVar256,auVar91);
              auVar217 = vmaxps_avx(auVar214,auVar245);
              auVar334._0_4_ = fVar238 * auVar217._0_4_ + fVar126;
              auVar334._4_4_ = fVar258 * auVar217._4_4_ + fVar127;
              auVar334._8_4_ = fVar259 * auVar217._8_4_ + fVar180;
              auVar334._12_4_ = fVar260 * auVar217._12_4_ + fVar221;
              auVar334._16_4_ = fVar261 * auVar217._16_4_ + fVar223;
              auVar334._20_4_ = fVar262 * auVar217._20_4_ + fVar371;
              auVar334._24_4_ = fVar263 * auVar217._24_4_ + fVar375;
              auVar334._28_4_ = auVar335._28_4_ + fVar22;
              auVar91 = vroundps_avx(auVar334,1);
              auVar245 = vcmpps_avx(auVar334,auVar91,1);
              auVar245 = vandps_avx(auVar245,auVar171);
              auVar245 = vsubps_avx(auVar91,auVar245);
              fVar238 = auVar245._0_4_ * -0.6931472 + auVar217._0_4_;
              fVar258 = auVar245._4_4_ * -0.6931472 + auVar217._4_4_;
              fVar259 = auVar245._8_4_ * -0.6931472 + auVar217._8_4_;
              fVar260 = auVar245._12_4_ * -0.6931472 + auVar217._12_4_;
              fVar261 = auVar245._16_4_ * -0.6931472 + auVar217._16_4_;
              fVar262 = auVar245._20_4_ * -0.6931472 + auVar217._20_4_;
              fVar263 = auVar245._24_4_ * -0.6931472 + auVar217._24_4_;
              auVar244._0_4_ = (int)auVar245._0_4_;
              auVar244._4_4_ = (int)auVar245._4_4_;
              auVar244._8_4_ = (int)auVar245._8_4_;
              auVar244._12_4_ = (int)auVar245._12_4_;
              auVar257._16_4_ = (int)auVar245._16_4_;
              auVar257._0_16_ = auVar244;
              auVar257._20_4_ = (int)auVar245._20_4_;
              auVar257._24_4_ = (int)auVar245._24_4_;
              auVar257._28_4_ = (int)auVar245._28_4_;
              auVar264 = vpslld_avx(auVar244,0x17);
              auVar181 = vpslld_avx(auVar257._16_16_,0x17);
              auVar141._8_4_ = 0x3f800000;
              auVar141._0_8_ = 0x3f8000003f800000;
              auVar141._12_4_ = 0x3f800000;
              auVar181 = vpaddd_avx(auVar181,auVar141);
              auVar264 = vpaddd_avx(auVar264,auVar141);
              auVar122._0_4_ =
                   (fVar238 + fVar125 +
                   fVar238 * fVar238 *
                   ((fVar341 +
                    ((fVar324 + (fVar316 + fVar307 * fVar238) * fVar238) * fVar238 + fVar88) *
                    fVar238) * fVar238 + fVar126)) * auVar264._0_4_ + fVar125;
              auVar122._4_4_ =
                   (fVar258 + fVar93 +
                   fVar258 * fVar258 *
                   ((fVar348 +
                    ((fVar327 + (fVar318 + fVar310 * fVar258) * fVar258) * fVar258 + fVar124) *
                    fVar258) * fVar258 + fVar127)) * auVar264._4_4_ + fVar93;
              auVar122._8_4_ =
                   (fVar259 + fVar225 +
                   fVar259 * fVar259 *
                   ((fVar349 +
                    ((fVar328 + (fVar319 + fVar311 * fVar259) * fVar259) * fVar259 + fVar227) *
                    fVar259) * fVar259 + fVar180)) * auVar264._8_4_ + fVar225;
              auVar122._12_4_ =
                   (fVar260 + fVar222 +
                   fVar260 * fVar260 *
                   ((fVar350 +
                    ((fVar329 + (fVar320 + fVar312 * fVar260) * fVar260) * fVar260 + fVar220) *
                    fVar260) * fVar260 + fVar221)) * auVar264._12_4_ + fVar222;
              auVar122._16_4_ =
                   (fVar261 + fVar224 +
                   fVar261 * fVar261 *
                   ((fVar351 +
                    ((fVar330 + (fVar321 + fVar313 * fVar261) * fVar261) * fVar261 + fVar226) *
                    fVar261) * fVar261 + fVar223)) * auVar181._0_4_ + fVar224;
              auVar122._20_4_ =
                   (fVar262 + fVar372 +
                   fVar262 * fVar262 *
                   ((fVar352 +
                    ((fVar331 + (fVar322 + fVar314 * fVar262) * fVar262) * fVar262 + fVar370) *
                    fVar262) * fVar262 + fVar371)) * auVar181._4_4_ + fVar372;
              auVar122._24_4_ =
                   (fVar263 + fVar373 +
                   fVar263 * fVar263 *
                   ((fVar353 +
                    ((fVar332 + (fVar323 + fVar315 * fVar263) * fVar263) * fVar263 + fVar374) *
                    fVar263) * fVar263 + fVar375)) * auVar181._8_4_ + fVar373;
              auVar122._28_4_ =
                   auVar91._28_4_ + auVar217._28_4_ + fVar23 +
                   auVar369._28_4_ + auVar347._28_4_ + auVar326._28_4_ + -0.6931472 + auVar92._28_4_
                   + fVar22 + fVar23;
              auVar245 = vrcpps_avx(auVar122);
              fVar88 = auVar245._0_4_;
              fVar125 = auVar245._4_4_;
              auVar44._4_4_ = auVar122._4_4_ * fVar125;
              auVar44._0_4_ = auVar122._0_4_ * fVar88;
              fVar126 = auVar245._8_4_;
              auVar44._8_4_ = auVar122._8_4_ * fVar126;
              fVar93 = auVar245._12_4_;
              auVar44._12_4_ = auVar122._12_4_ * fVar93;
              fVar124 = auVar245._16_4_;
              auVar44._16_4_ = auVar122._16_4_ * fVar124;
              fVar127 = auVar245._20_4_;
              auVar44._20_4_ = auVar122._20_4_ * fVar127;
              fVar225 = auVar245._24_4_;
              auVar44._24_4_ = auVar122._24_4_ * fVar225;
              auVar44._28_4_ = auVar122._28_4_;
              auVar217 = vsubps_avx(auVar171,auVar44);
              auVar254._0_4_ = fVar88 + fVar88 * auVar217._0_4_;
              auVar254._4_4_ = fVar125 + fVar125 * auVar217._4_4_;
              auVar254._8_4_ = fVar126 + fVar126 * auVar217._8_4_;
              auVar254._12_4_ = fVar93 + fVar93 * auVar217._12_4_;
              auVar254._16_4_ = fVar124 + fVar124 * auVar217._16_4_;
              auVar254._20_4_ = fVar127 + fVar127 * auVar217._20_4_;
              auVar254._24_4_ = fVar225 + fVar225 * auVar217._24_4_;
              auVar254._28_4_ = auVar245._28_4_ + auVar217._28_4_;
              break;
            case 5:
              auVar245 = vminps_avx(auVar245,auVar91);
              auVar217 = vmaxps_avx(auVar214,auVar245);
              auVar253._0_4_ = fVar238 * auVar217._0_4_ + fVar126;
              auVar253._4_4_ = fVar258 * auVar217._4_4_ + fVar127;
              auVar253._8_4_ = fVar259 * auVar217._8_4_ + fVar180;
              auVar253._12_4_ = fVar260 * auVar217._12_4_ + fVar221;
              auVar253._16_4_ = fVar261 * auVar217._16_4_ + fVar223;
              auVar253._20_4_ = fVar262 * auVar217._20_4_ + fVar371;
              auVar253._24_4_ = fVar263 * auVar217._24_4_ + fVar375;
              auVar253._28_4_ = auVar254._28_4_ + fVar22;
              auVar31 = vroundps_avx(auVar253,1);
              auVar245 = vcmpps_avx(auVar253,auVar31,1);
              auVar245 = vandps_avx(auVar245,auVar171);
              auVar245 = vsubps_avx(auVar31,auVar245);
              auVar40._4_4_ = auVar245._4_4_ * 0.6931472;
              auVar40._0_4_ = auVar245._0_4_ * 0.6931472;
              auVar40._8_4_ = auVar245._8_4_ * 0.6931472;
              auVar40._12_4_ = auVar245._12_4_ * 0.6931472;
              auVar40._16_4_ = auVar245._16_4_ * 0.6931472;
              auVar40._20_4_ = auVar245._20_4_ * 0.6931472;
              auVar40._24_4_ = auVar245._24_4_ * 0.6931472;
              auVar40._28_4_ = auVar31._28_4_;
              auVar217 = vsubps_avx(auVar217,auVar40);
              fVar24 = auVar217._0_4_;
              fVar25 = auVar217._4_4_;
              fVar26 = auVar217._8_4_;
              fVar27 = auVar217._12_4_;
              fVar28 = auVar217._16_4_;
              fVar29 = auVar217._20_4_;
              fVar30 = auVar217._24_4_;
              auVar139._0_4_ = (int)auVar245._0_4_;
              auVar139._4_4_ = (int)auVar245._4_4_;
              auVar139._8_4_ = (int)auVar245._8_4_;
              auVar139._12_4_ = (int)auVar245._12_4_;
              auVar176._16_4_ = (int)auVar245._16_4_;
              auVar176._0_16_ = auVar139;
              auVar176._20_4_ = (int)auVar245._20_4_;
              auVar176._24_4_ = (int)auVar245._24_4_;
              auVar176._28_4_ = (int)auVar245._28_4_;
              auVar264 = vpslld_avx(auVar139,0x17);
              auVar181 = vpslld_avx(auVar176._16_16_,0x17);
              auVar191._8_4_ = 0x3f800000;
              auVar191._0_8_ = 0x3f8000003f800000;
              auVar191._12_4_ = 0x3f800000;
              auVar181 = vpaddd_avx(auVar181,auVar191);
              auVar264 = vpaddd_avx(auVar264,auVar191);
              local_88._0_4_ =
                   (fVar24 + fVar125 +
                   fVar24 * fVar24 *
                   ((fVar341 +
                    ((fVar324 + (fVar316 + fVar307 * fVar24) * fVar24) * fVar24 + fVar88) * fVar24)
                    * fVar24 + fVar126)) * auVar264._0_4_ + fVar125;
              local_88._4_4_ =
                   (fVar25 + fVar93 +
                   fVar25 * fVar25 *
                   ((fVar348 +
                    ((fVar327 + (fVar318 + fVar310 * fVar25) * fVar25) * fVar25 + fVar124) * fVar25)
                    * fVar25 + fVar127)) * auVar264._4_4_ + fVar93;
              local_88._8_4_ =
                   (fVar26 + fVar225 +
                   fVar26 * fVar26 *
                   ((fVar349 +
                    ((fVar328 + (fVar319 + fVar311 * fVar26) * fVar26) * fVar26 + fVar227) * fVar26)
                    * fVar26 + fVar180)) * auVar264._8_4_ + fVar225;
              local_88._12_4_ =
                   (fVar27 + fVar222 +
                   fVar27 * fVar27 *
                   ((fVar350 +
                    ((fVar329 + (fVar320 + fVar312 * fVar27) * fVar27) * fVar27 + fVar220) * fVar27)
                    * fVar27 + fVar221)) * auVar264._12_4_ + fVar222;
              local_88._16_4_ =
                   (fVar28 + fVar224 +
                   fVar28 * fVar28 *
                   ((fVar351 +
                    ((fVar330 + (fVar321 + fVar313 * fVar28) * fVar28) * fVar28 + fVar226) * fVar28)
                    * fVar28 + fVar223)) * auVar181._0_4_ + fVar224;
              local_88._20_4_ =
                   (fVar29 + fVar372 +
                   fVar29 * fVar29 *
                   ((fVar352 +
                    ((fVar331 + (fVar322 + fVar314 * fVar29) * fVar29) * fVar29 + fVar370) * fVar29)
                    * fVar29 + fVar371)) * auVar181._4_4_ + fVar372;
              local_88._24_4_ =
                   (fVar30 + fVar373 +
                   fVar30 * fVar30 *
                   ((fVar353 +
                    ((fVar332 + (fVar323 + fVar315 * fVar30) * fVar30) * fVar30 + fVar374) * fVar30)
                    * fVar30 + fVar375)) * auVar181._8_4_ + fVar373;
              local_88._28_4_ =
                   auVar217._28_4_ + fVar23 +
                   auVar369._28_4_ + auVar347._28_4_ + auVar326._28_4_ + 0.6931472 + auVar92._28_4_
                   + fVar22 + fVar23;
              auVar119._8_4_ = 0x800000;
              auVar119._0_8_ = 0x80000000800000;
              auVar119._12_4_ = 0x800000;
              auVar119._16_4_ = 0x800000;
              auVar119._20_4_ = 0x800000;
              auVar119._24_4_ = 0x800000;
              auVar119._28_4_ = 0x800000;
              auVar171 = vmaxps_avx(local_88,auVar119);
              auVar181 = vpsrld_avx(auVar171._16_16_,0x17);
              auVar218._8_4_ = 0x807fffff;
              auVar218._0_8_ = 0x807fffff807fffff;
              auVar218._12_4_ = 0x807fffff;
              auVar218._16_4_ = 0x807fffff;
              auVar218._20_4_ = 0x807fffff;
              auVar218._24_4_ = 0x807fffff;
              auVar218._28_4_ = 0x807fffff;
              auVar245 = vandps_avx(auVar171,auVar218);
              auVar31 = vorps_avx(auVar245,auVar346._0_32_);
              auVar219._8_4_ = 0x3f3504f3;
              auVar219._0_8_ = 0x3f3504f33f3504f3;
              auVar219._12_4_ = 0x3f3504f3;
              auVar219._16_4_ = 0x3f3504f3;
              auVar219._20_4_ = 0x3f3504f3;
              auVar219._24_4_ = 0x3f3504f3;
              auVar219._28_4_ = 0x3f3504f3;
              auVar217 = vcmpps_avx(auVar219,auVar31,2);
              auVar245 = vandnps_avx(auVar217,auVar31);
              fVar125 = auVar31._0_4_ + -1.0 + auVar245._0_4_;
              fVar93 = auVar31._4_4_ + -1.0 + auVar245._4_4_;
              fVar225 = auVar31._8_4_ + -1.0 + auVar245._8_4_;
              fVar222 = auVar31._12_4_ + -1.0 + auVar245._12_4_;
              fVar224 = auVar31._16_4_ + -1.0 + auVar245._16_4_;
              fVar372 = auVar31._20_4_ + -1.0 + auVar245._20_4_;
              fVar373 = auVar31._24_4_ + -1.0 + auVar245._24_4_;
              auVar181 = vpsubd_avx(auVar181,auVar217._16_16_);
              auVar304 = ZEXT3264(auVar91);
              auVar306 = ZEXT3264(auVar214);
              auVar309 = ZEXT3264(auVar309._0_32_);
              auVar317 = ZEXT3264(auVar317._0_32_);
              auVar326 = ZEXT3264(auVar326._0_32_);
              auVar347 = ZEXT3264(auVar347._0_32_);
              auVar92 = ZEXT3264(auVar92._0_32_);
              auVar346 = ZEXT3264(auVar346._0_32_);
              auVar369 = ZEXT3264(auVar369._0_32_);
              auVar237._8_4_ = 0x3f800000;
              auVar237._0_8_ = 0x3f8000003f800000;
              auVar237._12_4_ = 0x3f800000;
              auVar237._16_4_ = 0x3f800000;
              auVar237._20_4_ = 0x3f800000;
              auVar237._24_4_ = 0x3f800000;
              auVar237._28_4_ = 0x3f800000;
              auVar299 = ZEXT3264(auVar237);
              auVar264 = vpsrld_avx(auVar171._0_16_,0x17);
              auVar242._8_4_ = 0xffffff81;
              auVar242._0_8_ = 0xffffff81ffffff81;
              auVar242._12_4_ = 0xffffff81;
              auVar181 = vpaddd_avx(auVar181,auVar242);
              auVar264 = vpsubd_avx(auVar264,auVar217._0_16_);
              auVar264 = vpaddd_avx(auVar264,auVar242);
              auVar120._16_16_ = auVar181;
              auVar120._0_16_ = auVar264;
              auVar217 = vcmpps_avx(local_88,_DAT_004c75a0,2);
              auVar171 = vcvtdq2ps_avx(auVar120);
              auVar41._4_4_ =
                   (fVar93 + auVar171._4_4_ * 0.6931472 +
                   fVar93 * fVar93 *
                   (fVar93 * (fVar93 * (fVar93 * (fVar93 * (fVar93 * (fVar93 * (fVar93 * (fVar93 * (
                                                  fVar93 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                                 0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                   -2.0;
              auVar41._0_4_ =
                   (fVar125 + auVar171._0_4_ * 0.6931472 +
                   fVar125 * fVar125 *
                   (fVar125 * (fVar125 * (fVar125 * (fVar125 * (fVar125 * (fVar125 * (fVar125 * (
                                                  fVar125 * (fVar125 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar41._8_4_ =
                   (fVar225 + auVar171._8_4_ * 0.6931472 +
                   fVar225 * fVar225 *
                   (fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * (
                                                  fVar225 * (fVar225 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar41._12_4_ =
                   (fVar222 + auVar171._12_4_ * 0.6931472 +
                   fVar222 * fVar222 *
                   (fVar222 * (fVar222 * (fVar222 * (fVar222 * (fVar222 * (fVar222 * (fVar222 * (
                                                  fVar222 * (fVar222 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar41._16_4_ =
                   (fVar224 + auVar171._16_4_ * 0.6931472 +
                   fVar224 * fVar224 *
                   (fVar224 * (fVar224 * (fVar224 * (fVar224 * (fVar224 * (fVar224 * (fVar224 * (
                                                  fVar224 * (fVar224 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar41._20_4_ =
                   (fVar372 + auVar171._20_4_ * 0.6931472 +
                   fVar372 * fVar372 *
                   (fVar372 * (fVar372 * (fVar372 * (fVar372 * (fVar372 * (fVar372 * (fVar372 * (
                                                  fVar372 * (fVar372 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar41._24_4_ =
                   (fVar373 + auVar171._24_4_ * 0.6931472 +
                   fVar373 * fVar373 *
                   (fVar373 * (fVar373 * (fVar373 * (fVar373 * (fVar373 * (fVar373 * (fVar373 * (
                                                  fVar373 * (fVar373 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                              0.3333333) + -0.5)) * -2.0;
              auVar41._28_4_ = auVar31._28_4_ + -1.0 + auVar245._28_4_ + auVar171._28_4_ + 0.0;
              auVar177._8_4_ = 0x7fffffff;
              auVar177._0_8_ = 0x7fffffff7fffffff;
              auVar177._12_4_ = 0x7fffffff;
              auVar177._16_4_ = 0x7fffffff;
              auVar177._20_4_ = 0x7fffffff;
              auVar177._24_4_ = 0x7fffffff;
              auVar177._28_4_ = 0x7fffffff;
              auVar245 = vblendvps_avx(auVar41,auVar177,auVar217);
              auVar245 = vminps_avx(auVar245,auVar91);
              auVar217 = vmaxps_avx(auVar214,auVar245);
              auVar178._0_4_ = fVar238 * auVar217._0_4_ + fVar126;
              auVar178._4_4_ = fVar258 * auVar217._4_4_ + fVar127;
              auVar178._8_4_ = fVar259 * auVar217._8_4_ + fVar180;
              auVar178._12_4_ = fVar260 * auVar217._12_4_ + fVar221;
              auVar178._16_4_ = fVar261 * auVar217._16_4_ + fVar223;
              auVar178._20_4_ = fVar262 * auVar217._20_4_ + fVar371;
              auVar178._24_4_ = fVar263 * auVar217._24_4_ + fVar375;
              auVar178._28_4_ = fVar22 + NAN;
              auVar171 = vroundps_avx(auVar178,1);
              auVar245 = vcmpps_avx(auVar178,auVar171,1);
              auVar245 = vandps_avx(auVar245,auVar237);
              auVar245 = vsubps_avx(auVar171,auVar245);
              auVar42._4_4_ = auVar245._4_4_ * 0.6931472;
              auVar42._0_4_ = auVar245._0_4_ * 0.6931472;
              auVar42._8_4_ = auVar245._8_4_ * 0.6931472;
              auVar42._12_4_ = auVar245._12_4_ * 0.6931472;
              auVar42._16_4_ = auVar245._16_4_ * 0.6931472;
              auVar42._20_4_ = auVar245._20_4_ * 0.6931472;
              auVar42._24_4_ = auVar245._24_4_ * 0.6931472;
              auVar42._28_4_ = auVar171._28_4_;
              auVar217 = vsubps_avx(auVar217,auVar42);
              fVar125 = auVar217._0_4_;
              fVar93 = auVar217._4_4_;
              fVar225 = auVar217._8_4_;
              fVar222 = auVar217._12_4_;
              fVar224 = auVar217._16_4_;
              fVar372 = auVar217._20_4_;
              fVar373 = auVar217._24_4_;
              auVar140._0_4_ = (int)auVar245._0_4_;
              auVar140._4_4_ = (int)auVar245._4_4_;
              auVar140._8_4_ = (int)auVar245._8_4_;
              auVar140._12_4_ = (int)auVar245._12_4_;
              auVar179._16_4_ = (int)auVar245._16_4_;
              auVar179._0_16_ = auVar140;
              auVar179._20_4_ = (int)auVar245._20_4_;
              auVar179._24_4_ = (int)auVar245._24_4_;
              auVar179._28_4_ = (int)auVar245._28_4_;
              auVar264 = vpslld_avx(auVar140,0x17);
              auVar181 = vpslld_avx(auVar179._16_16_,0x17);
              auVar243._8_4_ = 0x3f800000;
              auVar243._0_8_ = 0x3f8000003f800000;
              auVar243._12_4_ = 0x3f800000;
              auVar181 = vpaddd_avx(auVar181,auVar243);
              auVar264 = vpaddd_avx(auVar264,auVar243);
              auVar121._0_4_ =
                   (fVar125 + 1.0 +
                   fVar125 * fVar125 *
                   ((fVar341 +
                    ((fVar324 + (fVar316 + fVar307 * fVar125) * fVar125) * fVar125 + fVar88) *
                    fVar125) * fVar125 + fVar126)) * auVar264._0_4_ + 1.0;
              auVar121._4_4_ =
                   (fVar93 + 1.0 +
                   fVar93 * fVar93 *
                   ((fVar348 +
                    ((fVar327 + (fVar318 + fVar310 * fVar93) * fVar93) * fVar93 + fVar124) * fVar93)
                    * fVar93 + fVar127)) * auVar264._4_4_ + 1.0;
              auVar121._8_4_ =
                   (fVar225 + 1.0 +
                   fVar225 * fVar225 *
                   ((fVar349 +
                    ((fVar328 + (fVar319 + fVar311 * fVar225) * fVar225) * fVar225 + fVar227) *
                    fVar225) * fVar225 + fVar180)) * auVar264._8_4_ + 1.0;
              auVar121._12_4_ =
                   (fVar222 + 1.0 +
                   fVar222 * fVar222 *
                   ((fVar350 +
                    ((fVar329 + (fVar320 + fVar312 * fVar222) * fVar222) * fVar222 + fVar220) *
                    fVar222) * fVar222 + fVar221)) * auVar264._12_4_ + 1.0;
              auVar121._16_4_ =
                   (fVar224 + 1.0 +
                   fVar224 * fVar224 *
                   ((fVar351 +
                    ((fVar330 + (fVar321 + fVar313 * fVar224) * fVar224) * fVar224 + fVar226) *
                    fVar224) * fVar224 + fVar223)) * auVar181._0_4_ + 1.0;
              auVar121._20_4_ =
                   (fVar372 + 1.0 +
                   fVar372 * fVar372 *
                   ((fVar352 +
                    ((fVar331 + (fVar322 + fVar314 * fVar372) * fVar372) * fVar372 + fVar370) *
                    fVar372) * fVar372 + fVar371)) * auVar181._4_4_ + 1.0;
              auVar121._24_4_ =
                   (fVar373 + 1.0 +
                   fVar373 * fVar373 *
                   ((fVar353 +
                    ((fVar332 + (fVar323 + fVar315 * fVar373) * fVar373) * fVar373 + fVar374) *
                    fVar373) * fVar373 + fVar375)) * auVar181._8_4_ + 1.0;
              auVar121._28_4_ = auVar217._28_4_ + 1.0 + auVar171._28_4_ + 1.0;
              auVar245 = vrcpps_avx(auVar121);
              fVar88 = auVar245._0_4_;
              fVar125 = auVar245._4_4_;
              fVar126 = auVar245._8_4_;
              fVar93 = auVar245._12_4_;
              fVar124 = auVar245._16_4_;
              fVar127 = auVar245._20_4_;
              fVar225 = auVar245._24_4_;
              auVar43._4_4_ = auVar121._4_4_ * (fVar125 + fVar125);
              auVar43._0_4_ = auVar121._0_4_ * (fVar88 + fVar88);
              auVar43._8_4_ = auVar121._8_4_ * (fVar126 + fVar126);
              auVar43._12_4_ = auVar121._12_4_ * (fVar93 + fVar93);
              auVar43._16_4_ = auVar121._16_4_ * (fVar124 + fVar124);
              auVar43._20_4_ = auVar121._20_4_ * (fVar127 + fVar127);
              auVar43._24_4_ = auVar121._24_4_ * (fVar225 + fVar225);
              auVar43._28_4_ = auVar121._28_4_;
              auVar254._8_4_ = 2.0;
              auVar254._0_8_ = 0x4000000040000000;
              auVar254._12_4_ = 2.0;
              auVar254._16_4_ = 2.0;
              auVar254._20_4_ = 2.0;
              auVar254._24_4_ = 2.0;
              auVar254._28_4_ = 2.0;
              auVar245 = vsubps_avx(auVar254,auVar43);
              auVar325 = ZEXT464(0) << 0x20;
              auVar112._0_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar245._0_4_;
              auVar112._4_4_ = fVar125 + fVar125 + -1.0 + fVar125 * auVar245._4_4_;
              auVar112._8_4_ = fVar126 + fVar126 + -1.0 + fVar126 * auVar245._8_4_;
              auVar112._12_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar245._12_4_;
              auVar112._16_4_ = fVar124 + fVar124 + -1.0 + fVar124 * auVar245._16_4_;
              auVar112._20_4_ = fVar127 + fVar127 + -1.0 + fVar127 * auVar245._20_4_;
              auVar112._24_4_ = fVar225 + fVar225 + -1.0 + fVar225 * auVar245._24_4_;
              goto LAB_0028a7b0;
            case 6:
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              fVar125 = (*(float **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar123._0_4_ = auVar335._0_4_ * fVar88 + fVar125;
              auVar123._4_4_ = auVar335._4_4_ * fVar88 + fVar125;
              auVar123._8_4_ = fVar336 * fVar88 + fVar125;
              auVar123._12_4_ = fVar337 * fVar88 + fVar125;
              auVar123._16_4_ = fVar338 * fVar88 + fVar125;
              auVar123._20_4_ = fVar339 * fVar88 + fVar125;
              auVar123._24_4_ = fVar340 * fVar88 + fVar125;
              auVar123._28_4_ = fVar88 + fVar125;
              auVar245 = vmaxps_avx(auVar123,auVar217);
              auVar245 = vminps_avx(auVar245,auVar171);
              auVar112 = auVar245._0_28_;
LAB_0028a7b0:
              auVar47._4_4_ = auVar335._4_4_ * auVar112._4_4_;
              auVar47._0_4_ = auVar335._0_4_ * auVar112._0_4_;
              auVar47._8_4_ = fVar336 * auVar112._8_4_;
              auVar47._12_4_ = fVar337 * auVar112._12_4_;
              auVar47._16_4_ = fVar338 * auVar112._16_4_;
              auVar47._20_4_ = fVar339 * auVar112._20_4_;
              auVar47._24_4_ = fVar340 * auVar112._24_4_;
              auVar47._28_4_ = auVar254._28_4_;
              auVar254 = auVar47;
            }
switchD_0028a33e_caseD_1:
            *(undefined1 (*) [32])local_1a0 = auVar254;
            local_1a0 = local_1a0 + 4;
            iVar64 = iVar64 + 1;
          }
          uVar87 = (ulong)(uVar74 + 1);
        }
      }
    }
    if ((iVar75 == 8) && (uVar61 == 1)) {
      p_Var56 = local_90[-3];
      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
      iVar72 = *(int *)(&this->field_0xdc + (long)p_Var56);
      uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var56);
      local_50 = local_d8.elemsize * local_d8.cstep;
      uVar85 = 0;
      uVar73 = 0;
      if (0 < (int)uVar14) {
        uVar73 = (ulong)uVar14;
      }
      uVar84 = 0;
      if (0 < (int)uVar16) {
        uVar84 = (ulong)uVar16;
      }
      uVar66 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar66 = uVar85;
      }
      uVar68 = local_d8.w;
      if (local_d8.w < 1) {
        uVar68 = 0;
      }
      uVar49 = local_d8.h;
      if (local_d8.h < 1) {
        uVar49 = 0;
      }
      local_48 = (ulong)(uint)local_d8.c;
      if (local_d8.c < 1) {
        local_48 = uVar85;
      }
      iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var56);
      iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
      local_88._0_4_ = *(undefined4 *)(&this->field_0xe8 + (long)p_Var56);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
      local_58 = (Allocator *)local_d8.data;
      iVar78 = bottom_blob->w;
      iVar80 = bottom_blob->h;
      for (; uVar85 != local_48; uVar85 = uVar85 + 1) {
        local_1a0 = (_func_int ***)((long)&local_58->_vptr_Allocator + local_50 * uVar85);
        for (uVar74 = 0; uVar74 != uVar49; uVar74 = uVar74 + 1) {
          pfVar1 = *(float **)(&this->field_0x118 + (long)p_Var56);
          sVar19 = (this->weight_data_tm).cstep;
          sVar20 = (this->weight_data_tm).elemsize;
          pvVar69 = (this->weight_data_tm).data;
          iVar55 = (1 - uVar14) * iVar72;
          for (uVar52 = 0; uVar52 != uVar68; uVar52 = uVar52 + 1) {
            if (lVar59 == 0) {
              fVar88 = 0.0;
            }
            else {
              fVar88 = *(float *)(lVar59 + uVar85 * 4);
            }
            fVar125 = 0.0;
            fVar126 = 0.0;
            fVar93 = 0.0;
            fVar124 = 0.0;
            fVar127 = 0.0;
            fVar225 = 0.0;
            fVar227 = 0.0;
            fVar180 = 0.0;
            pvVar86 = (void *)(sVar19 * uVar85 * sVar20 + (long)pvVar69);
            for (uVar58 = 0; uVar58 != uVar66; uVar58 = uVar58 + 1) {
              pvVar70 = pvVar86;
              for (uVar87 = 0; uVar87 != uVar84; uVar87 = uVar87 + 1) {
                iVar54 = (((int)uVar87 - uVar16) + 1) * iVar13 + uVar74;
                if (-1 < iVar54) {
                  if ((iVar54 % (int)local_88._0_4_ == 0) && (iVar54 / (int)local_88._0_4_ < iVar80)
                     ) {
                    iVar64 = iVar55;
                    for (lVar82 = 0; uVar73 * 0x20 != lVar82; lVar82 = lVar82 + 0x20) {
                      if (((-1 < iVar64) && (iVar50 = iVar64 / iVar71, iVar64 % iVar71 == 0)) &&
                         (iVar50 < iVar78)) {
                        pfVar2 = (float *)((long)pvVar70 + lVar82);
                        pfVar3 = (float *)((long)bottom_blob->data +
                                          (long)(iVar50 << 3) * 4 +
                                          (long)(iVar54 / (int)local_88._0_4_) *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar58);
                        fVar93 = *pfVar2 * *pfVar3 + fVar93;
                        fVar124 = pfVar2[1] * pfVar3[1] + fVar124;
                        fVar125 = pfVar2[2] * pfVar3[2] + fVar125;
                        fVar126 = pfVar2[3] * pfVar3[3] + fVar126;
                        fVar127 = pfVar2[4] * pfVar3[4] + fVar127;
                        fVar225 = pfVar2[5] * pfVar3[5] + fVar225;
                        fVar227 = pfVar2[6] * pfVar3[6] + fVar227;
                        fVar180 = pfVar2[7] + fVar180;
                      }
                      iVar64 = iVar64 + iVar72;
                    }
                  }
                }
                pvVar70 = (void *)((long)pvVar70 + (long)(int)uVar14 * 0x20);
              }
              pvVar86 = (void *)((long)pvVar86 + (long)(int)(uVar14 * uVar16 * 8) * 4);
            }
            auVar99._0_4_ = fVar127 + fVar93;
            auVar99._4_4_ = fVar225 + fVar124;
            auVar99._8_4_ = fVar227 + fVar125;
            auVar99._12_4_ = fVar180 + fVar126;
            auVar181 = vshufpd_avx(auVar99,auVar99,1);
            auVar100._0_4_ = auVar181._0_4_ + auVar99._0_4_;
            auVar100._4_4_ = auVar181._4_4_ + auVar99._4_4_;
            auVar100._8_4_ = auVar181._8_4_ + auVar99._8_4_;
            auVar100._12_4_ = auVar181._12_4_ + auVar99._12_4_;
            auVar181 = vmovshdup_avx(auVar100);
            fVar88 = auVar181._0_4_ + fVar88 + auVar100._0_4_;
            auVar181 = ZEXT416((uint)fVar88);
            fVar125 = fVar88;
            switch(uVar17) {
            case 1:
              auVar181 = vmaxss_avx(ZEXT416((uint)fVar88),ZEXT416(0));
              fVar125 = auVar181._0_4_;
              break;
            case 2:
              auVar89._0_12_ = ZEXT812(0);
              auVar89._12_4_ = 0;
              auVar181 = vcmpss_avx(auVar89,auVar181,1);
              auVar143._8_4_ = 0x3f800000;
              auVar143._0_8_ = 0x3f8000003f800000;
              auVar143._12_4_ = 0x3f800000;
              auVar181 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar143,auVar181);
              fVar125 = auVar181._0_4_;
LAB_0028ac35:
              fVar125 = fVar125 * fVar88;
              break;
            case 3:
              auVar181 = vmaxss_avx(auVar181,ZEXT416((uint)*pfVar1));
              fVar125 = auVar181._0_4_;
              if (pfVar1[1] < auVar181._0_4_) {
                fVar125 = pfVar1[1];
              }
              break;
            case 4:
              auVar181 = vminss_avx(auVar181,ZEXT416(0x42b0c0a5));
              auVar101._0_8_ = auVar181._0_8_ ^ 0x8000000080000000;
              auVar101._8_4_ = auVar181._8_4_ ^ 0x80000000;
              auVar101._12_4_ = auVar181._12_4_ ^ 0x80000000;
              auVar181 = vcmpss_avx(auVar181,ZEXT416(0xc2b0c0a5),1);
              auVar142._8_4_ = 0x42b0c0a5;
              auVar142._0_8_ = 0x42b0c0a542b0c0a5;
              auVar142._12_4_ = 0x42b0c0a5;
              auVar181 = vblendvps_avx(auVar101,auVar142,auVar181);
              fVar88 = expf(auVar181._0_4_);
              fVar125 = 1.0 / (fVar88 + 1.0);
              break;
            case 5:
              fVar125 = expf(fVar88);
              fVar125 = logf(fVar125 + 1.0);
              fVar125 = tanhf(fVar125);
              fVar125 = fVar125 * fVar88;
              break;
            case 6:
              fVar126 = *pfVar1;
              fVar93 = -pfVar1[1] / fVar126;
              fVar125 = 0.0;
              if ((fVar93 <= fVar88) && (fVar125 = fVar88, fVar88 <= fVar93 + 1.0 / fVar126)) {
                fVar125 = fVar126 * fVar88 + pfVar1[1];
                goto LAB_0028ac35;
              }
            }
            *(float *)local_1a0 = fVar125;
            local_1a0 = (_func_int ***)((long)local_1a0 + 4);
            iVar55 = iVar55 + 1;
          }
        }
      }
    }
    if ((iVar75 == 4) && (uVar61 == 4)) {
      p_Var56 = local_90[-3];
      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
      iVar72 = *(int *)(&this->field_0xdc + (long)p_Var56);
      iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var56);
      iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
      iVar78 = *(int *)(&this->field_0xe8 + (long)p_Var56);
      iVar80 = *(int *)(&this->field_0x114 + (long)p_Var56);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
      uVar85 = 0;
      uVar73 = 0;
      if (0 < (int)uVar14) {
        uVar73 = (ulong)uVar14;
      }
      uVar84 = 0;
      if (0 < (int)uVar16) {
        uVar84 = (ulong)uVar16;
      }
      uVar66 = (ulong)(uint)local_d8.c;
      if (local_d8.c < 1) {
        uVar66 = uVar85;
      }
      auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar346 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar325 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      for (; uVar85 != uVar66; uVar85 = uVar85 + 1) {
        local_1a0 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar85 * local_d8.elemsize);
        iVar55 = bottom_blob->w;
        iVar54 = bottom_blob->h;
        uVar87 = 0;
        uVar58 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar58 = uVar87;
        }
        uVar68 = local_d8.w;
        if (local_d8.w < 1) {
          uVar68 = 0;
        }
        uVar49 = local_d8.h;
        if (local_d8.h < 1) {
          uVar49 = 0;
        }
        while (uVar74 = (uint)uVar87, uVar74 != uVar49) {
          iVar64 = (1 - uVar14) * iVar72;
          for (uVar52 = 0; uVar52 != uVar68; uVar52 = uVar52 + 1) {
            if (lVar59 == 0) {
              auVar181 = ZEXT816(0) << 0x40;
            }
            else {
              auVar181 = *(undefined1 (*) [16])(lVar59 + uVar85 * 0x10);
            }
            auVar299 = ZEXT1664(auVar181);
            lVar82 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar85 * (this->weight_data_tm).elemsize + 0x30;
            for (uVar87 = 0; uVar87 != uVar58; uVar87 = uVar87 + 1) {
              pvVar69 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar87 +
                                (long)bottom_blob->data);
              local_88._0_8_ = pvVar69;
              lVar83 = lVar82;
              for (uVar79 = 0; uVar79 != uVar84; uVar79 = uVar79 + 1) {
                iVar50 = (((int)uVar79 - uVar16) + 1) * iVar13 + uVar74;
                if (((-1 < iVar50) && (iVar51 = iVar50 / iVar78, iVar50 % iVar78 == 0)) &&
                   (iVar51 < iVar54)) {
                  lVar81 = (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize;
                  iVar50 = iVar64;
                  for (lVar76 = 0; uVar73 * 0x40 != lVar76; lVar76 = lVar76 + 0x40) {
                    if (((-1 < iVar50) && (iVar51 = iVar50 / iVar71, iVar50 % iVar71 == 0)) &&
                       (iVar51 < iVar55)) {
                      lVar57 = (long)(iVar51 << 2);
                      fVar88 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81);
                      fVar125 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 4);
                      fVar126 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 8);
                      fVar93 = *(float *)((long)pvVar69 + lVar57 * 4 + lVar81 + 0xc);
                      pfVar1 = (float *)(lVar83 + -0x30 + lVar76);
                      pfVar2 = (float *)(lVar83 + -0x20 + lVar76);
                      pfVar3 = (float *)(lVar83 + -0x10 + lVar76);
                      pfVar4 = (float *)(lVar83 + lVar76);
                      auVar299 = ZEXT1664(CONCAT412(fVar88 * pfVar1[3] + auVar299._12_4_ +
                                                    fVar125 * pfVar2[3] + fVar126 * pfVar3[3] +
                                                    fVar93 * pfVar4[3],
                                                    CONCAT48(fVar88 * pfVar1[2] + auVar299._8_4_ +
                                                             fVar125 * pfVar2[2] +
                                                             fVar126 * pfVar3[2] +
                                                             fVar93 * pfVar4[2],
                                                             CONCAT44(fVar88 * pfVar1[1] +
                                                                      auVar299._4_4_ +
                                                                      fVar125 * pfVar2[1] +
                                                                      fVar126 * pfVar3[1] +
                                                                      fVar93 * pfVar4[1],
                                                                      fVar88 * *pfVar1 +
                                                                      auVar299._0_4_ +
                                                                      fVar125 * *pfVar2 +
                                                                      fVar126 * *pfVar3 +
                                                                      fVar93 * *pfVar4))));
                    }
                    iVar50 = iVar50 + iVar72;
                  }
                }
                lVar83 = lVar83 + (long)(int)uVar14 * 0x40;
              }
              lVar82 = lVar82 + (long)(int)(uVar14 * uVar16 * 0x10) * 4;
            }
            auVar181 = auVar299._0_16_;
            auVar283 = auVar181;
            if (5 < iVar80 - 1U) goto switchD_0028b058_caseD_1;
            auVar264 = auVar92._0_16_;
            auVar283 = vmaxps_avx(auVar181,auVar264);
            auVar94 = auVar325._0_16_;
            fVar126 = auVar346._4_4_;
            fVar124 = auVar346._8_4_;
            fVar225 = auVar346._12_4_;
            fVar220 = auVar346._0_4_;
            fVar88 = auVar325._0_4_;
            fVar125 = auVar325._4_4_;
            fVar93 = auVar325._8_4_;
            fVar127 = auVar325._12_4_;
            fVar227 = auVar299._8_4_;
            fVar180 = auVar299._12_4_;
            switch(iVar80) {
            case 2:
              auVar181 = vminps_avx(auVar181,auVar264);
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              auVar275._0_4_ = fVar88 * auVar181._0_4_ + auVar283._0_4_;
              auVar275._4_4_ = fVar88 * auVar181._4_4_ + auVar283._4_4_;
              auVar275._8_4_ = fVar88 * auVar181._8_4_ + auVar283._8_4_;
              auVar275._12_4_ = fVar88 * auVar181._12_4_ + auVar283._12_4_;
              auVar283 = auVar275;
              break;
            case 3:
              uVar17 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
              auVar280._4_4_ = uVar17;
              auVar280._0_4_ = uVar17;
              auVar280._8_4_ = uVar17;
              auVar280._12_4_ = uVar17;
              uVar17 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar360._4_4_ = uVar17;
              auVar360._0_4_ = uVar17;
              auVar360._8_4_ = uVar17;
              auVar360._12_4_ = uVar17;
              auVar181 = vmaxps_avx(auVar181,auVar280);
              auVar283 = vminps_avx(auVar360,auVar181);
              break;
            case 4:
              auVar102._0_8_ = auVar299._0_8_ ^ 0x8000000080000000;
              auVar102._8_4_ = -fVar227;
              auVar102._12_4_ = -fVar180;
              auVar149._8_4_ = 0x42b0c0a5;
              auVar149._0_8_ = 0x42b0c0a542b0c0a5;
              auVar149._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar102,auVar149);
              auVar150._8_4_ = 0xc2b0c0a5;
              auVar150._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar150._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar181,auVar150);
              auVar281._0_4_ = fVar220 + auVar300._0_4_ * 1.442695;
              auVar281._4_4_ = fVar126 + auVar300._4_4_ * 1.442695;
              auVar281._8_4_ = fVar124 + auVar300._8_4_ * 1.442695;
              auVar281._12_4_ = fVar225 + auVar300._12_4_ * 1.442695;
              auVar361._0_4_ = (int)auVar281._0_4_;
              auVar361._4_4_ = (int)auVar281._4_4_;
              auVar361._8_4_ = (int)auVar281._8_4_;
              auVar361._12_4_ = (int)auVar281._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar361);
              auVar181 = vcmpps_avx(auVar281,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              fVar227 = auVar181._0_4_ * -0.6931472 + auVar300._0_4_;
              fVar180 = auVar181._4_4_ * -0.6931472 + auVar300._4_4_;
              fVar221 = auVar181._8_4_ * -0.6931472 + auVar300._8_4_;
              fVar222 = auVar181._12_4_ * -0.6931472 + auVar300._12_4_;
              auVar282._0_4_ = (int)auVar181._0_4_;
              auVar282._4_4_ = (int)auVar181._4_4_;
              auVar282._8_4_ = (int)auVar181._8_4_;
              auVar282._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar282,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar103._0_4_ =
                   (fVar227 * fVar227 *
                    (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                      + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar220) + fVar227 + fVar88
                   ) * auVar181._0_4_ + fVar88;
              auVar103._4_4_ =
                   (fVar180 * fVar180 *
                    (((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) * fVar180
                      + 0.041665796) * fVar180 + 0.16666666) * fVar180 + fVar126) +
                   fVar180 + fVar125) * auVar181._4_4_ + fVar125;
              auVar103._8_4_ =
                   (fVar221 * fVar221 *
                    (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221
                      + 0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar124) + fVar221 + fVar93
                   ) * auVar181._8_4_ + fVar93;
              auVar103._12_4_ =
                   (fVar222 * fVar222 *
                    (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222
                      + 0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar225) +
                   fVar222 + fVar127) * auVar181._12_4_ + fVar127;
              auVar181 = vrcpps_avx(auVar103);
              fVar88 = auVar181._0_4_;
              auVar104._0_4_ = auVar103._0_4_ * fVar88;
              fVar125 = auVar181._4_4_;
              auVar104._4_4_ = auVar103._4_4_ * fVar125;
              fVar126 = auVar181._8_4_;
              auVar104._8_4_ = auVar103._8_4_ * fVar126;
              fVar93 = auVar181._12_4_;
              auVar104._12_4_ = auVar103._12_4_ * fVar93;
              auVar181 = vsubps_avx(auVar94,auVar104);
              auVar283._0_4_ = fVar88 + fVar88 * auVar181._0_4_;
              auVar283._4_4_ = fVar125 + fVar125 * auVar181._4_4_;
              auVar283._8_4_ = fVar126 + fVar126 * auVar181._8_4_;
              auVar283._12_4_ = fVar93 + fVar93 * auVar181._12_4_;
              break;
            case 5:
              auVar230._8_4_ = 0x42b0c0a5;
              auVar230._0_8_ = 0x42b0c0a542b0c0a5;
              auVar230._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar181,auVar230);
              auVar302._8_4_ = 0xc2b0c0a5;
              auVar302._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar302._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar302,auVar181);
              auVar343._0_4_ = auVar300._0_4_ * 1.442695 + fVar220;
              auVar343._4_4_ = auVar300._4_4_ * 1.442695 + fVar126;
              auVar343._8_4_ = auVar300._8_4_ * 1.442695 + fVar124;
              auVar343._12_4_ = auVar300._12_4_ * 1.442695 + fVar225;
              auVar358._0_4_ = (int)auVar343._0_4_;
              auVar358._4_4_ = (int)auVar343._4_4_;
              auVar358._8_4_ = (int)auVar343._8_4_;
              auVar358._12_4_ = (int)auVar343._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar358);
              auVar181 = vcmpps_avx(auVar343,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              auVar359._0_4_ = auVar181._0_4_ * 0.6931472;
              auVar359._4_4_ = auVar181._4_4_ * 0.6931472;
              auVar359._8_4_ = auVar181._8_4_ * 0.6931472;
              auVar359._12_4_ = auVar181._12_4_ * 0.6931472;
              auVar264 = vsubps_avx(auVar300,auVar359);
              fVar221 = auVar264._0_4_;
              fVar222 = auVar264._4_4_;
              fVar223 = auVar264._8_4_;
              fVar224 = auVar264._12_4_;
              auVar276._0_4_ = (int)auVar181._0_4_;
              auVar276._4_4_ = (int)auVar181._4_4_;
              auVar276._8_4_ = (int)auVar181._8_4_;
              auVar276._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar276,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar277._0_4_ =
                   (fVar221 + fVar88 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar220)) * auVar181._0_4_ +
                   fVar88;
              auVar277._4_4_ =
                   (fVar222 + fVar125 +
                   fVar222 * fVar222 *
                   (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222 +
                     0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar126)) * auVar181._4_4_ +
                   fVar125;
              auVar277._8_4_ =
                   (fVar223 + fVar93 +
                   fVar223 * fVar223 *
                   (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) * fVar223 +
                     0.041665796) * fVar223 + 0.16666666) * fVar223 + fVar124)) * auVar181._8_4_ +
                   fVar93;
              auVar277._12_4_ =
                   (fVar224 + fVar127 +
                   fVar224 * fVar224 *
                   (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224 +
                     0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar225)) * auVar181._12_4_ +
                   fVar127;
              auVar144._8_4_ = 0x800000;
              auVar144._0_8_ = 0x80000000800000;
              auVar144._12_4_ = 0x800000;
              auVar181 = vmaxps_avx(auVar277,auVar144);
              auVar264 = vpsrld_avx(auVar181,0x17);
              auVar192._8_4_ = 0xffffff82;
              auVar192._0_8_ = 0xffffff82ffffff82;
              auVar192._12_4_ = 0xffffff82;
              auVar264 = vpaddd_avx(auVar264,auVar192);
              auVar193._8_4_ = 0x807fffff;
              auVar193._0_8_ = 0x807fffff807fffff;
              auVar193._12_4_ = 0x807fffff;
              auVar181 = vandps_avx(auVar181,auVar193);
              auVar95 = vorps_avx(auVar181,auVar346._0_16_);
              auVar300 = vcvtdq2ps_avx(auVar264);
              auVar194._8_4_ = 0x3f3504f3;
              auVar194._0_8_ = 0x3f3504f33f3504f3;
              auVar194._12_4_ = 0x3f3504f3;
              auVar264 = vcmpps_avx(auVar95,auVar194,1);
              auVar181 = vandps_avx(auVar264,auVar95);
              fVar221 = auVar95._0_4_ + -1.0 + auVar181._0_4_;
              fVar222 = auVar95._4_4_ + -1.0 + auVar181._4_4_;
              fVar223 = auVar95._8_4_ + -1.0 + auVar181._8_4_;
              fVar224 = auVar95._12_4_ + -1.0 + auVar181._12_4_;
              auVar181 = vandps_avx(auVar264,auVar94);
              auVar264 = vsubps_avx(auVar300,auVar181);
              auVar181 = vcmpps_avx(auVar277,_DAT_004c3010,2);
              auVar145._0_4_ =
                   (fVar221 * fVar221 *
                    (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) * fVar221
                          + -0.12420141) * fVar221 + 0.14249323) * fVar221 + -0.16668057) * fVar221
                       + 0.20000714) * fVar221 + -0.24999994) * fVar221 + 0.3333333) * fVar221 +
                    -0.5) + auVar264._0_4_ * 0.6931472 + fVar221) * -2.0;
              auVar145._4_4_ =
                   (fVar222 * fVar222 *
                    (((((((((fVar222 * 0.070376836 + -0.1151461) * fVar222 + 0.116769984) * fVar222
                          + -0.12420141) * fVar222 + 0.14249323) * fVar222 + -0.16668057) * fVar222
                       + 0.20000714) * fVar222 + -0.24999994) * fVar222 + 0.3333333) * fVar222 +
                    -0.5) + auVar264._4_4_ * 0.6931472 + fVar222) * -2.0;
              auVar145._8_4_ =
                   (fVar223 * fVar223 *
                    (((((((((fVar223 * 0.070376836 + -0.1151461) * fVar223 + 0.116769984) * fVar223
                          + -0.12420141) * fVar223 + 0.14249323) * fVar223 + -0.16668057) * fVar223
                       + 0.20000714) * fVar223 + -0.24999994) * fVar223 + 0.3333333) * fVar223 +
                    -0.5) + auVar264._8_4_ * 0.6931472 + fVar223) * -2.0;
              auVar145._12_4_ =
                   (fVar224 * fVar224 *
                    (((((((((fVar224 * 0.070376836 + -0.1151461) * fVar224 + 0.116769984) * fVar224
                          + -0.12420141) * fVar224 + 0.14249323) * fVar224 + -0.16668057) * fVar224
                       + 0.20000714) * fVar224 + -0.24999994) * fVar224 + 0.3333333) * fVar224 +
                    -0.5) + auVar264._12_4_ * 0.6931472 + fVar224) * -2.0;
              auVar195._8_4_ = 0x7fffffff;
              auVar195._0_8_ = 0x7fffffff7fffffff;
              auVar195._12_4_ = 0x7fffffff;
              auVar181 = vblendvps_avx(auVar145,auVar195,auVar181);
              auVar196._8_4_ = 0x42b0c0a5;
              auVar196._0_8_ = 0x42b0c0a542b0c0a5;
              auVar196._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar181,auVar196);
              auVar197._8_4_ = 0xc2b0c0a5;
              auVar197._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar197._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar181,auVar197);
              auVar198._0_4_ = auVar300._0_4_ * 1.442695 + fVar220;
              auVar198._4_4_ = auVar300._4_4_ * 1.442695 + fVar126;
              auVar198._8_4_ = auVar300._8_4_ * 1.442695 + fVar124;
              auVar198._12_4_ = auVar300._12_4_ * 1.442695 + fVar225;
              auVar278._0_4_ = (int)auVar198._0_4_;
              auVar278._4_4_ = (int)auVar198._4_4_;
              auVar278._8_4_ = (int)auVar198._8_4_;
              auVar278._12_4_ = (int)auVar198._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar278);
              auVar181 = vcmpps_avx(auVar198,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              auVar279._0_4_ = auVar181._0_4_ * 0.6931472;
              auVar279._4_4_ = auVar181._4_4_ * 0.6931472;
              auVar279._8_4_ = auVar181._8_4_ * 0.6931472;
              auVar279._12_4_ = auVar181._12_4_ * 0.6931472;
              auVar325 = ZEXT1664(auVar94);
              auVar264 = vsubps_avx(auVar300,auVar279);
              fVar221 = auVar264._0_4_;
              fVar222 = auVar264._4_4_;
              fVar223 = auVar264._8_4_;
              fVar224 = auVar264._12_4_;
              auVar92 = ZEXT864(0) << 0x20;
              auVar346 = ZEXT1664(auVar346._0_16_);
              auVar199._0_4_ = (int)auVar181._0_4_;
              auVar199._4_4_ = (int)auVar181._4_4_;
              auVar199._8_4_ = (int)auVar181._8_4_;
              auVar199._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar199,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar146._0_4_ =
                   (fVar221 + fVar88 +
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar220) * fVar221 * fVar221)
                   * auVar181._0_4_ + fVar88;
              auVar146._4_4_ =
                   (fVar222 + fVar125 +
                   (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222 +
                     0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar126) * fVar222 * fVar222)
                   * auVar181._4_4_ + fVar125;
              auVar146._8_4_ =
                   (fVar223 + fVar93 +
                   (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) * fVar223 +
                     0.041665796) * fVar223 + 0.16666666) * fVar223 + fVar124) * fVar223 * fVar223)
                   * auVar181._8_4_ + fVar93;
              auVar146._12_4_ =
                   (fVar224 + fVar127 +
                   (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224 +
                     0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar225) * fVar224 * fVar224)
                   * auVar181._12_4_ + fVar127;
              auVar181 = vrcpps_avx(auVar146);
              fVar88 = auVar181._0_4_;
              fVar125 = auVar181._4_4_;
              fVar126 = auVar181._8_4_;
              fVar93 = auVar181._12_4_;
              auVar147._0_4_ = auVar146._0_4_ * (fVar88 + fVar88);
              auVar147._4_4_ = auVar146._4_4_ * (fVar125 + fVar125);
              auVar147._8_4_ = auVar146._8_4_ * (fVar126 + fVar126);
              auVar147._12_4_ = auVar146._12_4_ * (fVar93 + fVar93);
              auVar231._8_4_ = 0x40000000;
              auVar231._0_8_ = 0x4000000040000000;
              auVar231._12_4_ = 0x40000000;
              auVar181 = vsubps_avx(auVar231,auVar147);
              auVar148._0_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar181._0_4_;
              auVar148._4_4_ = fVar125 + fVar125 + -1.0 + fVar125 * auVar181._4_4_;
              auVar148._8_4_ = fVar126 + fVar126 + -1.0 + fVar126 * auVar181._8_4_;
              auVar148._12_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar181._12_4_;
              goto LAB_0028b485;
            case 6:
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              fVar125 = (*(float **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar151._0_4_ = fVar88 * auVar299._0_4_ + fVar125;
              auVar151._4_4_ = fVar88 * auVar299._4_4_ + fVar125;
              auVar151._8_4_ = fVar88 * fVar227 + fVar125;
              auVar151._12_4_ = fVar88 * fVar180 + fVar125;
              auVar181 = vmaxps_avx(auVar151,auVar264);
              auVar148 = vminps_avx(auVar181,auVar94);
LAB_0028b485:
              auVar283._0_4_ = auVar148._0_4_ * auVar299._0_4_;
              auVar283._4_4_ = auVar148._4_4_ * auVar299._4_4_;
              auVar283._8_4_ = auVar148._8_4_ * fVar227;
              auVar283._12_4_ = auVar148._12_4_ * fVar180;
            }
switchD_0028b058_caseD_1:
            *(undefined1 (*) [16])local_1a0 = auVar283;
            local_1a0 = local_1a0 + 2;
            iVar64 = iVar64 + 1;
          }
          uVar87 = (ulong)(uVar74 + 1);
        }
      }
    }
    if ((iVar75 == 1) && (uVar61 == 4)) {
      p_Var56 = local_90[-3];
      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
      iVar72 = *(int *)(&this->field_0xdc + (long)p_Var56);
      iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var56);
      iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
      iVar78 = *(int *)(&this->field_0xe8 + (long)p_Var56);
      iVar80 = *(int *)(&this->field_0x114 + (long)p_Var56);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
      uVar85 = 0;
      uVar73 = 0;
      if (0 < (int)uVar14) {
        uVar73 = (ulong)uVar14;
      }
      uVar84 = 0;
      if (0 < (int)uVar16) {
        uVar84 = (ulong)uVar16;
      }
      uVar66 = (ulong)(uint)local_d8.c;
      if (local_d8.c < 1) {
        uVar66 = uVar85;
      }
      auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar346 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar325 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      for (; uVar85 != uVar66; uVar85 = uVar85 + 1) {
        local_1a0 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar85 * local_d8.elemsize);
        iVar55 = bottom_blob->w;
        iVar54 = bottom_blob->h;
        uVar87 = 0;
        uVar58 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar58 = uVar87;
        }
        uVar68 = local_d8.w;
        if (local_d8.w < 1) {
          uVar68 = 0;
        }
        uVar49 = local_d8.h;
        if (local_d8.h < 1) {
          uVar49 = 0;
        }
        while (uVar74 = (uint)uVar87, uVar74 != uVar49) {
          iVar64 = (1 - uVar14) * iVar72;
          for (uVar52 = 0; uVar52 != uVar68; uVar52 = uVar52 + 1) {
            if (lVar59 == 0) {
              auVar181 = ZEXT816(0) << 0x40;
            }
            else {
              auVar181 = *(undefined1 (*) [16])(lVar59 + uVar85 * 0x10);
            }
            auVar299 = ZEXT1664(auVar181);
            pvVar69 = (void *)((this->weight_data_tm).cstep * uVar85 *
                               (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
            for (uVar87 = 0; uVar87 != uVar58; uVar87 = uVar87 + 1) {
              pvVar70 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar87 +
                                (long)bottom_blob->data);
              local_88._0_8_ = pvVar70;
              pvVar86 = pvVar69;
              for (uVar79 = 0; uVar79 != uVar84; uVar79 = uVar79 + 1) {
                iVar50 = (((int)uVar79 - uVar16) + 1) * iVar13 + uVar74;
                if (((-1 < iVar50) && (iVar51 = iVar50 / iVar78, iVar50 % iVar78 == 0)) &&
                   (iVar51 < iVar54)) {
                  iVar50 = iVar64;
                  for (lVar82 = 0; uVar73 * 0x10 != lVar82; lVar82 = lVar82 + 0x10) {
                    if (((-1 < iVar50) && (iVar53 = iVar50 / iVar71, iVar50 % iVar71 == 0)) &&
                       (iVar53 < iVar55)) {
                      fVar88 = *(float *)((long)pvVar70 +
                                         (long)iVar53 * 4 +
                                         (long)iVar51 * (long)bottom_blob->w * bottom_blob->elemsize
                                         );
                      pfVar1 = (float *)((long)pvVar86 + lVar82);
                      auVar299 = ZEXT1664(CONCAT412(fVar88 * pfVar1[3] + auVar299._12_4_,
                                                    CONCAT48(fVar88 * pfVar1[2] + auVar299._8_4_,
                                                             CONCAT44(fVar88 * pfVar1[1] +
                                                                      auVar299._4_4_,
                                                                      fVar88 * *pfVar1 +
                                                                      auVar299._0_4_))));
                    }
                    iVar50 = iVar50 + iVar72;
                  }
                }
                pvVar86 = (void *)((long)pvVar86 + (long)(int)uVar14 * 0x10);
              }
              pvVar69 = (void *)((long)pvVar69 + (long)(int)(uVar14 * uVar16 * 4) * 4);
            }
            auVar181 = auVar299._0_16_;
            auVar292 = auVar181;
            if (5 < iVar80 - 1U) goto switchD_0028b80b_caseD_1;
            auVar264 = auVar92._0_16_;
            auVar292 = vmaxps_avx(auVar181,auVar264);
            auVar94 = auVar325._0_16_;
            fVar126 = auVar346._4_4_;
            fVar93 = auVar346._8_4_;
            fVar127 = auVar346._12_4_;
            fVar220 = auVar346._0_4_;
            fVar88 = auVar325._0_4_;
            fVar125 = auVar325._4_4_;
            fVar124 = auVar325._8_4_;
            fVar225 = auVar325._12_4_;
            fVar227 = auVar299._8_4_;
            fVar180 = auVar299._12_4_;
            switch(iVar80) {
            case 2:
              auVar181 = vminps_avx(auVar181,auVar264);
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              auVar284._0_4_ = fVar88 * auVar181._0_4_ + auVar292._0_4_;
              auVar284._4_4_ = fVar88 * auVar181._4_4_ + auVar292._4_4_;
              auVar284._8_4_ = fVar88 * auVar181._8_4_ + auVar292._8_4_;
              auVar284._12_4_ = fVar88 * auVar181._12_4_ + auVar292._12_4_;
              auVar292 = auVar284;
              break;
            case 3:
              uVar17 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
              auVar289._4_4_ = uVar17;
              auVar289._0_4_ = uVar17;
              auVar289._8_4_ = uVar17;
              auVar289._12_4_ = uVar17;
              uVar17 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar364._4_4_ = uVar17;
              auVar364._0_4_ = uVar17;
              auVar364._8_4_ = uVar17;
              auVar364._12_4_ = uVar17;
              auVar181 = vmaxps_avx(auVar181,auVar289);
              auVar292 = vminps_avx(auVar364,auVar181);
              break;
            case 4:
              auVar105._0_8_ = auVar299._0_8_ ^ 0x8000000080000000;
              auVar105._8_4_ = -fVar227;
              auVar105._12_4_ = -fVar180;
              auVar157._8_4_ = 0x42b0c0a5;
              auVar157._0_8_ = 0x42b0c0a542b0c0a5;
              auVar157._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar105,auVar157);
              auVar158._8_4_ = 0xc2b0c0a5;
              auVar158._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar158._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar181,auVar158);
              auVar290._0_4_ = fVar220 + auVar300._0_4_ * 1.442695;
              auVar290._4_4_ = fVar126 + auVar300._4_4_ * 1.442695;
              auVar290._8_4_ = fVar93 + auVar300._8_4_ * 1.442695;
              auVar290._12_4_ = fVar127 + auVar300._12_4_ * 1.442695;
              auVar365._0_4_ = (int)auVar290._0_4_;
              auVar365._4_4_ = (int)auVar290._4_4_;
              auVar365._8_4_ = (int)auVar290._8_4_;
              auVar365._12_4_ = (int)auVar290._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar365);
              auVar181 = vcmpps_avx(auVar290,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              fVar227 = auVar181._0_4_ * -0.6931472 + auVar300._0_4_;
              fVar180 = auVar181._4_4_ * -0.6931472 + auVar300._4_4_;
              fVar221 = auVar181._8_4_ * -0.6931472 + auVar300._8_4_;
              fVar222 = auVar181._12_4_ * -0.6931472 + auVar300._12_4_;
              auVar291._0_4_ = (int)auVar181._0_4_;
              auVar291._4_4_ = (int)auVar181._4_4_;
              auVar291._8_4_ = (int)auVar181._8_4_;
              auVar291._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar291,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar106._0_4_ =
                   (fVar227 * fVar227 *
                    (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                      + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar220) + fVar227 + fVar88
                   ) * auVar181._0_4_ + fVar88;
              auVar106._4_4_ =
                   (fVar180 * fVar180 *
                    (((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) * fVar180
                      + 0.041665796) * fVar180 + 0.16666666) * fVar180 + fVar126) +
                   fVar180 + fVar125) * auVar181._4_4_ + fVar125;
              auVar106._8_4_ =
                   (fVar221 * fVar221 *
                    (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221
                      + 0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar93) + fVar221 + fVar124
                   ) * auVar181._8_4_ + fVar124;
              auVar106._12_4_ =
                   (fVar222 * fVar222 *
                    (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222
                      + 0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar127) +
                   fVar222 + fVar225) * auVar181._12_4_ + fVar225;
              auVar181 = vrcpps_avx(auVar106);
              fVar88 = auVar181._0_4_;
              auVar107._0_4_ = auVar106._0_4_ * fVar88;
              fVar125 = auVar181._4_4_;
              auVar107._4_4_ = auVar106._4_4_ * fVar125;
              fVar126 = auVar181._8_4_;
              auVar107._8_4_ = auVar106._8_4_ * fVar126;
              fVar93 = auVar181._12_4_;
              auVar107._12_4_ = auVar106._12_4_ * fVar93;
              auVar181 = vsubps_avx(auVar94,auVar107);
              auVar292._0_4_ = fVar88 + fVar88 * auVar181._0_4_;
              auVar292._4_4_ = fVar125 + fVar125 * auVar181._4_4_;
              auVar292._8_4_ = fVar126 + fVar126 * auVar181._8_4_;
              auVar292._12_4_ = fVar93 + fVar93 * auVar181._12_4_;
              break;
            case 5:
              auVar232._8_4_ = 0x42b0c0a5;
              auVar232._0_8_ = 0x42b0c0a542b0c0a5;
              auVar232._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar181,auVar232);
              auVar303._8_4_ = 0xc2b0c0a5;
              auVar303._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar303._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar303,auVar181);
              auVar344._0_4_ = auVar300._0_4_ * 1.442695 + fVar220;
              auVar344._4_4_ = auVar300._4_4_ * 1.442695 + fVar126;
              auVar344._8_4_ = auVar300._8_4_ * 1.442695 + fVar93;
              auVar344._12_4_ = auVar300._12_4_ * 1.442695 + fVar127;
              auVar362._0_4_ = (int)auVar344._0_4_;
              auVar362._4_4_ = (int)auVar344._4_4_;
              auVar362._8_4_ = (int)auVar344._8_4_;
              auVar362._12_4_ = (int)auVar344._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar362);
              auVar181 = vcmpps_avx(auVar344,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              auVar363._0_4_ = auVar181._0_4_ * 0.6931472;
              auVar363._4_4_ = auVar181._4_4_ * 0.6931472;
              auVar363._8_4_ = auVar181._8_4_ * 0.6931472;
              auVar363._12_4_ = auVar181._12_4_ * 0.6931472;
              auVar264 = vsubps_avx(auVar300,auVar363);
              fVar221 = auVar264._0_4_;
              fVar222 = auVar264._4_4_;
              fVar223 = auVar264._8_4_;
              fVar224 = auVar264._12_4_;
              auVar285._0_4_ = (int)auVar181._0_4_;
              auVar285._4_4_ = (int)auVar181._4_4_;
              auVar285._8_4_ = (int)auVar181._8_4_;
              auVar285._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar285,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar286._0_4_ =
                   (fVar221 + fVar88 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar220)) * auVar181._0_4_ +
                   fVar88;
              auVar286._4_4_ =
                   (fVar222 + fVar125 +
                   fVar222 * fVar222 *
                   (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222 +
                     0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar126)) * auVar181._4_4_ +
                   fVar125;
              auVar286._8_4_ =
                   (fVar223 + fVar124 +
                   fVar223 * fVar223 *
                   (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) * fVar223 +
                     0.041665796) * fVar223 + 0.16666666) * fVar223 + fVar93)) * auVar181._8_4_ +
                   fVar124;
              auVar286._12_4_ =
                   (fVar224 + fVar225 +
                   fVar224 * fVar224 *
                   (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224 +
                     0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar127)) * auVar181._12_4_ +
                   fVar225;
              auVar152._8_4_ = 0x800000;
              auVar152._0_8_ = 0x80000000800000;
              auVar152._12_4_ = 0x800000;
              auVar181 = vmaxps_avx(auVar286,auVar152);
              auVar264 = vpsrld_avx(auVar181,0x17);
              auVar200._8_4_ = 0xffffff82;
              auVar200._0_8_ = 0xffffff82ffffff82;
              auVar200._12_4_ = 0xffffff82;
              auVar264 = vpaddd_avx(auVar264,auVar200);
              auVar201._8_4_ = 0x807fffff;
              auVar201._0_8_ = 0x807fffff807fffff;
              auVar201._12_4_ = 0x807fffff;
              auVar181 = vandps_avx(auVar181,auVar201);
              auVar95 = vorps_avx(auVar181,auVar346._0_16_);
              auVar300 = vcvtdq2ps_avx(auVar264);
              auVar202._8_4_ = 0x3f3504f3;
              auVar202._0_8_ = 0x3f3504f33f3504f3;
              auVar202._12_4_ = 0x3f3504f3;
              auVar264 = vcmpps_avx(auVar95,auVar202,1);
              auVar181 = vandps_avx(auVar264,auVar95);
              fVar221 = auVar95._0_4_ + -1.0 + auVar181._0_4_;
              fVar222 = auVar95._4_4_ + -1.0 + auVar181._4_4_;
              fVar223 = auVar95._8_4_ + -1.0 + auVar181._8_4_;
              fVar224 = auVar95._12_4_ + -1.0 + auVar181._12_4_;
              auVar181 = vandps_avx(auVar264,auVar94);
              auVar264 = vsubps_avx(auVar300,auVar181);
              auVar181 = vcmpps_avx(auVar286,_DAT_004c3010,2);
              auVar153._0_4_ =
                   (fVar221 * fVar221 *
                    (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) * fVar221
                          + -0.12420141) * fVar221 + 0.14249323) * fVar221 + -0.16668057) * fVar221
                       + 0.20000714) * fVar221 + -0.24999994) * fVar221 + 0.3333333) * fVar221 +
                    -0.5) + auVar264._0_4_ * 0.6931472 + fVar221) * -2.0;
              auVar153._4_4_ =
                   (fVar222 * fVar222 *
                    (((((((((fVar222 * 0.070376836 + -0.1151461) * fVar222 + 0.116769984) * fVar222
                          + -0.12420141) * fVar222 + 0.14249323) * fVar222 + -0.16668057) * fVar222
                       + 0.20000714) * fVar222 + -0.24999994) * fVar222 + 0.3333333) * fVar222 +
                    -0.5) + auVar264._4_4_ * 0.6931472 + fVar222) * -2.0;
              auVar153._8_4_ =
                   (fVar223 * fVar223 *
                    (((((((((fVar223 * 0.070376836 + -0.1151461) * fVar223 + 0.116769984) * fVar223
                          + -0.12420141) * fVar223 + 0.14249323) * fVar223 + -0.16668057) * fVar223
                       + 0.20000714) * fVar223 + -0.24999994) * fVar223 + 0.3333333) * fVar223 +
                    -0.5) + auVar264._8_4_ * 0.6931472 + fVar223) * -2.0;
              auVar153._12_4_ =
                   (fVar224 * fVar224 *
                    (((((((((fVar224 * 0.070376836 + -0.1151461) * fVar224 + 0.116769984) * fVar224
                          + -0.12420141) * fVar224 + 0.14249323) * fVar224 + -0.16668057) * fVar224
                       + 0.20000714) * fVar224 + -0.24999994) * fVar224 + 0.3333333) * fVar224 +
                    -0.5) + auVar264._12_4_ * 0.6931472 + fVar224) * -2.0;
              auVar203._8_4_ = 0x7fffffff;
              auVar203._0_8_ = 0x7fffffff7fffffff;
              auVar203._12_4_ = 0x7fffffff;
              auVar181 = vblendvps_avx(auVar153,auVar203,auVar181);
              auVar204._8_4_ = 0x42b0c0a5;
              auVar204._0_8_ = 0x42b0c0a542b0c0a5;
              auVar204._12_4_ = 0x42b0c0a5;
              auVar181 = vminps_avx(auVar181,auVar204);
              auVar205._8_4_ = 0xc2b0c0a5;
              auVar205._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar205._12_4_ = 0xc2b0c0a5;
              auVar300 = vmaxps_avx(auVar181,auVar205);
              auVar206._0_4_ = auVar300._0_4_ * 1.442695 + fVar220;
              auVar206._4_4_ = auVar300._4_4_ * 1.442695 + fVar126;
              auVar206._8_4_ = auVar300._8_4_ * 1.442695 + fVar93;
              auVar206._12_4_ = auVar300._12_4_ * 1.442695 + fVar127;
              auVar287._0_4_ = (int)auVar206._0_4_;
              auVar287._4_4_ = (int)auVar206._4_4_;
              auVar287._8_4_ = (int)auVar206._8_4_;
              auVar287._12_4_ = (int)auVar206._12_4_;
              auVar264 = vcvtdq2ps_avx(auVar287);
              auVar181 = vcmpps_avx(auVar206,auVar264,1);
              auVar181 = vandps_avx(auVar181,auVar94);
              auVar181 = vsubps_avx(auVar264,auVar181);
              auVar288._0_4_ = auVar181._0_4_ * 0.6931472;
              auVar288._4_4_ = auVar181._4_4_ * 0.6931472;
              auVar288._8_4_ = auVar181._8_4_ * 0.6931472;
              auVar288._12_4_ = auVar181._12_4_ * 0.6931472;
              auVar325 = ZEXT1664(auVar94);
              auVar264 = vsubps_avx(auVar300,auVar288);
              fVar221 = auVar264._0_4_;
              fVar222 = auVar264._4_4_;
              fVar223 = auVar264._8_4_;
              fVar224 = auVar264._12_4_;
              auVar92 = ZEXT864(0) << 0x20;
              auVar346 = ZEXT1664(auVar346._0_16_);
              auVar207._0_4_ = (int)auVar181._0_4_;
              auVar207._4_4_ = (int)auVar181._4_4_;
              auVar207._8_4_ = (int)auVar181._8_4_;
              auVar207._12_4_ = (int)auVar181._12_4_;
              auVar181 = vpslld_avx(auVar207,0x17);
              auVar181 = vpaddd_avx(auVar181,auVar94);
              auVar154._0_4_ =
                   (fVar221 + fVar88 +
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + fVar220) * fVar221 * fVar221)
                   * auVar181._0_4_ + fVar88;
              auVar154._4_4_ =
                   (fVar222 + fVar125 +
                   (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) * fVar222 +
                     0.041665796) * fVar222 + 0.16666666) * fVar222 + fVar126) * fVar222 * fVar222)
                   * auVar181._4_4_ + fVar125;
              auVar154._8_4_ =
                   (fVar223 + fVar124 +
                   (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) * fVar223 +
                     0.041665796) * fVar223 + 0.16666666) * fVar223 + fVar93) * fVar223 * fVar223) *
                   auVar181._8_4_ + fVar124;
              auVar154._12_4_ =
                   (fVar224 + fVar225 +
                   (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224 +
                     0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar127) * fVar224 * fVar224)
                   * auVar181._12_4_ + fVar225;
              auVar181 = vrcpps_avx(auVar154);
              fVar88 = auVar181._0_4_;
              fVar125 = auVar181._4_4_;
              fVar126 = auVar181._8_4_;
              fVar93 = auVar181._12_4_;
              auVar155._0_4_ = auVar154._0_4_ * (fVar88 + fVar88);
              auVar155._4_4_ = auVar154._4_4_ * (fVar125 + fVar125);
              auVar155._8_4_ = auVar154._8_4_ * (fVar126 + fVar126);
              auVar155._12_4_ = auVar154._12_4_ * (fVar93 + fVar93);
              auVar233._8_4_ = 0x40000000;
              auVar233._0_8_ = 0x4000000040000000;
              auVar233._12_4_ = 0x40000000;
              auVar181 = vsubps_avx(auVar233,auVar155);
              auVar156._0_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar181._0_4_;
              auVar156._4_4_ = fVar125 + fVar125 + -1.0 + fVar125 * auVar181._4_4_;
              auVar156._8_4_ = fVar126 + fVar126 + -1.0 + fVar126 * auVar181._8_4_;
              auVar156._12_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar181._12_4_;
              goto LAB_0028bc38;
            case 6:
              fVar88 = **(float **)(&this->field_0x118 + (long)p_Var56);
              fVar125 = (*(float **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar159._0_4_ = fVar88 * auVar299._0_4_ + fVar125;
              auVar159._4_4_ = fVar88 * auVar299._4_4_ + fVar125;
              auVar159._8_4_ = fVar88 * fVar227 + fVar125;
              auVar159._12_4_ = fVar88 * fVar180 + fVar125;
              auVar181 = vmaxps_avx(auVar159,auVar264);
              auVar156 = vminps_avx(auVar181,auVar94);
LAB_0028bc38:
              auVar292._0_4_ = auVar156._0_4_ * auVar299._0_4_;
              auVar292._4_4_ = auVar156._4_4_ * auVar299._4_4_;
              auVar292._8_4_ = auVar156._8_4_ * fVar227;
              auVar292._12_4_ = auVar156._12_4_ * fVar180;
            }
switchD_0028b80b_caseD_1:
            *(undefined1 (*) [16])local_1a0 = auVar292;
            local_1a0 = local_1a0 + 2;
            iVar64 = iVar64 + 1;
          }
          uVar87 = (ulong)(uVar74 + 1);
        }
      }
    }
    if ((iVar75 == 4) && (uVar61 == 1)) {
      p_Var56 = local_90[-3];
      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
      iVar72 = *(int *)(&this->field_0xdc + (long)p_Var56);
      uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var56);
      local_50 = local_d8.elemsize * local_d8.cstep;
      uVar85 = 0;
      uVar73 = 0;
      if (0 < (int)uVar14) {
        uVar73 = (ulong)uVar14;
      }
      uVar84 = 0;
      if (0 < (int)uVar16) {
        uVar84 = (ulong)uVar16;
      }
      uVar66 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar66 = uVar85;
      }
      uVar68 = local_d8.w;
      if (local_d8.w < 1) {
        uVar68 = 0;
      }
      uVar49 = local_d8.h;
      if (local_d8.h < 1) {
        uVar49 = 0;
      }
      local_48 = (ulong)(uint)local_d8.c;
      if (local_d8.c < 1) {
        local_48 = uVar85;
      }
      iVar13 = *(int *)(&this->field_0xe0 + (long)p_Var56);
      iVar71 = *(int *)(&this->field_0xe4 + (long)p_Var56);
      local_88._0_4_ = *(undefined4 *)(&this->field_0xe8 + (long)p_Var56);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
      local_58 = (Allocator *)local_d8.data;
      iVar78 = bottom_blob->w;
      iVar80 = bottom_blob->h;
      for (; uVar85 != local_48; uVar85 = uVar85 + 1) {
        ppp_Var67 = (_func_int ***)((long)&local_58->_vptr_Allocator + local_50 * uVar85);
        for (uVar74 = 0; uVar74 != uVar49; uVar74 = uVar74 + 1) {
          pfVar1 = *(float **)(&this->field_0x118 + (long)p_Var56);
          sVar19 = (this->weight_data_tm).cstep;
          sVar20 = (this->weight_data_tm).elemsize;
          pvVar69 = (this->weight_data_tm).data;
          iVar55 = (1 - uVar14) * iVar72;
          for (uVar52 = 0; uVar52 != uVar68; uVar52 = uVar52 + 1) {
            if (lVar59 == 0) {
              fVar88 = 0.0;
            }
            else {
              fVar88 = *(float *)(lVar59 + uVar85 * 4);
            }
            auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
            pvVar86 = (void *)(sVar19 * uVar85 * sVar20 + (long)pvVar69);
            for (uVar58 = 0; uVar58 != uVar66; uVar58 = uVar58 + 1) {
              pvVar70 = pvVar86;
              for (uVar87 = 0; uVar87 != uVar84; uVar87 = uVar87 + 1) {
                iVar54 = (((int)uVar87 - uVar16) + 1) * iVar13 + uVar74;
                if (-1 < iVar54) {
                  if ((iVar54 % (int)local_88._0_4_ == 0) && (iVar54 / (int)local_88._0_4_ < iVar80)
                     ) {
                    iVar64 = iVar55;
                    for (lVar82 = 0; uVar73 * 0x10 != lVar82; lVar82 = lVar82 + 0x10) {
                      if (((-1 < iVar64) && (iVar50 = iVar64 / iVar71, iVar64 % iVar71 == 0)) &&
                         (iVar50 < iVar78)) {
                        pfVar2 = (float *)((long)pvVar70 + lVar82);
                        pfVar3 = (float *)((long)bottom_blob->data +
                                          (long)(iVar50 << 2) * 4 +
                                          (long)(iVar54 / (int)local_88._0_4_) *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar58);
                        auVar92 = ZEXT1664(CONCAT412(pfVar2[3] * pfVar3[3] + auVar92._12_4_,
                                                     CONCAT48(pfVar2[2] * pfVar3[2] + auVar92._8_4_,
                                                              CONCAT44(pfVar2[1] * pfVar3[1] +
                                                                       auVar92._4_4_,
                                                                       *pfVar2 * *pfVar3 +
                                                                       auVar92._0_4_))));
                      }
                      iVar64 = iVar64 + iVar72;
                    }
                  }
                }
                pvVar70 = (void *)((long)pvVar70 + (long)(int)uVar14 * 0x10);
              }
              pvVar86 = (void *)((long)pvVar86 + (long)(int)(uVar14 * uVar16 * 4) * 4);
            }
            auVar181 = vshufpd_avx(auVar92._0_16_,auVar92._0_16_,1);
            auVar108._0_4_ = auVar181._0_4_ + auVar92._0_4_;
            auVar108._4_4_ = auVar181._4_4_ + auVar92._4_4_;
            auVar108._8_4_ = auVar181._8_4_ + auVar92._8_4_;
            auVar108._12_4_ = auVar181._12_4_ + auVar92._12_4_;
            auVar181 = vmovshdup_avx(auVar108);
            fVar88 = auVar181._0_4_ + fVar88 + auVar108._0_4_;
            auVar181 = ZEXT416((uint)fVar88);
            fVar125 = fVar88;
            switch(uVar17) {
            case 1:
              auVar181 = vmaxss_avx(ZEXT416((uint)fVar88),ZEXT416(0));
              fVar125 = auVar181._0_4_;
              break;
            case 2:
              auVar90._0_12_ = ZEXT812(0);
              auVar90._12_4_ = 0;
              auVar181 = vcmpss_avx(auVar90,auVar181,1);
              auVar161._8_4_ = 0x3f800000;
              auVar161._0_8_ = 0x3f8000003f800000;
              auVar161._12_4_ = 0x3f800000;
              auVar181 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar161,auVar181);
              fVar125 = auVar181._0_4_ * fVar88;
              break;
            case 3:
              auVar181 = vmaxss_avx(auVar181,ZEXT416((uint)*pfVar1));
              fVar125 = auVar181._0_4_;
              if (pfVar1[1] < auVar181._0_4_) {
                fVar125 = pfVar1[1];
              }
              break;
            case 4:
              auVar181 = vminss_avx(auVar181,ZEXT416(0x42b0c0a5));
              auVar109._0_8_ = auVar181._0_8_ ^ 0x8000000080000000;
              auVar109._8_4_ = auVar181._8_4_ ^ 0x80000000;
              auVar109._12_4_ = auVar181._12_4_ ^ 0x80000000;
              auVar181 = vcmpss_avx(auVar181,ZEXT416(0xc2b0c0a5),1);
              auVar160._8_4_ = 0x42b0c0a5;
              auVar160._0_8_ = 0x42b0c0a542b0c0a5;
              auVar160._12_4_ = 0x42b0c0a5;
              auVar181 = vblendvps_avx(auVar109,auVar160,auVar181);
              fVar88 = expf(auVar181._0_4_);
              fVar125 = 1.0 / (fVar88 + 1.0);
              break;
            case 5:
              fVar125 = expf(fVar88);
              fVar125 = logf(fVar125 + 1.0);
              fVar125 = tanhf(fVar125);
              fVar125 = fVar125 * fVar88;
              break;
            case 6:
              fVar126 = *pfVar1;
              fVar93 = -pfVar1[1] / fVar126;
              fVar125 = 0.0;
              if ((fVar93 <= fVar88) && (fVar125 = fVar88, fVar88 <= fVar93 + 1.0 / fVar126)) {
                fVar125 = (fVar126 * fVar88 + pfVar1[1]) * fVar88;
              }
            }
            *(float *)ppp_Var67 = fVar125;
            ppp_Var67 = (_func_int ***)((long)ppp_Var67 + 4);
            iVar55 = iVar55 + 1;
          }
        }
      }
    }
    pvVar69 = local_d8.data;
    pp_Var60 = this->_vptr_Deconvolution_x86_avx;
    if ((iVar75 == 1) && (uVar61 == 1)) {
      iVar75 = uVar15 * (int)local_40;
      lVar59 = local_d8.cstep * local_d8.elemsize;
      iVar72 = bottom_blob->w;
      iVar13 = bottom_blob->h;
      lVar82 = (long)local_d8.w;
      uVar85 = 0;
      uVar73 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar73 = uVar85;
      }
      uVar84 = 0;
      if (0 < local_d8.w) {
        uVar84 = (ulong)(uint)local_d8.w;
      }
      uVar66 = (ulong)(uint)local_d8.h;
      if (local_d8.h < 1) {
        uVar66 = uVar85;
      }
      for (; (long)uVar85 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var60[-3]);
          uVar85 = uVar85 + 1) {
        local_140 = (_func_int ***)((long)(_func_int ***)pvVar69 + lVar59 * uVar85);
        for (iVar71 = 0; iVar71 != (int)uVar66; iVar71 = iVar71 + 1) {
          pp_Var21 = this->_vptr_Deconvolution_x86_avx;
          sVar19 = (this->weight_data_tm).cstep;
          sVar20 = (this->weight_data_tm).elemsize;
          pvVar86 = (this->weight_data_tm).data;
          for (uVar58 = 0; uVar58 != uVar84; uVar58 = uVar58 + 1) {
            p_Var56 = pp_Var21[-3];
            if (*(int *)(&this->field_0x10c + (long)p_Var56) == 0) {
              auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar92 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var56) + uVar85 * 4
                                         ));
            }
            lVar83 = (long)bottom_blob->w * bottom_blob->elemsize;
            local_88._0_8_ = lVar83;
            pvVar70 = (void *)(sVar19 * uVar85 * sVar20 + (long)pvVar86);
            for (uVar87 = 0; uVar87 != uVar73; uVar87 = uVar87 + 1) {
              p_Var65 = this->_vptr_Deconvolution_x86_avx[-3];
              iVar80 = 0;
              iVar78 = *(int *)(&this->field_0xd8 + (long)p_Var65);
              if (*(int *)(&this->field_0xd8 + (long)p_Var65) < 1) {
                iVar78 = iVar80;
              }
              for (; iVar80 != iVar78; iVar80 = iVar80 + 1) {
                iVar55 = *(int *)(&this->field_0xe0 + (long)p_Var65) * iVar80 + (iVar71 - iVar63);
                if (((-1 < iVar55) &&
                    (iVar54 = iVar55 / *(int *)(&this->field_0xe8 + (long)p_Var65),
                    iVar55 % *(int *)(&this->field_0xe8 + (long)p_Var65) == 0)) && (iVar54 < iVar13)
                   ) {
                  uVar61 = *(uint *)(&this->field_0xd4 + (long)p_Var65);
                  uVar79 = 0;
                  if (0 < (int)uVar61) {
                    uVar79 = (ulong)uVar61;
                  }
                  for (uVar77 = 0; uVar79 != uVar77; uVar77 = uVar77 + 1) {
                    iVar55 = *(int *)(&this->field_0xdc + (long)p_Var65) * (int)uVar77 +
                             ((int)uVar58 - iVar62);
                    if (((-1 < iVar55) &&
                        (iVar64 = iVar55 / *(int *)(&this->field_0xe4 + (long)p_Var65),
                        iVar55 % *(int *)(&this->field_0xe4 + (long)p_Var65) == 0)) &&
                       (iVar64 < iVar72)) {
                      auVar92 = ZEXT464((uint)(*(float *)((long)pvVar70 +
                                                         uVar77 * 4 +
                                                         (long)(int)(uVar61 * iVar80) * 4) *
                                               *(float *)((long)bottom_blob->data +
                                                         (long)iVar64 * 4 +
                                                         iVar54 * lVar83 +
                                                         bottom_blob->cstep * bottom_blob->elemsize
                                                         * uVar87) + auVar92._0_4_));
                    }
                  }
                }
              }
              pvVar70 = (void *)((long)pvVar70 + (long)iVar75 * 4);
            }
            auVar181 = auVar92._0_16_;
            fVar125 = auVar92._0_4_;
            fVar88 = fVar125;
            switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var56)) {
            case 1:
              auVar181 = vmaxss_avx(auVar181,ZEXT416(0));
              fVar88 = auVar181._0_4_;
              break;
            case 2:
              auVar181 = vcmpss_avx(ZEXT816(0) << 0x40,auVar181,1);
              auVar163._8_4_ = 0x3f800000;
              auVar163._0_8_ = 0x3f8000003f800000;
              auVar163._12_4_ = 0x3f800000;
              auVar181 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var56)),
                                       auVar163,auVar181);
              fVar93 = auVar181._0_4_;
LAB_0028c529:
              fVar88 = fVar93 * fVar125;
              break;
            case 3:
              fVar125 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var56))[1];
              auVar181 = vmaxss_avx(auVar181,ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var56)
                                                    ));
              fVar88 = auVar181._0_4_;
              if (fVar125 < auVar181._0_4_) {
                fVar88 = fVar125;
              }
              break;
            case 4:
              auVar181 = vminss_avx(auVar181,ZEXT416(0x42b0c0a5));
              auVar110._0_8_ = auVar181._0_8_ ^ 0x8000000080000000;
              auVar110._8_4_ = auVar181._8_4_ ^ 0x80000000;
              auVar110._12_4_ = auVar181._12_4_ ^ 0x80000000;
              auVar181 = vcmpss_avx(auVar181,ZEXT416(0xc2b0c0a5),1);
              auVar162._8_4_ = 0x42b0c0a5;
              auVar162._0_8_ = 0x42b0c0a542b0c0a5;
              auVar162._12_4_ = 0x42b0c0a5;
              auVar181 = vblendvps_avx(auVar110,auVar162,auVar181);
              fVar88 = expf(auVar181._0_4_);
              fVar88 = 1.0 / (fVar88 + 1.0);
              break;
            case 5:
              local_88._0_4_ = fVar125;
              fVar88 = expf(fVar125);
              fVar88 = logf(fVar88 + 1.0);
              fVar88 = tanhf(fVar88);
              fVar88 = fVar88 * (float)local_88._0_4_;
              break;
            case 6:
              fVar126 = **(float **)(&this->field_0x118 + (long)p_Var56);
              fVar93 = (*(float **)(&this->field_0x118 + (long)p_Var56))[1];
              fVar124 = -fVar93 / fVar126;
              fVar88 = 0.0;
              if ((fVar124 <= fVar125) && (fVar88 = fVar125, fVar125 <= fVar124 + 1.0 / fVar126)) {
                fVar93 = fVar126 * fVar125 + fVar93;
                goto LAB_0028c529;
              }
            }
            *(float *)((long)local_140 + uVar58 * 4) = fVar88;
          }
          local_140 = (_func_int ***)((long)local_140 + lVar82 * 4);
        }
      }
      pp_Var60 = this->_vptr_Deconvolution_x86_avx;
    }
    pMVar48 = local_60;
    Deconvolution::cut_padding
              ((Deconvolution *)((long)&this->_vptr_Deconvolution_x86_avx + (long)pp_Var60[-3]),
               &local_d8,local_60,local_38);
    if ((pMVar48->data == (void *)0x0) || (iVar72 = 0, (long)pMVar48->c * pMVar48->cstep == 0)) {
      iVar72 = -100;
    }
  }
  piVar18 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        free(local_d8.data);
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar72;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}